

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersector1<4>::
     occluded_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [28];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [28];
  undefined1 auVar115 [28];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  ulong uVar118;
  ulong uVar119;
  RTCIntersectArguments *pRVar120;
  ulong uVar121;
  uint uVar122;
  long lVar123;
  long lVar124;
  Geometry *geometry;
  long lVar125;
  long lVar126;
  undefined4 uVar127;
  undefined8 unaff_R13;
  byte bVar128;
  float fVar149;
  vint4 ai;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar147;
  float fVar151;
  float fVar153;
  float fVar155;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar156;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar157;
  float fVar167;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar171;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar165 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  float fVar186;
  vint4 bi_2;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar187;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar188;
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  float fVar189;
  float fVar197;
  float fVar199;
  vint4 bi;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar198;
  float fVar201;
  undefined1 auVar194 [16];
  float fVar200;
  float fVar202;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar203;
  float fVar215;
  float fVar218;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar204;
  float fVar205;
  undefined1 auVar209 [16];
  undefined1 auVar208 [16];
  float fVar216;
  float fVar220;
  float fVar223;
  float fVar225;
  float fVar226;
  undefined1 auVar210 [32];
  float fVar217;
  float fVar219;
  float fVar221;
  float fVar222;
  float fVar224;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar227;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  vint4 ai_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar237;
  float fVar238;
  float fVar244;
  float fVar246;
  vint4 bi_1;
  undefined1 auVar239 [16];
  float fVar249;
  undefined1 auVar240 [16];
  float fVar247;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar245;
  float fVar248;
  float fVar250;
  float fVar254;
  float fVar255;
  undefined1 auVar243 [32];
  vint4 ai_2;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar261;
  float fVar262;
  float fVar269;
  float fVar270;
  float fVar272;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar271 [12];
  float fVar274;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar273;
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  float fVar275;
  float fVar281;
  float fVar282;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar278 [32];
  float fVar283;
  float fVar285;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar293;
  float fVar300;
  float fVar301;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar303;
  undefined1 auVar296 [32];
  float fVar302;
  float fVar304;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar305;
  float fVar309;
  float fVar310;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar326;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar327;
  undefined1 auVar328 [32];
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar329 [64];
  float fVar333;
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar339 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_7dc;
  RayQueryContext *local_7d8;
  long local_7d0;
  Primitive *local_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  ulong local_720;
  Precalculations *local_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_690 [8];
  undefined8 uStack_688;
  undefined8 local_680;
  undefined4 local_678;
  float local_674;
  uint local_670;
  undefined4 local_66c;
  undefined4 local_668;
  uint local_664;
  uint local_660;
  ulong local_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  undefined1 local_5a0 [8];
  undefined8 uStack_598;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 local_1e0 [32];
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar160 [24];
  
  PVar11 = prim[1];
  uVar118 = (ulong)(byte)PVar11;
  auVar339 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 4 + 6)));
  auVar180 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 5 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 6 + 6)));
  local_718 = pre;
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0xf + 6)));
  lVar126 = uVar118 * 0x25;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x11 + 6)));
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1a + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1b + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1c + 6)));
  fVar261 = *(float *)(prim + lVar126 + 0x12);
  auVar25 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar126 + 6));
  auVar206._0_4_ = fVar261 * auVar25._0_4_;
  auVar206._4_4_ = fVar261 * auVar25._4_4_;
  auVar206._8_4_ = fVar261 * auVar25._8_4_;
  auVar206._12_4_ = fVar261 * auVar25._12_4_;
  auVar306._0_4_ = fVar261 * (ray->dir).field_0.m128[0];
  auVar306._4_4_ = fVar261 * (ray->dir).field_0.m128[1];
  auVar306._8_4_ = fVar261 * (ray->dir).field_0.m128[2];
  auVar306._12_4_ = fVar261 * (ray->dir).field_0.m128[3];
  auVar25 = vcvtdq2ps_avx(auVar180);
  auVar16 = vcvtdq2ps_avx(auVar209);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar180 = vshufps_avx(auVar306,auVar306,0x55);
  auVar209 = vshufps_avx(auVar306,auVar306,0xaa);
  fVar203 = auVar209._0_4_;
  fVar215 = auVar209._4_4_;
  fVar186 = auVar209._8_4_;
  fVar187 = auVar209._12_4_;
  fVar261 = auVar180._0_4_;
  fVar269 = auVar180._4_4_;
  fVar272 = auVar180._8_4_;
  fVar274 = auVar180._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar339);
  auVar18 = vcvtdq2ps_avx(auVar194);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar339 = vshufps_avx(auVar306,auVar306,0);
  fVar293 = auVar339._0_4_;
  fVar300 = auVar339._4_4_;
  fVar301 = auVar339._8_4_;
  fVar303 = auVar339._12_4_;
  auVar263._0_4_ = auVar25._0_4_ * fVar261 + fVar203 * auVar16._0_4_ + fVar293 * auVar17._0_4_;
  auVar263._4_4_ = auVar25._4_4_ * fVar269 + fVar215 * auVar16._4_4_ + fVar300 * auVar17._4_4_;
  auVar263._8_4_ = auVar25._8_4_ * fVar272 + fVar186 * auVar16._8_4_ + fVar301 * auVar17._8_4_;
  auVar263._12_4_ = auVar25._12_4_ * fVar274 + fVar187 * auVar16._12_4_ + fVar303 * auVar17._12_4_;
  auVar239._0_4_ = fVar293 * auVar18._0_4_ + fVar261 * auVar21._0_4_ + fVar203 * auVar22._0_4_;
  auVar239._4_4_ = fVar300 * auVar18._4_4_ + fVar269 * auVar21._4_4_ + fVar215 * auVar22._4_4_;
  auVar239._8_4_ = fVar301 * auVar18._8_4_ + fVar272 * auVar21._8_4_ + fVar186 * auVar22._8_4_;
  auVar239._12_4_ = fVar303 * auVar18._12_4_ + fVar274 * auVar21._12_4_ + fVar187 * auVar22._12_4_;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = *(ulong *)(prim + uVar118 * 7 + 6);
  auVar131 = vpmovsxwd_avx(auVar339);
  auVar339 = vcvtdq2ps_avx(auVar130);
  auVar294._0_4_ = fVar203 * auVar24._0_4_ + fVar261 * auVar23._0_4_ + fVar293 * auVar339._0_4_;
  auVar294._4_4_ = fVar215 * auVar24._4_4_ + fVar269 * auVar23._4_4_ + fVar300 * auVar339._4_4_;
  auVar294._8_4_ = fVar186 * auVar24._8_4_ + fVar272 * auVar23._8_4_ + fVar301 * auVar339._8_4_;
  auVar294._12_4_ = fVar187 * auVar24._12_4_ + fVar274 * auVar23._12_4_ + fVar303 * auVar339._12_4_;
  auVar180 = vshufps_avx(auVar206,auVar206,0xaa);
  fVar261 = auVar180._0_4_;
  fVar274 = auVar180._4_4_;
  fVar301 = auVar180._8_4_;
  fVar215 = auVar180._12_4_;
  auVar180 = vshufps_avx(auVar206,auVar206,0x55);
  fVar269 = auVar180._0_4_;
  fVar293 = auVar180._4_4_;
  fVar303 = auVar180._8_4_;
  fVar186 = auVar180._12_4_;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *(ulong *)(prim + uVar118 * 0xb + 6);
  auVar130 = vpmovsxwd_avx(auVar180);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar118 * 9 + 6);
  auVar132 = vpmovsxwd_avx(auVar209);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar118 * 0xd + 6);
  auVar194 = vpmovsxwd_avx(auVar194);
  auVar180 = vshufps_avx(auVar206,auVar206,0);
  fVar272 = auVar180._0_4_;
  fVar300 = auVar180._4_4_;
  fVar203 = auVar180._8_4_;
  fVar187 = auVar180._12_4_;
  auVar276._0_4_ = auVar25._0_4_ * fVar269 + auVar16._0_4_ * fVar261 + auVar17._0_4_ * fVar272;
  auVar276._4_4_ = auVar25._4_4_ * fVar293 + auVar16._4_4_ * fVar274 + auVar17._4_4_ * fVar300;
  auVar276._8_4_ = auVar25._8_4_ * fVar303 + auVar16._8_4_ * fVar301 + auVar17._8_4_ * fVar203;
  auVar276._12_4_ = auVar25._12_4_ * fVar186 + auVar16._12_4_ * fVar215 + auVar17._12_4_ * fVar187;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar118 * 0x12 + 6);
  auVar25 = vpmovsxwd_avx(auVar25);
  auVar256._0_4_ = auVar22._0_4_ * fVar261 + fVar269 * auVar21._0_4_ + fVar272 * auVar18._0_4_;
  auVar256._4_4_ = auVar22._4_4_ * fVar274 + fVar293 * auVar21._4_4_ + fVar300 * auVar18._4_4_;
  auVar256._8_4_ = auVar22._8_4_ * fVar301 + fVar303 * auVar21._8_4_ + fVar203 * auVar18._8_4_;
  auVar256._12_4_ = auVar22._12_4_ * fVar215 + fVar186 * auVar21._12_4_ + fVar187 * auVar18._12_4_;
  auVar207._0_4_ = auVar339._0_4_ * fVar272 + fVar269 * auVar23._0_4_ + fVar261 * auVar24._0_4_;
  auVar207._4_4_ = auVar339._4_4_ * fVar300 + fVar293 * auVar23._4_4_ + fVar274 * auVar24._4_4_;
  auVar207._8_4_ = auVar339._8_4_ * fVar203 + fVar303 * auVar23._8_4_ + fVar301 * auVar24._8_4_;
  auVar207._12_4_ = auVar339._12_4_ * fVar187 + fVar186 * auVar23._12_4_ + fVar215 * auVar24._12_4_;
  auVar307._8_4_ = 0x7fffffff;
  auVar307._0_8_ = 0x7fffffff7fffffff;
  auVar307._12_4_ = 0x7fffffff;
  auVar339 = vandps_avx(auVar263,auVar307);
  auVar172._8_4_ = 0x219392ef;
  auVar172._0_8_ = 0x219392ef219392ef;
  auVar172._12_4_ = 0x219392ef;
  auVar339 = vcmpps_avx(auVar339,auVar172,1);
  auVar180 = vblendvps_avx(auVar263,auVar172,auVar339);
  auVar339 = vandps_avx(auVar307,auVar239);
  auVar339 = vcmpps_avx(auVar339,auVar172,1);
  auVar209 = vblendvps_avx(auVar239,auVar172,auVar339);
  auVar339 = vandps_avx(auVar294,auVar307);
  auVar339 = vcmpps_avx(auVar339,auVar172,1);
  auVar339 = vblendvps_avx(auVar294,auVar172,auVar339);
  auVar16 = vrcpps_avx(auVar180);
  fVar237 = auVar16._0_4_;
  auVar129._0_4_ = fVar237 * auVar180._0_4_;
  fVar244 = auVar16._4_4_;
  auVar129._4_4_ = fVar244 * auVar180._4_4_;
  fVar246 = auVar16._8_4_;
  auVar129._8_4_ = fVar246 * auVar180._8_4_;
  fVar249 = auVar16._12_4_;
  auVar129._12_4_ = fVar249 * auVar180._12_4_;
  auVar295._8_4_ = 0x3f800000;
  auVar295._0_8_ = 0x3f8000003f800000;
  auVar295._12_4_ = 0x3f800000;
  auVar180 = vsubps_avx(auVar295,auVar129);
  fVar237 = fVar237 + fVar237 * auVar180._0_4_;
  fVar244 = fVar244 + fVar244 * auVar180._4_4_;
  fVar246 = fVar246 + fVar246 * auVar180._8_4_;
  fVar249 = fVar249 + fVar249 * auVar180._12_4_;
  auVar180 = vrcpps_avx(auVar209);
  fVar261 = auVar180._0_4_;
  auVar264._0_4_ = auVar209._0_4_ * fVar261;
  fVar269 = auVar180._4_4_;
  auVar264._4_4_ = auVar209._4_4_ * fVar269;
  fVar272 = auVar180._8_4_;
  auVar264._8_4_ = auVar209._8_4_ * fVar272;
  fVar274 = auVar180._12_4_;
  auVar264._12_4_ = auVar209._12_4_ * fVar274;
  auVar180 = vsubps_avx(auVar295,auVar264);
  fVar261 = auVar180._0_4_ * fVar261 + fVar261;
  fVar269 = auVar180._4_4_ * fVar269 + fVar269;
  fVar272 = auVar180._8_4_ * fVar272 + fVar272;
  fVar274 = auVar180._12_4_ * fVar274 + fVar274;
  auVar180 = vrcpps_avx(auVar339);
  fVar293 = auVar180._0_4_;
  auVar173._0_4_ = fVar293 * auVar339._0_4_;
  fVar300 = auVar180._4_4_;
  auVar173._4_4_ = fVar300 * auVar339._4_4_;
  fVar301 = auVar180._8_4_;
  auVar173._8_4_ = fVar301 * auVar339._8_4_;
  fVar303 = auVar180._12_4_;
  auVar173._12_4_ = fVar303 * auVar339._12_4_;
  auVar339 = vsubps_avx(auVar295,auVar173);
  fVar293 = fVar293 + fVar293 * auVar339._0_4_;
  fVar300 = fVar300 + fVar300 * auVar339._4_4_;
  fVar301 = fVar301 + fVar301 * auVar339._8_4_;
  fVar303 = fVar303 + fVar303 * auVar339._12_4_;
  auVar209 = vpermilps_avx(ZEXT416((uint)(((ray->dir).field_0.m128[3] -
                                          *(float *)(prim + lVar126 + 0x16)) *
                                         *(float *)(prim + lVar126 + 0x1a))),0);
  auVar339 = vcvtdq2ps_avx(auVar131);
  auVar180 = vcvtdq2ps_avx(auVar130);
  auVar180 = vsubps_avx(auVar180,auVar339);
  fVar203 = auVar209._0_4_;
  fVar215 = auVar209._4_4_;
  fVar186 = auVar209._8_4_;
  fVar187 = auVar209._12_4_;
  auVar130._0_4_ = fVar203 * auVar180._0_4_ + auVar339._0_4_;
  auVar130._4_4_ = fVar215 * auVar180._4_4_ + auVar339._4_4_;
  auVar130._8_4_ = fVar186 * auVar180._8_4_ + auVar339._8_4_;
  auVar130._12_4_ = fVar187 * auVar180._12_4_ + auVar339._12_4_;
  auVar339 = vcvtdq2ps_avx(auVar132);
  auVar180 = vcvtdq2ps_avx(auVar194);
  auVar180 = vsubps_avx(auVar180,auVar339);
  auVar190._0_4_ = fVar203 * auVar180._0_4_ + auVar339._0_4_;
  auVar190._4_4_ = fVar215 * auVar180._4_4_ + auVar339._4_4_;
  auVar190._8_4_ = fVar186 * auVar180._8_4_ + auVar339._8_4_;
  auVar190._12_4_ = fVar187 * auVar180._12_4_ + auVar339._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar118 * 0x16 + 6);
  auVar180 = vpmovsxwd_avx(auVar16);
  auVar339 = vcvtdq2ps_avx(auVar25);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar180 = vsubps_avx(auVar180,auVar339);
  auVar228._0_4_ = auVar339._0_4_ + fVar203 * auVar180._0_4_;
  auVar228._4_4_ = auVar339._4_4_ + fVar215 * auVar180._4_4_;
  auVar228._8_4_ = auVar339._8_4_ + fVar186 * auVar180._8_4_;
  auVar228._12_4_ = auVar339._12_4_ + fVar187 * auVar180._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar118 * 0x14 + 6);
  auVar339 = vpmovsxwd_avx(auVar21);
  auVar339 = vcvtdq2ps_avx(auVar339);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar118 * 0x18 + 6);
  auVar180 = vpmovsxwd_avx(auVar22);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar180 = vsubps_avx(auVar180,auVar339);
  auVar308._0_4_ = auVar180._0_4_ * fVar203 + auVar339._0_4_;
  auVar308._4_4_ = auVar180._4_4_ * fVar215 + auVar339._4_4_;
  auVar308._8_4_ = auVar180._8_4_ * fVar186 + auVar339._8_4_;
  auVar308._12_4_ = auVar180._12_4_ * fVar187 + auVar339._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar118 * 0x1d + 6);
  auVar339 = vpmovsxwd_avx(auVar17);
  auVar339 = vcvtdq2ps_avx(auVar339);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar118 * 0x21 + 6);
  auVar180 = vpmovsxwd_avx(auVar18);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar209 = vsubps_avx(auVar180,auVar339);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar118 * 0x1f + 6);
  auVar180 = vpmovsxwd_avx(auVar23);
  auVar316._0_4_ = auVar209._0_4_ * fVar203 + auVar339._0_4_;
  auVar316._4_4_ = auVar209._4_4_ * fVar215 + auVar339._4_4_;
  auVar316._8_4_ = auVar209._8_4_ * fVar186 + auVar339._8_4_;
  auVar316._12_4_ = auVar209._12_4_ * fVar187 + auVar339._12_4_;
  auVar339 = vcvtdq2ps_avx(auVar180);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar118 * 0x23 + 6);
  auVar180 = vpmovsxwd_avx(auVar24);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar180 = vsubps_avx(auVar180,auVar339);
  auVar174._0_4_ = auVar339._0_4_ + auVar180._0_4_ * fVar203;
  auVar174._4_4_ = auVar339._4_4_ + auVar180._4_4_ * fVar215;
  auVar174._8_4_ = auVar339._8_4_ + auVar180._8_4_ * fVar186;
  auVar174._12_4_ = auVar339._12_4_ + auVar180._12_4_ * fVar187;
  auVar339 = vsubps_avx(auVar130,auVar276);
  auVar131._0_4_ = fVar237 * auVar339._0_4_;
  auVar131._4_4_ = fVar244 * auVar339._4_4_;
  auVar131._8_4_ = fVar246 * auVar339._8_4_;
  auVar131._12_4_ = fVar249 * auVar339._12_4_;
  auVar339 = vsubps_avx(auVar190,auVar276);
  auVar191._0_4_ = fVar237 * auVar339._0_4_;
  auVar191._4_4_ = fVar244 * auVar339._4_4_;
  auVar191._8_4_ = fVar246 * auVar339._8_4_;
  auVar191._12_4_ = fVar249 * auVar339._12_4_;
  auVar339 = vsubps_avx(auVar228,auVar256);
  auVar229._0_4_ = fVar261 * auVar339._0_4_;
  auVar229._4_4_ = fVar269 * auVar339._4_4_;
  auVar229._8_4_ = fVar272 * auVar339._8_4_;
  auVar229._12_4_ = fVar274 * auVar339._12_4_;
  auVar339 = vsubps_avx(auVar308,auVar256);
  auVar240._0_4_ = fVar261 * auVar339._0_4_;
  auVar240._4_4_ = fVar269 * auVar339._4_4_;
  auVar240._8_4_ = fVar272 * auVar339._8_4_;
  auVar240._12_4_ = fVar274 * auVar339._12_4_;
  auVar339 = vsubps_avx(auVar316,auVar207);
  auVar257._0_4_ = fVar293 * auVar339._0_4_;
  auVar257._4_4_ = fVar300 * auVar339._4_4_;
  auVar257._8_4_ = fVar301 * auVar339._8_4_;
  auVar257._12_4_ = fVar303 * auVar339._12_4_;
  auVar339 = vsubps_avx(auVar174,auVar207);
  auVar175._0_4_ = fVar293 * auVar339._0_4_;
  auVar175._4_4_ = fVar300 * auVar339._4_4_;
  auVar175._8_4_ = fVar301 * auVar339._8_4_;
  auVar175._12_4_ = fVar303 * auVar339._12_4_;
  auVar339 = vpminsd_avx(auVar131,auVar191);
  auVar180 = vpminsd_avx(auVar229,auVar240);
  auVar339 = vmaxps_avx(auVar339,auVar180);
  auVar180 = vpminsd_avx(auVar257,auVar175);
  uVar127 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar277._4_4_ = uVar127;
  auVar277._0_4_ = uVar127;
  auVar277._8_4_ = uVar127;
  auVar277._12_4_ = uVar127;
  auVar180 = vmaxps_avx(auVar180,auVar277);
  auVar339 = vmaxps_avx(auVar339,auVar180);
  local_2b0._0_4_ = auVar339._0_4_ * 0.99999964;
  local_2b0._4_4_ = auVar339._4_4_ * 0.99999964;
  local_2b0._8_4_ = auVar339._8_4_ * 0.99999964;
  local_2b0._12_4_ = auVar339._12_4_ * 0.99999964;
  auVar339 = vpmaxsd_avx(auVar131,auVar191);
  auVar180 = vpmaxsd_avx(auVar229,auVar240);
  auVar339 = vminps_avx(auVar339,auVar180);
  auVar180 = vpmaxsd_avx(auVar257,auVar175);
  fVar261 = ray->tfar;
  auVar192._4_4_ = fVar261;
  auVar192._0_4_ = fVar261;
  auVar192._8_4_ = fVar261;
  auVar192._12_4_ = fVar261;
  auVar180 = vminps_avx(auVar180,auVar192);
  auVar339 = vminps_avx(auVar339,auVar180);
  auVar180 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar180 = vpcmpgtd_avx(auVar180,_DAT_01f4ad30);
  auVar132._0_4_ = auVar339._0_4_ * 1.0000004;
  auVar132._4_4_ = auVar339._4_4_ * 1.0000004;
  auVar132._8_4_ = auVar339._8_4_ * 1.0000004;
  auVar132._12_4_ = auVar339._12_4_ * 1.0000004;
  auVar339 = vcmpps_avx(local_2b0,auVar132,2);
  auVar339 = vandps_avx(auVar339,auVar180);
  uVar127 = vmovmskps_avx(auVar339);
  local_4a0 = mm_lookupmask_ps._16_8_;
  uStack_498 = mm_lookupmask_ps._24_8_;
  uStack_490 = mm_lookupmask_ps._16_8_;
  uStack_488 = mm_lookupmask_ps._24_8_;
  local_7d8 = context;
  local_7c8 = prim;
  for (uVar118 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar127); auVar164 = local_640,
      uVar118 != 0; uVar118 = (ulong)((uint)uVar118 & (uint)uVar118 + 0xf & uVar122)) {
    lVar126 = 0;
    if (uVar118 != 0) {
      for (; (uVar118 >> lVar126 & 1) == 0; lVar126 = lVar126 + 1) {
      }
    }
    local_720 = (ulong)*(uint *)(local_7c8 + 2);
    pGVar12 = (local_7d8->scene->geometries).items[*(uint *)(local_7c8 + 2)].ptr;
    local_648 = (ulong)*(uint *)(local_7c8 + lVar126 * 4 + 6);
    uVar121 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                              (ulong)*(uint *)(local_7c8 + lVar126 * 4 + 6) *
                              pGVar12[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar261 = (pGVar12->time_range).lower;
    fVar261 = pGVar12->fnumTimeSegments *
              (((ray->dir).field_0.m128[3] - fVar261) / ((pGVar12->time_range).upper - fVar261));
    auVar339 = vroundss_avx(ZEXT416((uint)fVar261),ZEXT416((uint)fVar261),9);
    auVar339 = vminss_avx(auVar339,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
    auVar339 = vmaxss_avx(ZEXT816(0) << 0x20,auVar339);
    fVar261 = fVar261 - auVar339._0_4_;
    _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar123 = (long)(int)auVar339._0_4_ * 0x38;
    lVar125 = *(long *)(_Var13 + 0x10 + lVar123);
    lVar124 = *(long *)(_Var13 + 0x38 + lVar123);
    lVar14 = *(long *)(_Var13 + 0x48 + lVar123);
    auVar339 = vshufps_avx(ZEXT416((uint)fVar261),ZEXT416((uint)fVar261),0);
    pfVar1 = (float *)(lVar124 + lVar14 * uVar121);
    fVar293 = auVar339._0_4_;
    fVar300 = auVar339._4_4_;
    fVar301 = auVar339._8_4_;
    fVar303 = auVar339._12_4_;
    lVar126 = uVar121 + 1;
    pfVar2 = (float *)(lVar124 + lVar14 * lVar126);
    p_Var15 = pGVar12[4].occlusionFilterN;
    auVar339 = vshufps_avx(ZEXT416((uint)(1.0 - fVar261)),ZEXT416((uint)(1.0 - fVar261)),0);
    pfVar3 = (float *)(*(long *)(_Var13 + lVar123) + lVar125 * uVar121);
    fVar261 = auVar339._0_4_;
    fVar269 = auVar339._4_4_;
    fVar272 = auVar339._8_4_;
    fVar274 = auVar339._12_4_;
    pfVar4 = (float *)(*(long *)(_Var13 + lVar123) + lVar125 * lVar126);
    pfVar5 = (float *)(*(long *)(p_Var15 + lVar123 + 0x38) +
                      uVar121 * *(long *)(p_Var15 + lVar123 + 0x48));
    pfVar6 = (float *)(*(long *)(p_Var15 + lVar123 + 0x38) +
                      *(long *)(p_Var15 + lVar123 + 0x48) * lVar126);
    pfVar7 = (float *)(*(long *)(p_Var15 + lVar123) + *(long *)(p_Var15 + lVar123 + 0x10) * uVar121)
    ;
    fVar203 = fVar261 * *pfVar3 + fVar293 * *pfVar1;
    fVar215 = fVar269 * pfVar3[1] + fVar300 * pfVar1[1];
    local_690 = (undefined1  [8])CONCAT44(fVar215,fVar203);
    uStack_688._0_4_ = fVar272 * pfVar3[2] + fVar301 * pfVar1[2];
    uStack_688._4_4_ = fVar274 * pfVar3[3] + fVar303 * pfVar1[3];
    pfVar1 = (float *)(*(long *)(p_Var15 + lVar123) + *(long *)(p_Var15 + lVar123 + 0x10) * lVar126)
    ;
    local_590._0_4_ = fVar261 * *pfVar4 + fVar293 * *pfVar2;
    local_590._4_4_ = fVar269 * pfVar4[1] + fVar300 * pfVar2[1];
    fStack_588 = fVar272 * pfVar4[2] + fVar301 * pfVar2[2];
    fStack_584 = fVar274 * pfVar4[3] + fVar303 * pfVar2[3];
    uVar122 = (uint)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    local_5a0 = (undefined1  [8])
                CONCAT44(fVar215 + (fVar269 * pfVar7[1] + fVar300 * pfVar5[1]) * 0.33333334,
                         fVar203 + (fVar261 * *pfVar7 + fVar293 * *pfVar5) * 0.33333334);
    uStack_598._0_4_ = (float)uStack_688 + (fVar272 * pfVar7[2] + fVar301 * pfVar5[2]) * 0.33333334;
    uStack_598._4_4_ = uStack_688._4_4_ + (fVar274 * pfVar7[3] + fVar303 * pfVar5[3]) * 0.33333334;
    auVar133._0_4_ = (fVar261 * *pfVar1 + fVar293 * *pfVar6) * 0.33333334;
    auVar133._4_4_ = (fVar269 * pfVar1[1] + fVar300 * pfVar6[1]) * 0.33333334;
    auVar133._8_4_ = (fVar272 * pfVar1[2] + fVar301 * pfVar6[2]) * 0.33333334;
    auVar133._12_4_ = (fVar274 * pfVar1[3] + fVar303 * pfVar6[3]) * 0.33333334;
    _local_5b0 = vsubps_avx(_local_590,auVar133);
    aVar10 = (ray->org).field_0;
    auVar209 = vsubps_avx(_local_690,(undefined1  [16])aVar10);
    auVar21 = _local_690;
    auVar339 = vshufps_avx(auVar209,auVar209,0);
    auVar180 = vshufps_avx(auVar209,auVar209,0x55);
    auVar209 = vshufps_avx(auVar209,auVar209,0xaa);
    fVar261 = (local_718->ray_space).vx.field_0.m128[0];
    fVar269 = (local_718->ray_space).vx.field_0.m128[1];
    fVar272 = (local_718->ray_space).vx.field_0.m128[2];
    fVar274 = (local_718->ray_space).vx.field_0.m128[3];
    fVar293 = (local_718->ray_space).vy.field_0.m128[0];
    fVar300 = (local_718->ray_space).vy.field_0.m128[1];
    fVar301 = (local_718->ray_space).vy.field_0.m128[2];
    fVar303 = (local_718->ray_space).vy.field_0.m128[3];
    fVar203 = (local_718->ray_space).vz.field_0.m128[0];
    fVar215 = (local_718->ray_space).vz.field_0.m128[1];
    fVar186 = (local_718->ray_space).vz.field_0.m128[2];
    fVar187 = (local_718->ray_space).vz.field_0.m128[3];
    auVar193._0_4_ = auVar339._0_4_ * fVar261 + auVar209._0_4_ * fVar203 + auVar180._0_4_ * fVar293;
    auVar193._4_4_ = auVar339._4_4_ * fVar269 + auVar209._4_4_ * fVar215 + auVar180._4_4_ * fVar300;
    auVar193._8_4_ = auVar339._8_4_ * fVar272 + auVar209._8_4_ * fVar186 + auVar180._8_4_ * fVar301;
    auVar193._12_4_ =
         auVar339._12_4_ * fVar274 + auVar209._12_4_ * fVar187 + auVar180._12_4_ * fVar303;
    auVar339 = vblendps_avx(auVar193,_local_690,8);
    auVar194 = vsubps_avx(_local_5a0,(undefined1  [16])aVar10);
    auVar180 = vshufps_avx(auVar194,auVar194,0);
    auVar209 = vshufps_avx(auVar194,auVar194,0x55);
    auVar194 = vshufps_avx(auVar194,auVar194,0xaa);
    auVar176._0_4_ = auVar180._0_4_ * fVar261 + auVar209._0_4_ * fVar293 + fVar203 * auVar194._0_4_;
    auVar176._4_4_ = auVar180._4_4_ * fVar269 + auVar209._4_4_ * fVar300 + fVar215 * auVar194._4_4_;
    auVar176._8_4_ = auVar180._8_4_ * fVar272 + auVar209._8_4_ * fVar301 + fVar186 * auVar194._8_4_;
    auVar176._12_4_ =
         auVar180._12_4_ * fVar274 + auVar209._12_4_ * fVar303 + fVar187 * auVar194._12_4_;
    auVar180 = vblendps_avx(auVar176,_local_5a0,8);
    auVar25 = vsubps_avx(_local_5b0,(undefined1  [16])aVar10);
    auVar209 = vshufps_avx(auVar25,auVar25,0);
    auVar194 = vshufps_avx(auVar25,auVar25,0x55);
    auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
    auVar258._0_4_ = auVar209._0_4_ * fVar261 + auVar194._0_4_ * fVar293 + fVar203 * auVar25._0_4_;
    auVar258._4_4_ = auVar209._4_4_ * fVar269 + auVar194._4_4_ * fVar300 + fVar215 * auVar25._4_4_;
    auVar258._8_4_ = auVar209._8_4_ * fVar272 + auVar194._8_4_ * fVar301 + fVar186 * auVar25._8_4_;
    auVar258._12_4_ =
         auVar209._12_4_ * fVar274 + auVar194._12_4_ * fVar303 + fVar187 * auVar25._12_4_;
    auVar209 = vblendps_avx(auVar258,_local_5b0,8);
    auVar16 = vsubps_avx(_local_590,(undefined1  [16])aVar10);
    auVar194 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar25 = vshufps_avx(auVar16,auVar16,0);
    auVar16 = vshufps_avx(auVar16,auVar16,0x55);
    auVar158._0_4_ = auVar25._0_4_ * fVar261 + auVar194._0_4_ * fVar203 + auVar16._0_4_ * fVar293;
    auVar158._4_4_ = auVar25._4_4_ * fVar269 + auVar194._4_4_ * fVar215 + auVar16._4_4_ * fVar300;
    auVar158._8_4_ = auVar25._8_4_ * fVar272 + auVar194._8_4_ * fVar186 + auVar16._8_4_ * fVar301;
    auVar158._12_4_ =
         auVar25._12_4_ * fVar274 + auVar194._12_4_ * fVar187 + auVar16._12_4_ * fVar303;
    auVar194 = vblendps_avx(auVar158,_local_590,8);
    auVar208._8_4_ = 0x7fffffff;
    auVar208._0_8_ = 0x7fffffff7fffffff;
    auVar208._12_4_ = 0x7fffffff;
    auVar339 = vandps_avx(auVar339,auVar208);
    auVar180 = vandps_avx(auVar180,auVar208);
    auVar25 = vmaxps_avx(auVar339,auVar180);
    auVar339 = vandps_avx(auVar209,auVar208);
    auVar180 = vandps_avx(auVar194,auVar208);
    auVar339 = vmaxps_avx(auVar339,auVar180);
    auVar339 = vmaxps_avx(auVar25,auVar339);
    auVar180 = vmovshdup_avx(auVar339);
    auVar180 = vmaxss_avx(auVar180,auVar339);
    auVar339 = vshufpd_avx(auVar339,auVar339,1);
    auVar339 = vmaxss_avx(auVar339,auVar180);
    local_640._0_4_ = auVar339._0_4_;
    local_7d0 = (long)(int)uVar122;
    lVar126 = local_7d0 * 0x44;
    fVar198 = *(float *)(bezier_basis0 + lVar126 + 0x908);
    fVar309 = *(float *)(bezier_basis0 + lVar126 + 0x90c);
    fVar201 = *(float *)(bezier_basis0 + lVar126 + 0x910);
    fVar310 = *(float *)(bezier_basis0 + lVar126 + 0x914);
    fVar202 = *(float *)(bezier_basis0 + lVar126 + 0x918);
    fVar312 = *(float *)(bezier_basis0 + lVar126 + 0x91c);
    fVar234 = *(float *)(bezier_basis0 + lVar126 + 0x920);
    auVar180 = vshufps_avx(auVar258,auVar258,0);
    register0x00001250 = auVar180;
    _local_7c0 = auVar180;
    fVar269 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar126 + 0xd8c);
    fVar272 = *(float *)(bezier_basis0 + lVar126 + 0xd90);
    fVar293 = *(float *)(bezier_basis0 + lVar126 + 0xd94);
    fVar300 = *(float *)(bezier_basis0 + lVar126 + 0xd98);
    fVar303 = *(float *)(bezier_basis0 + lVar126 + 0xd9c);
    fVar203 = *(float *)(bezier_basis0 + lVar126 + 0xda0);
    fVar186 = *(float *)(bezier_basis0 + lVar126 + 0xda4);
    auVar114 = *(undefined1 (*) [28])(bezier_basis0 + lVar126 + 0xd8c);
    auVar209 = vshufps_avx(auVar158,auVar158,0);
    register0x000014d0 = auVar209;
    _local_400 = auVar209;
    fVar287 = auVar209._0_4_;
    fVar289 = auVar209._4_4_;
    fVar291 = auVar209._8_4_;
    fVar311 = auVar209._12_4_;
    fVar157 = auVar180._0_4_;
    fVar166 = auVar180._4_4_;
    fVar167 = auVar180._8_4_;
    fVar168 = auVar180._12_4_;
    auVar180 = vshufps_avx(auVar258,auVar258,0x55);
    register0x000012d0 = auVar180;
    _local_760 = auVar180;
    auVar209 = vshufps_avx(auVar158,auVar158,0x55);
    register0x00001210 = auVar209;
    _local_740 = auVar209;
    fVar261 = auVar209._0_4_;
    fVar274 = auVar209._4_4_;
    fVar301 = auVar209._8_4_;
    fVar215 = auVar209._12_4_;
    fVar189 = auVar180._0_4_;
    fVar197 = auVar180._4_4_;
    fVar199 = auVar180._8_4_;
    fVar200 = auVar180._12_4_;
    auVar22 = _local_5b0;
    auVar180 = vshufps_avx(_local_5b0,_local_5b0,0xff);
    register0x00001390 = auVar180;
    _local_80 = auVar180;
    auVar209 = vshufps_avx(_local_590,_local_590,0xff);
    register0x00001450 = auVar209;
    _local_a0 = auVar209;
    fVar254 = auVar209._0_4_;
    fVar255 = auVar209._4_4_;
    fVar282 = auVar209._8_4_;
    fVar284 = auVar209._12_4_;
    fVar246 = auVar180._0_4_;
    fVar249 = auVar180._4_4_;
    fVar247 = auVar180._8_4_;
    auVar209 = vshufps_avx(auVar176,auVar176,0);
    register0x00001310 = auVar209;
    _local_780 = auVar209;
    fVar313 = *(float *)(bezier_basis0 + lVar126 + 0x484);
    fVar326 = *(float *)(bezier_basis0 + lVar126 + 0x488);
    fVar314 = *(float *)(bezier_basis0 + lVar126 + 0x48c);
    fVar235 = *(float *)(bezier_basis0 + lVar126 + 0x490);
    fVar315 = *(float *)(bezier_basis0 + lVar126 + 0x494);
    fVar253 = *(float *)(bezier_basis0 + lVar126 + 0x498);
    fVar262 = *(float *)(bezier_basis0 + lVar126 + 0x49c);
    fVar204 = auVar209._0_4_;
    fVar216 = auVar209._4_4_;
    fVar218 = auVar209._8_4_;
    fVar220 = auVar209._12_4_;
    auVar209 = vshufps_avx(auVar176,auVar176,0x55);
    register0x00001290 = auVar209;
    _local_320 = auVar209;
    auVar185 = ZEXT3264(_local_320);
    fVar155 = auVar209._0_4_;
    fStack_41c = auVar209._4_4_;
    fStack_418 = auVar209._8_4_;
    fStack_414 = auVar209._12_4_;
    auVar17 = _local_5a0;
    auVar194 = vshufps_avx(_local_5a0,_local_5a0,0xff);
    register0x000015d0 = auVar194;
    _local_120 = auVar194;
    fVar302 = auVar194._0_4_;
    fVar304 = auVar194._4_4_;
    fVar327 = auVar194._8_4_;
    fVar330 = auVar194._12_4_;
    auVar194 = vshufps_avx(auVar193,auVar193,0);
    register0x00001250 = auVar194;
    _local_6c0 = auVar194;
    pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar126);
    fVar187 = *(float *)*pauVar8;
    fVar237 = *(float *)(bezier_basis0 + lVar126 + 4);
    fVar244 = *(float *)(bezier_basis0 + lVar126 + 8);
    auVar271 = *(undefined1 (*) [12])*pauVar8;
    fVar222 = *(float *)(bezier_basis0 + lVar126 + 0xc);
    fStack_370 = *(float *)(bezier_basis0 + lVar126 + 0x10);
    fStack_36c = *(float *)(bezier_basis0 + lVar126 + 0x14);
    fStack_368 = *(float *)(bezier_basis0 + lVar126 + 0x18);
    fVar148 = auVar194._0_4_;
    fVar150 = auVar194._4_4_;
    fVar152 = auVar194._8_4_;
    fVar154 = auVar194._12_4_;
    auVar296._0_4_ = fVar148 * fVar187 + fVar204 * fVar313 + fVar157 * fVar198 + fVar287 * fVar269;
    auVar296._4_4_ = fVar150 * fVar237 + fVar216 * fVar326 + fVar166 * fVar309 + fVar289 * fVar272;
    auVar296._8_4_ = fVar152 * fVar244 + fVar218 * fVar314 + fVar167 * fVar201 + fVar291 * fVar293;
    auVar296._12_4_ = fVar154 * fVar222 + fVar220 * fVar235 + fVar168 * fVar310 + fVar311 * fVar300;
    auVar296._16_4_ =
         fVar148 * fStack_370 + fVar204 * fVar315 + fVar157 * fVar202 + fVar287 * fVar303;
    auVar296._20_4_ =
         fVar150 * fStack_36c + fVar216 * fVar253 + fVar166 * fVar312 + fVar289 * fVar203;
    auVar296._24_4_ =
         fVar152 * fStack_368 + fVar218 * fVar262 + fVar167 * fVar234 + fVar291 * fVar186;
    auVar296._28_4_ = *(float *)(bezier_basis0 + lVar126 + 0x924) + fVar168 + 0.0 + 0.0;
    auVar194 = vshufps_avx(auVar193,auVar193,0x55);
    register0x00001410 = auVar194;
    _local_340 = auVar194;
    fVar248 = auVar194._0_4_;
    fVar250 = auVar194._4_4_;
    fVar251 = auVar194._8_4_;
    fVar252 = auVar194._12_4_;
    auVar321._0_4_ = fVar248 * fVar187 + fVar155 * fVar313 + fVar189 * fVar198 + fVar269 * fVar261;
    auVar321._4_4_ =
         fVar250 * fVar237 + fStack_41c * fVar326 + fVar197 * fVar309 + fVar272 * fVar274;
    auVar321._8_4_ =
         fVar251 * fVar244 + fStack_418 * fVar314 + fVar199 * fVar201 + fVar293 * fVar301;
    auVar321._12_4_ =
         fVar252 * fVar222 + fStack_414 * fVar235 + fVar200 * fVar310 + fVar300 * fVar215;
    auVar321._16_4_ =
         fVar248 * fStack_370 + fVar155 * fVar315 + fVar189 * fVar202 + fVar303 * fVar261;
    auVar321._20_4_ =
         fVar250 * fStack_36c + fStack_41c * fVar253 + fVar197 * fVar312 + fVar203 * fVar274;
    auVar321._24_4_ =
         fVar251 * fStack_368 + fStack_418 * fVar262 + fVar199 * fVar234 + fVar186 * fVar301;
    auVar321._28_4_ = fVar200 + fVar215 + 0.0 + 0.0;
    auVar194 = vpermilps_avx(_local_690,0xff);
    register0x000013d0 = auVar194;
    _local_c0 = auVar194;
    _local_380 = *pauVar8;
    auVar18 = _local_380;
    uStack_364 = *(undefined4 *)(bezier_basis0 + lVar126 + 0x1c);
    fVar305 = auVar194._0_4_;
    fVar238 = auVar194._4_4_;
    fVar245 = auVar194._8_4_;
    local_7a0._0_4_ = fVar246 * fVar198 + fVar254 * fVar269 + fVar302 * fVar313 + fVar305 * fVar187;
    local_7a0._4_4_ = fVar249 * fVar309 + fVar255 * fVar272 + fVar304 * fVar326 + fVar238 * fVar237;
    fStack_798 = fVar247 * fVar201 + fVar282 * fVar293 + fVar327 * fVar314 + fVar245 * fVar244;
    fStack_794 = auVar180._12_4_ * fVar310 + fVar284 * fVar300 + fVar330 * fVar235 +
                 auVar194._12_4_ * fVar222;
    fStack_790 = fVar246 * fVar202 + fVar254 * fVar303 + fVar302 * fVar315 + fVar305 * fStack_370;
    fStack_78c = fVar249 * fVar312 + fVar255 * fVar203 + fVar304 * fVar253 + fVar238 * fStack_36c;
    fStack_788 = fVar247 * fVar234 + fVar282 * fVar186 + fVar327 * fVar262 + fVar245 * fStack_368;
    fStack_784 = 0.0;
    fVar169 = *(float *)(bezier_basis1 + lVar126 + 0x908);
    fVar270 = *(float *)(bezier_basis1 + lVar126 + 0x90c);
    fVar273 = *(float *)(bezier_basis1 + lVar126 + 0x910);
    fVar224 = *(float *)(bezier_basis1 + lVar126 + 0x914);
    fVar170 = *(float *)(bezier_basis1 + lVar126 + 0x918);
    fVar275 = *(float *)(bezier_basis1 + lVar126 + 0x91c);
    fVar281 = *(float *)(bezier_basis1 + lVar126 + 0x920);
    fVar283 = *(float *)(bezier_basis1 + lVar126 + 0xd8c);
    fVar285 = *(float *)(bezier_basis1 + lVar126 + 0xd90);
    fVar286 = *(float *)(bezier_basis1 + lVar126 + 0xd94);
    fVar288 = *(float *)(bezier_basis1 + lVar126 + 0xd98);
    fVar290 = *(float *)(bezier_basis1 + lVar126 + 0xd9c);
    fVar171 = *(float *)(bezier_basis1 + lVar126 + 0xda0);
    fVar188 = *(float *)(bezier_basis1 + lVar126 + 0xda4);
    fVar269 = fVar220 + 0.0;
    fVar292 = *(float *)(bezier_basis1 + lVar126 + 0x484);
    fVar147 = *(float *)(bezier_basis1 + lVar126 + 0x488);
    fVar149 = *(float *)(bezier_basis1 + lVar126 + 0x48c);
    fVar151 = *(float *)(bezier_basis1 + lVar126 + 0x490);
    fVar153 = *(float *)(bezier_basis1 + lVar126 + 0x494);
    fVar156 = *(float *)(bezier_basis1 + lVar126 + 0x498);
    fVar227 = *(float *)(bezier_basis1 + lVar126 + 0x49c);
    fVar272 = fVar269 + fVar220 + 0.0;
    fVar236 = fVar269 + fVar284 + 0.0;
    fVar205 = *(float *)(bezier_basis1 + lVar126);
    fVar217 = *(float *)(bezier_basis1 + lVar126 + 4);
    fVar219 = *(float *)(bezier_basis1 + lVar126 + 8);
    fVar221 = *(float *)(bezier_basis1 + lVar126 + 0xc);
    fVar223 = *(float *)(bezier_basis1 + lVar126 + 0x10);
    fVar225 = *(float *)(bezier_basis1 + lVar126 + 0x14);
    fVar226 = *(float *)(bezier_basis1 + lVar126 + 0x18);
    local_360._0_4_ = fVar148 * fVar205 + fVar204 * fVar292 + fVar169 * fVar157 + fVar287 * fVar283;
    local_360._4_4_ = fVar150 * fVar217 + fVar216 * fVar147 + fVar270 * fVar166 + fVar289 * fVar285;
    local_360._8_4_ = fVar152 * fVar219 + fVar218 * fVar149 + fVar273 * fVar167 + fVar291 * fVar286;
    local_360._12_4_ = fVar154 * fVar221 + fVar220 * fVar151 + fVar224 * fVar168 + fVar311 * fVar288
    ;
    local_360._16_4_ = fVar148 * fVar223 + fVar204 * fVar153 + fVar170 * fVar157 + fVar287 * fVar290
    ;
    local_360._20_4_ = fVar150 * fVar225 + fVar216 * fVar156 + fVar275 * fVar166 + fVar289 * fVar171
    ;
    local_360._24_4_ = fVar152 * fVar226 + fVar218 * fVar227 + fVar281 * fVar167 + fVar291 * fVar188
    ;
    local_360._28_4_ = fVar330 + fVar269 + 0.0;
    local_480._0_4_ = fVar248 * fVar205 + fVar292 * fVar155 + fVar169 * fVar189 + fVar283 * fVar261;
    local_480._4_4_ =
         fVar250 * fVar217 + fVar147 * fStack_41c + fVar270 * fVar197 + fVar285 * fVar274;
    fStack_478 = fVar251 * fVar219 + fVar149 * fStack_418 + fVar273 * fVar199 + fVar286 * fVar301;
    fStack_474 = fVar252 * fVar221 + fVar151 * fStack_414 + fVar224 * fVar200 + fVar288 * fVar215;
    fStack_470 = fVar248 * fVar223 + fVar153 * fVar155 + fVar170 * fVar189 + fVar290 * fVar261;
    fStack_46c = fVar250 * fVar225 + fVar156 * fStack_41c + fVar275 * fVar197 + fVar171 * fVar274;
    fStack_468 = fVar251 * fVar226 + fVar227 * fStack_418 + fVar281 * fVar199 + fVar188 * fVar301;
    register0x0000159c = fVar269 + 0.0 + fVar272;
    local_6e0._0_4_ = fVar305 * fVar205 + fVar302 * fVar292 + fVar246 * fVar169 + fVar254 * fVar283;
    local_6e0._4_4_ = fVar238 * fVar217 + fVar304 * fVar147 + fVar249 * fVar270 + fVar255 * fVar285;
    local_6e0._8_4_ = fVar245 * fVar219 + fVar327 * fVar149 + fVar247 * fVar273 + fVar282 * fVar286;
    local_6e0._12_4_ =
         auVar194._12_4_ * fVar221 +
         fVar330 * fVar151 + auVar180._12_4_ * fVar224 + fVar284 * fVar288;
    local_6e0._16_4_ = fVar305 * fVar223 + fVar302 * fVar153 + fVar246 * fVar170 + fVar254 * fVar290
    ;
    local_6e0._20_4_ = fVar238 * fVar225 + fVar304 * fVar156 + fVar249 * fVar275 + fVar255 * fVar171
    ;
    local_6e0._24_4_ = fVar245 * fVar226 + fVar327 * fVar227 + fVar247 * fVar281 + fVar282 * fVar188
    ;
    local_6e0._28_4_ = fVar272 + fVar236;
    auVar26 = vsubps_avx(local_360,auVar296);
    auVar27 = vsubps_avx(_local_480,auVar321);
    fVar269 = auVar26._0_4_;
    fVar293 = auVar26._4_4_;
    auVar19._4_4_ = auVar321._4_4_ * fVar293;
    auVar19._0_4_ = auVar321._0_4_ * fVar269;
    fVar303 = auVar26._8_4_;
    auVar19._8_4_ = auVar321._8_4_ * fVar303;
    fVar186 = auVar26._12_4_;
    auVar19._12_4_ = auVar321._12_4_ * fVar186;
    fVar237 = auVar26._16_4_;
    auVar19._16_4_ = auVar321._16_4_ * fVar237;
    fVar246 = auVar26._20_4_;
    auVar19._20_4_ = auVar321._20_4_ * fVar246;
    fVar247 = auVar26._24_4_;
    auVar19._24_4_ = auVar321._24_4_ * fVar247;
    auVar19._28_4_ = fVar272;
    fVar272 = auVar27._0_4_;
    fVar300 = auVar27._4_4_;
    auVar28._4_4_ = auVar296._4_4_ * fVar300;
    auVar28._0_4_ = auVar296._0_4_ * fVar272;
    fVar203 = auVar27._8_4_;
    auVar28._8_4_ = auVar296._8_4_ * fVar203;
    fVar187 = auVar27._12_4_;
    auVar28._12_4_ = auVar296._12_4_ * fVar187;
    fVar244 = auVar27._16_4_;
    auVar28._16_4_ = auVar296._16_4_ * fVar244;
    fVar249 = auVar27._20_4_;
    auVar28._20_4_ = auVar296._20_4_ * fVar249;
    fVar305 = auVar27._24_4_;
    auVar28._24_4_ = auVar296._24_4_ * fVar305;
    auVar28._28_4_ = fVar236;
    auVar28 = vsubps_avx(auVar19,auVar28);
    auVar19 = vmaxps_avx(_local_7a0,local_6e0);
    auVar34._4_4_ = auVar19._4_4_ * auVar19._4_4_ * (fVar293 * fVar293 + fVar300 * fVar300);
    auVar34._0_4_ = auVar19._0_4_ * auVar19._0_4_ * (fVar269 * fVar269 + fVar272 * fVar272);
    auVar34._8_4_ = auVar19._8_4_ * auVar19._8_4_ * (fVar303 * fVar303 + fVar203 * fVar203);
    auVar34._12_4_ = auVar19._12_4_ * auVar19._12_4_ * (fVar186 * fVar186 + fVar187 * fVar187);
    auVar34._16_4_ = auVar19._16_4_ * auVar19._16_4_ * (fVar237 * fVar237 + fVar244 * fVar244);
    auVar34._20_4_ = auVar19._20_4_ * auVar19._20_4_ * (fVar246 * fVar246 + fVar249 * fVar249);
    auVar34._24_4_ = auVar19._24_4_ * auVar19._24_4_ * (fVar247 * fVar247 + fVar305 * fVar305);
    auVar34._28_4_ = local_360._28_4_ + fVar236;
    auVar20._4_4_ = auVar28._4_4_ * auVar28._4_4_;
    auVar20._0_4_ = auVar28._0_4_ * auVar28._0_4_;
    auVar20._8_4_ = auVar28._8_4_ * auVar28._8_4_;
    auVar20._12_4_ = auVar28._12_4_ * auVar28._12_4_;
    auVar20._16_4_ = auVar28._16_4_ * auVar28._16_4_;
    auVar20._20_4_ = auVar28._20_4_ * auVar28._20_4_;
    auVar20._24_4_ = auVar28._24_4_ * auVar28._24_4_;
    auVar20._28_4_ = auVar28._28_4_;
    auVar19 = vcmpps_avx(auVar20,auVar34,2);
    auVar230._0_4_ = (float)(int)uVar122;
    auVar230._4_12_ = auVar209._4_12_;
    local_420 = auVar230._0_4_;
    auVar180 = vshufps_avx(auVar230,auVar230,0);
    auVar231._16_16_ = auVar180;
    auVar231._0_16_ = auVar180;
    auVar28 = vcmpps_avx(_DAT_01f7b060,auVar231,1);
    auVar180 = vpermilps_avx(auVar193,0xaa);
    register0x000013d0 = auVar180;
    _local_460 = auVar180;
    auVar209 = vpermilps_avx(auVar176,0xaa);
    register0x00001590 = auVar209;
    _local_300 = auVar209;
    auVar194 = vpermilps_avx(auVar258,0xaa);
    register0x000015d0 = auVar194;
    _local_2e0 = auVar194;
    auVar25 = vpermilps_avx(auVar158,0xaa);
    register0x00001490 = auVar25;
    _local_580 = auVar25;
    auVar34 = auVar28 & auVar19;
    auVar16 = vpermilps_avx((undefined1  [16])aVar10,0xff);
    local_620 = ZEXT1632(auVar16);
    auVar339 = ZEXT416((uint)(auVar339._0_4_ * 4.7683716e-07));
    fVar269 = fVar261;
    fVar272 = fVar274;
    fVar293 = fVar301;
    fVar300 = fVar215;
    fVar303 = fVar157;
    fVar203 = fVar166;
    fVar186 = fVar167;
    fVar187 = fVar204;
    fVar237 = fVar216;
    fVar244 = fVar218;
    fVar246 = fVar189;
    fVar249 = fVar197;
    fVar247 = fVar199;
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar34 >> 0x7f,0) == '\0') &&
          (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar34 >> 0xbf,0) == '\0') &&
        (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar34[0x1f]) {
      bVar128 = 0;
      auVar329 = ZEXT3264(_local_6c0);
      local_620._0_16_ = auVar16;
    }
    else {
      local_3a0 = vandps_avx(auVar19,auVar28);
      fVar238 = auVar180._0_4_;
      fVar245 = auVar180._4_4_;
      fVar254 = auVar180._8_4_;
      fVar255 = auVar180._12_4_;
      fVar327 = auVar209._0_4_;
      fVar330 = auVar209._4_4_;
      fVar331 = auVar209._8_4_;
      fVar332 = auVar209._12_4_;
      fVar333 = auVar194._0_4_;
      fVar336 = auVar194._4_4_;
      fVar337 = auVar194._8_4_;
      fVar338 = auVar194._12_4_;
      fVar282 = auVar25._0_4_;
      fVar284 = auVar25._4_4_;
      fVar302 = auVar25._8_4_;
      fVar304 = auVar25._12_4_;
      fVar236 = auVar28._28_4_ + 0.0;
      fVar305 = local_3a0._28_4_ + fVar236;
      local_640._16_16_ = auVar164._16_16_;
      local_640._0_16_ = auVar339;
      local_440 = fVar238 * fVar205 + fVar327 * fVar292 + fVar333 * fVar169 + fVar282 * fVar283;
      fStack_43c = fVar245 * fVar217 + fVar330 * fVar147 + fVar336 * fVar270 + fVar284 * fVar285;
      fStack_438 = fVar254 * fVar219 + fVar331 * fVar149 + fVar337 * fVar273 + fVar302 * fVar286;
      fStack_434 = fVar255 * fVar221 + fVar332 * fVar151 + fVar338 * fVar224 + fVar304 * fVar288;
      fStack_430 = fVar238 * fVar223 + fVar327 * fVar153 + fVar333 * fVar170 + fVar282 * fVar290;
      fStack_42c = fVar245 * fVar225 + fVar330 * fVar156 + fVar336 * fVar275 + fVar284 * fVar171;
      fStack_428 = fVar254 * fVar226 + fVar331 * fVar227 + fVar337 * fVar281 + fVar302 * fVar188;
      fStack_424 = *(float *)(bezier_basis1 + lVar126 + 0x1c) + fVar305;
      local_380._0_4_ = auVar271._0_4_;
      local_380._4_4_ = auVar271._4_4_;
      fStack_378 = auVar271._8_4_;
      local_600._0_4_ = auVar114._0_4_;
      local_600._4_4_ = auVar114._4_4_;
      fStack_5f8 = auVar114._8_4_;
      fStack_5f4 = auVar114._12_4_;
      fStack_5f0 = auVar114._16_4_;
      fStack_5ec = auVar114._20_4_;
      fStack_5e8 = auVar114._24_4_;
      local_5e0 = fVar238 * (float)local_380._0_4_ +
                  fVar327 * fVar313 + fVar333 * fVar198 + fVar282 * (float)local_600._0_4_;
      fStack_5dc = fVar245 * (float)local_380._4_4_ +
                   fVar330 * fVar326 + fVar336 * fVar309 + fVar284 * (float)local_600._4_4_;
      fStack_5d8 = fVar254 * fStack_378 +
                   fVar331 * fVar314 + fVar337 * fVar201 + fVar302 * fStack_5f8;
      fStack_5d4 = fVar255 * fVar222 + fVar332 * fVar235 + fVar338 * fVar310 + fVar304 * fStack_5f4;
      fStack_5d0 = fVar238 * fStack_370 +
                   fVar327 * fVar315 + fVar333 * fVar202 + fVar282 * fStack_5f0;
      fStack_5cc = fVar245 * fStack_36c +
                   fVar330 * fVar253 + fVar336 * fVar312 + fVar284 * fStack_5ec;
      fStack_5c8 = fVar254 * fStack_368 +
                   fVar331 * fVar262 + fVar337 * fVar234 + fVar302 * fStack_5e8;
      fStack_5c4 = fVar252 + fStack_424 + *(float *)(bezier_basis1 + lVar126 + 0x1c) + fVar305;
      fVar305 = *(float *)(bezier_basis0 + lVar126 + 0x1210);
      fVar198 = *(float *)(bezier_basis0 + lVar126 + 0x1214);
      fVar309 = *(float *)(bezier_basis0 + lVar126 + 0x1218);
      fVar201 = *(float *)(bezier_basis0 + lVar126 + 0x121c);
      fVar310 = *(float *)(bezier_basis0 + lVar126 + 0x1220);
      fVar202 = *(float *)(bezier_basis0 + lVar126 + 0x1224);
      fVar312 = *(float *)(bezier_basis0 + lVar126 + 0x1228);
      fVar234 = *(float *)(bezier_basis0 + lVar126 + 0x1694);
      fVar313 = *(float *)(bezier_basis0 + lVar126 + 0x1698);
      fVar326 = *(float *)(bezier_basis0 + lVar126 + 0x169c);
      fVar314 = *(float *)(bezier_basis0 + lVar126 + 0x16a0);
      fVar235 = *(float *)(bezier_basis0 + lVar126 + 0x16a4);
      fVar315 = *(float *)(bezier_basis0 + lVar126 + 0x16a8);
      fVar253 = *(float *)(bezier_basis0 + lVar126 + 0x16ac);
      fVar262 = *(float *)(bezier_basis0 + lVar126 + 0x1b18);
      fVar222 = *(float *)(bezier_basis0 + lVar126 + 0x1b1c);
      fVar169 = *(float *)(bezier_basis0 + lVar126 + 0x1b20);
      fVar270 = *(float *)(bezier_basis0 + lVar126 + 0x1b24);
      fVar273 = *(float *)(bezier_basis0 + lVar126 + 0x1b28);
      fVar224 = *(float *)(bezier_basis0 + lVar126 + 0x1b2c);
      fVar170 = *(float *)(bezier_basis0 + lVar126 + 0x1b30);
      fVar275 = *(float *)(bezier_basis0 + lVar126 + 0x1f9c);
      fVar281 = *(float *)(bezier_basis0 + lVar126 + 0x1fa0);
      fVar283 = *(float *)(bezier_basis0 + lVar126 + 0x1fa4);
      fVar285 = *(float *)(bezier_basis0 + lVar126 + 0x1fa8);
      fVar286 = *(float *)(bezier_basis0 + lVar126 + 0x1fac);
      fVar288 = *(float *)(bezier_basis0 + lVar126 + 0x1fb0);
      fVar290 = *(float *)(bezier_basis0 + lVar126 + 0x1fb4);
      fVar188 = *(float *)(bezier_basis1 + lVar126 + 0x4a0) + fVar255;
      fVar171 = *(float *)(bezier_basis0 + lVar126 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar126 + 0x1fb8);
      fVar292 = *(float *)(bezier_basis0 + lVar126 + 0x16b0) + fVar171;
      local_560 = fVar148 * fVar305 + fVar234 * fVar204 + fVar157 * fVar262 + fVar287 * fVar275;
      fStack_55c = fVar150 * fVar198 + fVar313 * fVar216 + fVar166 * fVar222 + fVar289 * fVar281;
      fStack_558 = fVar152 * fVar309 + fVar326 * fVar218 + fVar167 * fVar169 + fVar291 * fVar283;
      fStack_554 = fVar154 * fVar201 + fVar314 * fVar220 + fVar168 * fVar270 + fVar311 * fVar285;
      fStack_550 = fVar148 * fVar310 + fVar235 * fVar204 + fVar157 * fVar273 + fVar287 * fVar286;
      fStack_54c = fVar150 * fVar202 + fVar315 * fVar216 + fVar166 * fVar224 + fVar289 * fVar288;
      fStack_548 = fVar152 * fVar312 + fVar253 * fVar218 + fVar167 * fVar170 + fVar291 * fVar290;
      fStack_544 = *(float *)(bezier_basis0 + lVar126 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar126 + 0x1fb8) + fVar188;
      auVar322._0_4_ = fVar248 * fVar305 + fVar155 * fVar234 + fVar189 * fVar262 + fVar261 * fVar275
      ;
      auVar322._4_4_ =
           fVar250 * fVar198 + fStack_41c * fVar313 + fVar197 * fVar222 + fVar274 * fVar281;
      auVar322._8_4_ =
           fVar251 * fVar309 + fStack_418 * fVar326 + fVar199 * fVar169 + fVar301 * fVar283;
      auVar322._12_4_ =
           fVar252 * fVar201 + fStack_414 * fVar314 + fVar200 * fVar270 + fVar215 * fVar285;
      auVar322._16_4_ =
           fVar248 * fVar310 + fVar155 * fVar235 + fVar189 * fVar273 + fVar261 * fVar286;
      auVar322._20_4_ =
           fVar250 * fVar202 + fStack_41c * fVar315 + fVar197 * fVar224 + fVar274 * fVar288;
      auVar322._24_4_ =
           fVar251 * fVar312 + fStack_418 * fVar253 + fVar199 * fVar170 + fVar301 * fVar290;
      auVar322._28_4_ = fVar171 + fVar188 + *(float *)(bezier_basis1 + lVar126 + 0x4a0) + fVar236;
      auVar195._0_4_ = fVar327 * fVar234 + fVar333 * fVar262 + fVar282 * fVar275 + fVar238 * fVar305
      ;
      auVar195._4_4_ = fVar330 * fVar313 + fVar336 * fVar222 + fVar284 * fVar281 + fVar245 * fVar198
      ;
      auVar195._8_4_ = fVar331 * fVar326 + fVar337 * fVar169 + fVar302 * fVar283 + fVar254 * fVar309
      ;
      auVar195._12_4_ =
           fVar332 * fVar314 + fVar338 * fVar270 + fVar304 * fVar285 + fVar255 * fVar201;
      auVar195._16_4_ =
           fVar327 * fVar235 + fVar333 * fVar273 + fVar282 * fVar286 + fVar238 * fVar310;
      auVar195._20_4_ =
           fVar330 * fVar315 + fVar336 * fVar224 + fVar284 * fVar288 + fVar245 * fVar202;
      auVar195._24_4_ =
           fVar331 * fVar253 + fVar337 * fVar170 + fVar302 * fVar290 + fVar254 * fVar312;
      auVar195._28_4_ = fVar292 + *(float *)(bezier_basis0 + lVar126 + 0x122c);
      fVar305 = *(float *)(bezier_basis1 + lVar126 + 0x1b18);
      fVar198 = *(float *)(bezier_basis1 + lVar126 + 0x1b1c);
      fVar309 = *(float *)(bezier_basis1 + lVar126 + 0x1b20);
      fVar201 = *(float *)(bezier_basis1 + lVar126 + 0x1b24);
      fVar310 = *(float *)(bezier_basis1 + lVar126 + 0x1b28);
      fVar202 = *(float *)(bezier_basis1 + lVar126 + 0x1b2c);
      fVar312 = *(float *)(bezier_basis1 + lVar126 + 0x1b30);
      fVar234 = *(float *)(bezier_basis1 + lVar126 + 0x1f9c);
      fVar313 = *(float *)(bezier_basis1 + lVar126 + 0x1fa0);
      fVar326 = *(float *)(bezier_basis1 + lVar126 + 0x1fa4);
      fVar314 = *(float *)(bezier_basis1 + lVar126 + 0x1fa8);
      fVar235 = *(float *)(bezier_basis1 + lVar126 + 0x1fac);
      fVar315 = *(float *)(bezier_basis1 + lVar126 + 0x1fb0);
      fVar253 = *(float *)(bezier_basis1 + lVar126 + 0x1fb4);
      fVar262 = *(float *)(bezier_basis1 + lVar126 + 0x1694);
      fVar222 = *(float *)(bezier_basis1 + lVar126 + 0x1698);
      fVar169 = *(float *)(bezier_basis1 + lVar126 + 0x169c);
      fVar270 = *(float *)(bezier_basis1 + lVar126 + 0x16a0);
      fVar273 = *(float *)(bezier_basis1 + lVar126 + 0x16a4);
      fVar224 = *(float *)(bezier_basis1 + lVar126 + 0x16a8);
      fVar170 = *(float *)(bezier_basis1 + lVar126 + 0x16ac);
      fVar275 = *(float *)(bezier_basis1 + lVar126 + 0x1210);
      fVar281 = *(float *)(bezier_basis1 + lVar126 + 0x1214);
      fVar283 = *(float *)(bezier_basis1 + lVar126 + 0x1218);
      fVar285 = *(float *)(bezier_basis1 + lVar126 + 0x121c);
      fVar286 = *(float *)(bezier_basis1 + lVar126 + 0x1220);
      fVar288 = *(float *)(bezier_basis1 + lVar126 + 0x1224);
      fVar290 = *(float *)(bezier_basis1 + lVar126 + 0x1228);
      auVar265._0_4_ = fVar148 * fVar275 + fVar262 * fVar204 + fVar157 * fVar305 + fVar287 * fVar234
      ;
      auVar265._4_4_ = fVar150 * fVar281 + fVar222 * fVar216 + fVar166 * fVar198 + fVar289 * fVar313
      ;
      auVar265._8_4_ = fVar152 * fVar283 + fVar169 * fVar218 + fVar167 * fVar309 + fVar291 * fVar326
      ;
      auVar265._12_4_ =
           fVar154 * fVar285 + fVar270 * fVar220 + fVar168 * fVar201 + fVar311 * fVar314;
      auVar265._16_4_ =
           fVar148 * fVar286 + fVar273 * fVar204 + fVar157 * fVar310 + fVar287 * fVar235;
      auVar265._20_4_ =
           fVar150 * fVar288 + fVar224 * fVar216 + fVar166 * fVar202 + fVar289 * fVar315;
      auVar265._24_4_ =
           fVar152 * fVar290 + fVar170 * fVar218 + fVar167 * fVar312 + fVar291 * fVar253;
      auVar265._28_4_ = fVar200 + fVar200 + fVar292 + fVar311;
      auVar278._0_4_ = fVar248 * fVar275 + fVar155 * fVar262 + fVar189 * fVar305 + fVar261 * fVar234
      ;
      auVar278._4_4_ =
           fVar250 * fVar281 + fStack_41c * fVar222 + fVar197 * fVar198 + fVar274 * fVar313;
      auVar278._8_4_ =
           fVar251 * fVar283 + fStack_418 * fVar169 + fVar199 * fVar309 + fVar301 * fVar326;
      auVar278._12_4_ =
           fVar252 * fVar285 + fStack_414 * fVar270 + fVar200 * fVar201 + fVar215 * fVar314;
      auVar278._16_4_ =
           fVar248 * fVar286 + fVar155 * fVar273 + fVar189 * fVar310 + fVar261 * fVar235;
      auVar278._20_4_ =
           fVar250 * fVar288 + fStack_41c * fVar224 + fVar197 * fVar202 + fVar274 * fVar315;
      auVar278._24_4_ =
           fVar251 * fVar290 + fStack_418 * fVar170 + fVar199 * fVar312 + fVar301 * fVar253;
      auVar278._28_4_ = fVar200 + fVar200 + fVar200 + fVar292;
      auVar210._0_4_ = fVar238 * fVar275 + fVar327 * fVar262 + fVar333 * fVar305 + fVar282 * fVar234
      ;
      auVar210._4_4_ = fVar245 * fVar281 + fVar330 * fVar222 + fVar336 * fVar198 + fVar284 * fVar313
      ;
      auVar210._8_4_ = fVar254 * fVar283 + fVar331 * fVar169 + fVar337 * fVar309 + fVar302 * fVar326
      ;
      auVar210._12_4_ =
           fVar255 * fVar285 + fVar332 * fVar270 + fVar338 * fVar201 + fVar304 * fVar314;
      auVar210._16_4_ =
           fVar238 * fVar286 + fVar327 * fVar273 + fVar333 * fVar310 + fVar282 * fVar235;
      auVar210._20_4_ =
           fVar245 * fVar288 + fVar330 * fVar224 + fVar336 * fVar202 + fVar284 * fVar315;
      auVar210._24_4_ =
           fVar254 * fVar290 + fVar331 * fVar170 + fVar337 * fVar312 + fVar302 * fVar253;
      auVar210._28_4_ =
           *(float *)(bezier_basis1 + lVar126 + 0x122c) +
           *(float *)(bezier_basis1 + lVar126 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar126 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar126 + 0x1fb8);
      auVar182._8_4_ = 0x7fffffff;
      auVar182._0_8_ = 0x7fffffff7fffffff;
      auVar182._12_4_ = 0x7fffffff;
      auVar182._16_4_ = 0x7fffffff;
      auVar182._20_4_ = 0x7fffffff;
      auVar182._24_4_ = 0x7fffffff;
      auVar182._28_4_ = 0x7fffffff;
      auVar108._4_4_ = fStack_55c;
      auVar108._0_4_ = local_560;
      auVar108._8_4_ = fStack_558;
      auVar108._12_4_ = fStack_554;
      auVar108._16_4_ = fStack_550;
      auVar108._20_4_ = fStack_54c;
      auVar108._24_4_ = fStack_548;
      auVar108._28_4_ = fStack_544;
      auVar164 = vandps_avx(auVar108,auVar182);
      auVar19 = vandps_avx(auVar322,auVar182);
      auVar19 = vmaxps_avx(auVar164,auVar19);
      auVar164 = vandps_avx(auVar195,auVar182);
      auVar164 = vmaxps_avx(auVar19,auVar164);
      auVar339 = vpermilps_avx(auVar339,0);
      auVar259._16_16_ = auVar339;
      auVar259._0_16_ = auVar339;
      auVar164 = vcmpps_avx(auVar164,auVar259,1);
      auVar28 = vblendvps_avx(auVar108,auVar26,auVar164);
      auVar34 = vblendvps_avx(auVar322,auVar27,auVar164);
      auVar164 = vandps_avx(auVar265,auVar182);
      auVar19 = vandps_avx(auVar278,auVar182);
      auVar20 = vmaxps_avx(auVar164,auVar19);
      auVar164 = vandps_avx(auVar210,auVar182);
      auVar164 = vmaxps_avx(auVar20,auVar164);
      auVar20 = vcmpps_avx(auVar164,auVar259,1);
      auVar164 = vblendvps_avx(auVar265,auVar26,auVar20);
      auVar26 = vblendvps_avx(auVar278,auVar27,auVar20);
      fVar292 = auVar28._0_4_;
      fVar147 = auVar28._4_4_;
      fVar149 = auVar28._8_4_;
      fVar151 = auVar28._12_4_;
      fVar153 = auVar28._16_4_;
      fVar156 = auVar28._20_4_;
      fVar227 = auVar28._24_4_;
      fVar205 = auVar164._0_4_;
      fVar217 = auVar164._4_4_;
      fVar219 = auVar164._8_4_;
      fVar221 = auVar164._12_4_;
      fVar223 = auVar164._16_4_;
      fVar225 = auVar164._20_4_;
      fVar226 = auVar164._24_4_;
      fVar305 = auVar34._0_4_;
      fVar310 = auVar34._4_4_;
      fVar313 = auVar34._8_4_;
      fVar315 = auVar34._12_4_;
      fVar169 = auVar34._16_4_;
      fVar170 = auVar34._20_4_;
      fVar285 = auVar34._24_4_;
      auVar136._0_4_ = fVar305 * fVar305 + fVar292 * fVar292;
      auVar136._4_4_ = fVar310 * fVar310 + fVar147 * fVar147;
      auVar136._8_4_ = fVar313 * fVar313 + fVar149 * fVar149;
      auVar136._12_4_ = fVar315 * fVar315 + fVar151 * fVar151;
      auVar136._16_4_ = fVar169 * fVar169 + fVar153 * fVar153;
      auVar136._20_4_ = fVar170 * fVar170 + fVar156 * fVar156;
      auVar136._24_4_ = fVar285 * fVar285 + fVar227 * fVar227;
      auVar136._28_4_ = auVar278._28_4_ + auVar28._28_4_;
      auVar28 = vrsqrtps_avx(auVar136);
      fVar198 = auVar28._0_4_;
      fVar309 = auVar28._4_4_;
      auVar27._4_4_ = fVar309 * 1.5;
      auVar27._0_4_ = fVar198 * 1.5;
      fVar201 = auVar28._8_4_;
      auVar27._8_4_ = fVar201 * 1.5;
      fVar202 = auVar28._12_4_;
      auVar27._12_4_ = fVar202 * 1.5;
      fVar312 = auVar28._16_4_;
      auVar27._16_4_ = fVar312 * 1.5;
      fVar234 = auVar28._20_4_;
      auVar27._20_4_ = fVar234 * 1.5;
      fVar326 = auVar28._24_4_;
      auVar27._24_4_ = fVar326 * 1.5;
      auVar27._28_4_ = auVar19._28_4_;
      auVar29._4_4_ = fVar309 * fVar309 * fVar309 * auVar136._4_4_ * 0.5;
      auVar29._0_4_ = fVar198 * fVar198 * fVar198 * auVar136._0_4_ * 0.5;
      auVar29._8_4_ = fVar201 * fVar201 * fVar201 * auVar136._8_4_ * 0.5;
      auVar29._12_4_ = fVar202 * fVar202 * fVar202 * auVar136._12_4_ * 0.5;
      auVar29._16_4_ = fVar312 * fVar312 * fVar312 * auVar136._16_4_ * 0.5;
      auVar29._20_4_ = fVar234 * fVar234 * fVar234 * auVar136._20_4_ * 0.5;
      auVar29._24_4_ = fVar326 * fVar326 * fVar326 * auVar136._24_4_ * 0.5;
      auVar29._28_4_ = auVar136._28_4_;
      auVar28 = vsubps_avx(auVar27,auVar29);
      fVar198 = auVar28._0_4_;
      fVar202 = auVar28._4_4_;
      fVar326 = auVar28._8_4_;
      fVar253 = auVar28._12_4_;
      fVar270 = auVar28._16_4_;
      fVar275 = auVar28._20_4_;
      fVar286 = auVar28._24_4_;
      fVar171 = auVar34._28_4_;
      fVar309 = auVar26._0_4_;
      fVar312 = auVar26._4_4_;
      fVar314 = auVar26._8_4_;
      fVar262 = auVar26._12_4_;
      fVar273 = auVar26._16_4_;
      fVar281 = auVar26._20_4_;
      fVar288 = auVar26._24_4_;
      auVar137._0_4_ = fVar309 * fVar309 + fVar205 * fVar205;
      auVar137._4_4_ = fVar312 * fVar312 + fVar217 * fVar217;
      auVar137._8_4_ = fVar314 * fVar314 + fVar219 * fVar219;
      auVar137._12_4_ = fVar262 * fVar262 + fVar221 * fVar221;
      auVar137._16_4_ = fVar273 * fVar273 + fVar223 * fVar223;
      auVar137._20_4_ = fVar281 * fVar281 + fVar225 * fVar225;
      auVar137._24_4_ = fVar288 * fVar288 + fVar226 * fVar226;
      auVar137._28_4_ = auVar164._28_4_ + auVar28._28_4_;
      auVar164 = vrsqrtps_avx(auVar137);
      fVar201 = auVar164._0_4_;
      fVar234 = auVar164._4_4_;
      auVar30._4_4_ = fVar234 * 1.5;
      auVar30._0_4_ = fVar201 * 1.5;
      fVar235 = auVar164._8_4_;
      auVar30._8_4_ = fVar235 * 1.5;
      fVar222 = auVar164._12_4_;
      auVar30._12_4_ = fVar222 * 1.5;
      fVar224 = auVar164._16_4_;
      auVar30._16_4_ = fVar224 * 1.5;
      fVar283 = auVar164._20_4_;
      auVar30._20_4_ = fVar283 * 1.5;
      fVar290 = auVar164._24_4_;
      auVar30._24_4_ = fVar290 * 1.5;
      auVar30._28_4_ = auVar19._28_4_;
      fVar188 = auVar164._28_4_;
      auVar164._4_4_ = fVar234 * fVar234 * fVar234 * auVar137._4_4_ * 0.5;
      auVar164._0_4_ = fVar201 * fVar201 * fVar201 * auVar137._0_4_ * 0.5;
      auVar164._8_4_ = fVar235 * fVar235 * fVar235 * auVar137._8_4_ * 0.5;
      auVar164._12_4_ = fVar222 * fVar222 * fVar222 * auVar137._12_4_ * 0.5;
      auVar164._16_4_ = fVar224 * fVar224 * fVar224 * auVar137._16_4_ * 0.5;
      auVar164._20_4_ = fVar283 * fVar283 * fVar283 * auVar137._20_4_ * 0.5;
      auVar164._24_4_ = fVar290 * fVar290 * fVar290 * auVar137._24_4_ * 0.5;
      auVar164._28_4_ = auVar137._28_4_;
      auVar164 = vsubps_avx(auVar30,auVar164);
      fVar201 = auVar164._0_4_;
      fVar234 = auVar164._4_4_;
      fVar235 = auVar164._8_4_;
      fVar222 = auVar164._12_4_;
      fVar224 = auVar164._16_4_;
      fVar283 = auVar164._20_4_;
      fVar290 = auVar164._24_4_;
      fVar305 = (float)local_7a0._0_4_ * fVar305 * fVar198;
      fVar310 = (float)local_7a0._4_4_ * fVar310 * fVar202;
      auVar31._4_4_ = fVar310;
      auVar31._0_4_ = fVar305;
      fVar313 = fStack_798 * fVar313 * fVar326;
      auVar31._8_4_ = fVar313;
      fVar315 = fStack_794 * fVar315 * fVar253;
      auVar31._12_4_ = fVar315;
      fVar169 = fStack_790 * fVar169 * fVar270;
      auVar31._16_4_ = fVar169;
      fVar170 = fStack_78c * fVar170 * fVar275;
      auVar31._20_4_ = fVar170;
      fVar285 = fStack_788 * fVar285 * fVar286;
      auVar31._24_4_ = fVar285;
      auVar31._28_4_ = fVar171;
      local_600._4_4_ = auVar296._4_4_ + fVar310;
      local_600._0_4_ = auVar296._0_4_ + fVar305;
      fStack_5f8 = auVar296._8_4_ + fVar313;
      fStack_5f4 = auVar296._12_4_ + fVar315;
      fStack_5f0 = auVar296._16_4_ + fVar169;
      fStack_5ec = auVar296._20_4_ + fVar170;
      fStack_5e8 = auVar296._24_4_ + fVar285;
      fStack_5e4 = auVar296._28_4_ + fVar171;
      fVar305 = (float)local_7a0._0_4_ * fVar198 * -fVar292;
      fVar310 = (float)local_7a0._4_4_ * fVar202 * -fVar147;
      auVar33._4_4_ = fVar310;
      auVar33._0_4_ = fVar305;
      fVar313 = fStack_798 * fVar326 * -fVar149;
      auVar33._8_4_ = fVar313;
      fVar315 = fStack_794 * fVar253 * -fVar151;
      auVar33._12_4_ = fVar315;
      fVar169 = fStack_790 * fVar270 * -fVar153;
      auVar33._16_4_ = fVar169;
      fVar170 = fStack_78c * fVar275 * -fVar156;
      auVar33._20_4_ = fVar170;
      fVar285 = fStack_788 * fVar286 * -fVar227;
      auVar33._24_4_ = fVar285;
      auVar33._28_4_ = 0x3f000000;
      local_540._4_4_ = fVar310 + auVar321._4_4_;
      local_540._0_4_ = fVar305 + auVar321._0_4_;
      fStack_538 = fVar313 + auVar321._8_4_;
      fStack_534 = fVar315 + auVar321._12_4_;
      fStack_530 = fVar169 + auVar321._16_4_;
      fStack_52c = fVar170 + auVar321._20_4_;
      fStack_528 = fVar285 + auVar321._24_4_;
      fStack_524 = auVar321._28_4_ + 0.5;
      fVar305 = (float)local_7a0._0_4_ * fVar198 * 0.0;
      fVar198 = (float)local_7a0._4_4_ * fVar202 * 0.0;
      auVar32._4_4_ = fVar198;
      auVar32._0_4_ = fVar305;
      fVar310 = fStack_798 * fVar326 * 0.0;
      auVar32._8_4_ = fVar310;
      fVar202 = fStack_794 * fVar253 * 0.0;
      auVar32._12_4_ = fVar202;
      fVar313 = fStack_790 * fVar270 * 0.0;
      auVar32._16_4_ = fVar313;
      fVar326 = fStack_78c * fVar275 * 0.0;
      auVar32._20_4_ = fVar326;
      fVar315 = fStack_788 * fVar286 * 0.0;
      auVar32._24_4_ = fVar315;
      auVar32._28_4_ = auVar322._28_4_;
      auVar106._4_4_ = fStack_5dc;
      auVar106._0_4_ = local_5e0;
      auVar106._8_4_ = fStack_5d8;
      auVar106._12_4_ = fStack_5d4;
      auVar106._16_4_ = fStack_5d0;
      auVar106._20_4_ = fStack_5cc;
      auVar106._24_4_ = fStack_5c8;
      auVar106._28_4_ = fStack_5c4;
      auVar266._0_4_ = fVar305 + local_5e0;
      auVar266._4_4_ = fVar198 + fStack_5dc;
      auVar266._8_4_ = fVar310 + fStack_5d8;
      auVar266._12_4_ = fVar202 + fStack_5d4;
      auVar266._16_4_ = fVar313 + fStack_5d0;
      auVar266._20_4_ = fVar326 + fStack_5cc;
      auVar266._24_4_ = fVar315 + fStack_5c8;
      auVar266._28_4_ = auVar322._28_4_ + fStack_5c4;
      fVar305 = (float)local_6e0._0_4_ * fVar309 * fVar201;
      fVar198 = local_6e0._4_4_ * fVar312 * fVar234;
      auVar35._4_4_ = fVar198;
      auVar35._0_4_ = fVar305;
      fVar309 = local_6e0._8_4_ * fVar314 * fVar235;
      auVar35._8_4_ = fVar309;
      fVar310 = local_6e0._12_4_ * fVar262 * fVar222;
      auVar35._12_4_ = fVar310;
      fVar202 = local_6e0._16_4_ * fVar273 * fVar224;
      auVar35._16_4_ = fVar202;
      fVar312 = local_6e0._20_4_ * fVar281 * fVar283;
      auVar35._20_4_ = fVar312;
      fVar313 = local_6e0._24_4_ * fVar288 * fVar290;
      auVar35._24_4_ = fVar313;
      auVar35._28_4_ = auVar26._28_4_;
      auVar27 = vsubps_avx(auVar296,auVar31);
      auVar297._0_4_ = local_360._0_4_ + fVar305;
      auVar297._4_4_ = local_360._4_4_ + fVar198;
      auVar297._8_4_ = local_360._8_4_ + fVar309;
      auVar297._12_4_ = local_360._12_4_ + fVar310;
      auVar297._16_4_ = local_360._16_4_ + fVar202;
      auVar297._20_4_ = local_360._20_4_ + fVar312;
      auVar297._24_4_ = local_360._24_4_ + fVar313;
      auVar297._28_4_ = local_360._28_4_ + auVar26._28_4_;
      fVar305 = (float)local_6e0._0_4_ * -fVar205 * fVar201;
      fVar198 = local_6e0._4_4_ * -fVar217 * fVar234;
      auVar26._4_4_ = fVar198;
      auVar26._0_4_ = fVar305;
      fVar309 = local_6e0._8_4_ * -fVar219 * fVar235;
      auVar26._8_4_ = fVar309;
      fVar310 = local_6e0._12_4_ * -fVar221 * fVar222;
      auVar26._12_4_ = fVar310;
      fVar202 = local_6e0._16_4_ * -fVar223 * fVar224;
      auVar26._16_4_ = fVar202;
      fVar312 = local_6e0._20_4_ * -fVar225 * fVar283;
      auVar26._20_4_ = fVar312;
      fVar313 = local_6e0._24_4_ * -fVar226 * fVar290;
      auVar26._24_4_ = fVar313;
      auVar26._28_4_ = fVar171;
      auVar296 = vsubps_avx(auVar321,auVar33);
      auVar328._0_4_ = (float)local_480._0_4_ + fVar305;
      auVar328._4_4_ = (float)local_480._4_4_ + fVar198;
      auVar328._8_4_ = fStack_478 + fVar309;
      auVar328._12_4_ = fStack_474 + fVar310;
      auVar328._16_4_ = fStack_470 + fVar202;
      auVar328._20_4_ = fStack_46c + fVar312;
      auVar328._24_4_ = fStack_468 + fVar313;
      auVar328._28_4_ = register0x0000159c + fVar171;
      fVar305 = fVar201 * 0.0 * (float)local_6e0._0_4_;
      fVar198 = fVar234 * 0.0 * local_6e0._4_4_;
      auVar36._4_4_ = fVar198;
      auVar36._0_4_ = fVar305;
      fVar309 = fVar235 * 0.0 * local_6e0._8_4_;
      auVar36._8_4_ = fVar309;
      fVar201 = fVar222 * 0.0 * local_6e0._12_4_;
      auVar36._12_4_ = fVar201;
      fVar310 = fVar224 * 0.0 * local_6e0._16_4_;
      auVar36._16_4_ = fVar310;
      fVar202 = fVar283 * 0.0 * local_6e0._20_4_;
      auVar36._20_4_ = fVar202;
      fVar312 = fVar290 * 0.0 * local_6e0._24_4_;
      auVar36._24_4_ = fVar312;
      auVar36._28_4_ = fVar188;
      auVar20 = vsubps_avx(auVar106,auVar32);
      auVar110._4_4_ = fStack_43c;
      auVar110._0_4_ = local_440;
      auVar110._8_4_ = fStack_438;
      auVar110._12_4_ = fStack_434;
      auVar110._16_4_ = fStack_430;
      auVar110._20_4_ = fStack_42c;
      auVar110._24_4_ = fStack_428;
      auVar110._28_4_ = fStack_424;
      auVar334._0_4_ = local_440 + fVar305;
      auVar334._4_4_ = fStack_43c + fVar198;
      auVar334._8_4_ = fStack_438 + fVar309;
      auVar334._12_4_ = fStack_434 + fVar201;
      auVar334._16_4_ = fStack_430 + fVar310;
      auVar334._20_4_ = fStack_42c + fVar202;
      auVar334._24_4_ = fStack_428 + fVar312;
      auVar334._28_4_ = fStack_424 + fVar188;
      auVar164 = vsubps_avx(local_360,auVar35);
      auVar19 = vsubps_avx(_local_480,auVar26);
      auVar28 = vsubps_avx(auVar110,auVar36);
      auVar26 = vsubps_avx(auVar328,auVar296);
      auVar34 = vsubps_avx(auVar334,auVar20);
      auVar37._4_4_ = auVar20._4_4_ * auVar26._4_4_;
      auVar37._0_4_ = auVar20._0_4_ * auVar26._0_4_;
      auVar37._8_4_ = auVar20._8_4_ * auVar26._8_4_;
      auVar37._12_4_ = auVar20._12_4_ * auVar26._12_4_;
      auVar37._16_4_ = auVar20._16_4_ * auVar26._16_4_;
      auVar37._20_4_ = auVar20._20_4_ * auVar26._20_4_;
      auVar37._24_4_ = auVar20._24_4_ * auVar26._24_4_;
      auVar37._28_4_ = fVar188;
      auVar38._4_4_ = auVar296._4_4_ * auVar34._4_4_;
      auVar38._0_4_ = auVar296._0_4_ * auVar34._0_4_;
      auVar38._8_4_ = auVar296._8_4_ * auVar34._8_4_;
      auVar38._12_4_ = auVar296._12_4_ * auVar34._12_4_;
      auVar38._16_4_ = auVar296._16_4_ * auVar34._16_4_;
      auVar38._20_4_ = auVar296._20_4_ * auVar34._20_4_;
      auVar38._24_4_ = auVar296._24_4_ * auVar34._24_4_;
      auVar38._28_4_ = register0x0000159c;
      auVar231 = vsubps_avx(auVar38,auVar37);
      auVar39._4_4_ = auVar27._4_4_ * auVar34._4_4_;
      auVar39._0_4_ = auVar27._0_4_ * auVar34._0_4_;
      auVar39._8_4_ = auVar27._8_4_ * auVar34._8_4_;
      auVar39._12_4_ = auVar27._12_4_ * auVar34._12_4_;
      auVar39._16_4_ = auVar27._16_4_ * auVar34._16_4_;
      auVar39._20_4_ = auVar27._20_4_ * auVar34._20_4_;
      auVar39._24_4_ = auVar27._24_4_ * auVar34._24_4_;
      auVar39._28_4_ = auVar34._28_4_;
      auVar321 = vsubps_avx(auVar297,auVar27);
      auVar40._4_4_ = auVar20._4_4_ * auVar321._4_4_;
      auVar40._0_4_ = auVar20._0_4_ * auVar321._0_4_;
      auVar40._8_4_ = auVar20._8_4_ * auVar321._8_4_;
      auVar40._12_4_ = auVar20._12_4_ * auVar321._12_4_;
      auVar40._16_4_ = auVar20._16_4_ * auVar321._16_4_;
      auVar40._20_4_ = auVar20._20_4_ * auVar321._20_4_;
      auVar40._24_4_ = auVar20._24_4_ * auVar321._24_4_;
      auVar40._28_4_ = local_360._28_4_;
      auVar29 = vsubps_avx(auVar40,auVar39);
      auVar41._4_4_ = auVar296._4_4_ * auVar321._4_4_;
      auVar41._0_4_ = auVar296._0_4_ * auVar321._0_4_;
      auVar41._8_4_ = auVar296._8_4_ * auVar321._8_4_;
      auVar41._12_4_ = auVar296._12_4_ * auVar321._12_4_;
      auVar41._16_4_ = auVar296._16_4_ * auVar321._16_4_;
      auVar41._20_4_ = auVar296._20_4_ * auVar321._20_4_;
      auVar41._24_4_ = auVar296._24_4_ * auVar321._24_4_;
      auVar41._28_4_ = auVar34._28_4_;
      auVar42._4_4_ = auVar27._4_4_ * auVar26._4_4_;
      auVar42._0_4_ = auVar27._0_4_ * auVar26._0_4_;
      auVar42._8_4_ = auVar27._8_4_ * auVar26._8_4_;
      auVar42._12_4_ = auVar27._12_4_ * auVar26._12_4_;
      auVar42._16_4_ = auVar27._16_4_ * auVar26._16_4_;
      auVar42._20_4_ = auVar27._20_4_ * auVar26._20_4_;
      auVar42._24_4_ = auVar27._24_4_ * auVar26._24_4_;
      auVar42._28_4_ = auVar26._28_4_;
      auVar26 = vsubps_avx(auVar42,auVar41);
      auVar138._0_4_ = auVar231._0_4_ * 0.0 + auVar26._0_4_ + auVar29._0_4_ * 0.0;
      auVar138._4_4_ = auVar231._4_4_ * 0.0 + auVar26._4_4_ + auVar29._4_4_ * 0.0;
      auVar138._8_4_ = auVar231._8_4_ * 0.0 + auVar26._8_4_ + auVar29._8_4_ * 0.0;
      auVar138._12_4_ = auVar231._12_4_ * 0.0 + auVar26._12_4_ + auVar29._12_4_ * 0.0;
      auVar138._16_4_ = auVar231._16_4_ * 0.0 + auVar26._16_4_ + auVar29._16_4_ * 0.0;
      auVar138._20_4_ = auVar231._20_4_ * 0.0 + auVar26._20_4_ + auVar29._20_4_ * 0.0;
      auVar138._24_4_ = auVar231._24_4_ * 0.0 + auVar26._24_4_ + auVar29._24_4_ * 0.0;
      auVar138._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar29._28_4_;
      auVar231 = vcmpps_avx(auVar138,ZEXT832(0) << 0x20,2);
      local_500 = vblendvps_avx(auVar164,_local_600,auVar231);
      _local_520 = vblendvps_avx(auVar19,_local_540,auVar231);
      auVar164 = vblendvps_avx(auVar28,auVar266,auVar231);
      auVar19 = vblendvps_avx(auVar27,auVar297,auVar231);
      auVar28 = vblendvps_avx(auVar296,auVar328,auVar231);
      auVar26 = vblendvps_avx(auVar20,auVar334,auVar231);
      auVar27 = vblendvps_avx(auVar297,auVar27,auVar231);
      auVar34 = vblendvps_avx(auVar328,auVar296,auVar231);
      auVar339 = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
      auVar20 = vblendvps_avx(auVar334,auVar20,auVar231);
      auVar27 = vsubps_avx(auVar27,local_500);
      auVar34 = vsubps_avx(auVar34,_local_520);
      auVar20 = vsubps_avx(auVar20,auVar164);
      auVar321 = vsubps_avx(_local_520,auVar28);
      fVar305 = auVar34._0_4_;
      fVar156 = auVar164._0_4_;
      fVar202 = auVar34._4_4_;
      fVar227 = auVar164._4_4_;
      auVar43._4_4_ = fVar227 * fVar202;
      auVar43._0_4_ = fVar156 * fVar305;
      fVar314 = auVar34._8_4_;
      fVar205 = auVar164._8_4_;
      auVar43._8_4_ = fVar205 * fVar314;
      fVar222 = auVar34._12_4_;
      fVar217 = auVar164._12_4_;
      auVar43._12_4_ = fVar217 * fVar222;
      fVar170 = auVar34._16_4_;
      fVar219 = auVar164._16_4_;
      auVar43._16_4_ = fVar219 * fVar170;
      fVar286 = auVar34._20_4_;
      fVar221 = auVar164._20_4_;
      auVar43._20_4_ = fVar221 * fVar286;
      fVar292 = auVar34._24_4_;
      fVar223 = auVar164._24_4_;
      auVar43._24_4_ = fVar223 * fVar292;
      auVar43._28_4_ = local_3a0._28_4_;
      fVar198 = local_520._0_4_;
      fVar236 = auVar20._0_4_;
      fVar312 = local_520._4_4_;
      fVar238 = auVar20._4_4_;
      auVar44._4_4_ = fVar238 * fVar312;
      auVar44._0_4_ = fVar236 * fVar198;
      fVar235 = local_520._8_4_;
      fVar245 = auVar20._8_4_;
      auVar44._8_4_ = fVar245 * fVar235;
      fVar169 = local_520._12_4_;
      fVar248 = auVar20._12_4_;
      auVar44._12_4_ = fVar248 * fVar169;
      fVar275 = local_520._16_4_;
      fVar250 = auVar20._16_4_;
      auVar44._16_4_ = fVar250 * fVar275;
      fVar288 = local_520._20_4_;
      fVar251 = auVar20._20_4_;
      auVar44._20_4_ = fVar251 * fVar288;
      fVar147 = local_520._24_4_;
      fVar252 = auVar20._24_4_;
      uVar127 = auVar296._28_4_;
      auVar44._24_4_ = fVar252 * fVar147;
      auVar44._28_4_ = uVar127;
      auVar296 = vsubps_avx(auVar44,auVar43);
      fVar309 = local_500._0_4_;
      fVar234 = local_500._4_4_;
      auVar45._4_4_ = fVar238 * fVar234;
      auVar45._0_4_ = fVar236 * fVar309;
      fVar315 = local_500._8_4_;
      auVar45._8_4_ = fVar245 * fVar315;
      fVar270 = local_500._12_4_;
      auVar45._12_4_ = fVar248 * fVar270;
      fVar281 = local_500._16_4_;
      auVar45._16_4_ = fVar250 * fVar281;
      fVar290 = local_500._20_4_;
      auVar45._20_4_ = fVar251 * fVar290;
      fVar149 = local_500._24_4_;
      auVar45._24_4_ = fVar252 * fVar149;
      auVar45._28_4_ = uVar127;
      fVar201 = auVar27._0_4_;
      fVar313 = auVar27._4_4_;
      auVar46._4_4_ = fVar227 * fVar313;
      auVar46._0_4_ = fVar156 * fVar201;
      fVar253 = auVar27._8_4_;
      auVar46._8_4_ = fVar205 * fVar253;
      fVar273 = auVar27._12_4_;
      auVar46._12_4_ = fVar217 * fVar273;
      fVar283 = auVar27._16_4_;
      auVar46._16_4_ = fVar219 * fVar283;
      fVar171 = auVar27._20_4_;
      auVar46._20_4_ = fVar221 * fVar171;
      fVar151 = auVar27._24_4_;
      auVar46._24_4_ = fVar223 * fVar151;
      auVar46._28_4_ = auVar328._28_4_;
      auVar29 = vsubps_avx(auVar46,auVar45);
      auVar47._4_4_ = fVar312 * fVar313;
      auVar47._0_4_ = fVar198 * fVar201;
      auVar47._8_4_ = fVar235 * fVar253;
      auVar47._12_4_ = fVar169 * fVar273;
      auVar47._16_4_ = fVar275 * fVar283;
      auVar47._20_4_ = fVar288 * fVar171;
      auVar47._24_4_ = fVar147 * fVar151;
      auVar47._28_4_ = uVar127;
      auVar48._4_4_ = fVar234 * fVar202;
      auVar48._0_4_ = fVar309 * fVar305;
      auVar48._8_4_ = fVar315 * fVar314;
      auVar48._12_4_ = fVar270 * fVar222;
      auVar48._16_4_ = fVar281 * fVar170;
      auVar48._20_4_ = fVar290 * fVar286;
      auVar48._24_4_ = fVar149 * fVar292;
      auVar48._28_4_ = auVar334._28_4_;
      auVar30 = vsubps_avx(auVar48,auVar47);
      auVar31 = vsubps_avx(auVar164,auVar26);
      fVar310 = auVar30._28_4_ + auVar29._28_4_;
      auVar211._0_4_ = auVar30._0_4_ + auVar29._0_4_ * 0.0 + auVar296._0_4_ * 0.0;
      auVar211._4_4_ = auVar30._4_4_ + auVar29._4_4_ * 0.0 + auVar296._4_4_ * 0.0;
      auVar211._8_4_ = auVar30._8_4_ + auVar29._8_4_ * 0.0 + auVar296._8_4_ * 0.0;
      auVar211._12_4_ = auVar30._12_4_ + auVar29._12_4_ * 0.0 + auVar296._12_4_ * 0.0;
      auVar211._16_4_ = auVar30._16_4_ + auVar29._16_4_ * 0.0 + auVar296._16_4_ * 0.0;
      auVar211._20_4_ = auVar30._20_4_ + auVar29._20_4_ * 0.0 + auVar296._20_4_ * 0.0;
      auVar211._24_4_ = auVar30._24_4_ + auVar29._24_4_ * 0.0 + auVar296._24_4_ * 0.0;
      auVar211._28_4_ = fVar310 + 0.0;
      fVar225 = auVar321._0_4_;
      fVar226 = auVar321._4_4_;
      auVar49._4_4_ = fVar226 * auVar26._4_4_;
      auVar49._0_4_ = fVar225 * auVar26._0_4_;
      fVar148 = auVar321._8_4_;
      auVar49._8_4_ = fVar148 * auVar26._8_4_;
      fVar150 = auVar321._12_4_;
      auVar49._12_4_ = fVar150 * auVar26._12_4_;
      fVar152 = auVar321._16_4_;
      auVar49._16_4_ = fVar152 * auVar26._16_4_;
      fVar154 = auVar321._20_4_;
      auVar49._20_4_ = fVar154 * auVar26._20_4_;
      fVar155 = auVar321._24_4_;
      auVar49._24_4_ = fVar155 * auVar26._24_4_;
      auVar49._28_4_ = fVar310;
      fVar310 = auVar31._0_4_;
      fVar326 = auVar31._4_4_;
      auVar50._4_4_ = auVar28._4_4_ * fVar326;
      auVar50._0_4_ = auVar28._0_4_ * fVar310;
      fVar262 = auVar31._8_4_;
      auVar50._8_4_ = auVar28._8_4_ * fVar262;
      fVar224 = auVar31._12_4_;
      auVar50._12_4_ = auVar28._12_4_ * fVar224;
      fVar285 = auVar31._16_4_;
      auVar50._16_4_ = auVar28._16_4_ * fVar285;
      fVar188 = auVar31._20_4_;
      auVar50._20_4_ = auVar28._20_4_ * fVar188;
      fVar153 = auVar31._24_4_;
      auVar50._24_4_ = auVar28._24_4_ * fVar153;
      auVar50._28_4_ = auVar30._28_4_;
      auVar164 = vsubps_avx(auVar50,auVar49);
      auVar296 = vsubps_avx(local_500,auVar19);
      fVar254 = auVar296._0_4_;
      fVar255 = auVar296._4_4_;
      auVar51._4_4_ = fVar255 * auVar26._4_4_;
      auVar51._0_4_ = fVar254 * auVar26._0_4_;
      fVar282 = auVar296._8_4_;
      auVar51._8_4_ = fVar282 * auVar26._8_4_;
      fVar284 = auVar296._12_4_;
      auVar51._12_4_ = fVar284 * auVar26._12_4_;
      fVar287 = auVar296._16_4_;
      auVar51._16_4_ = fVar287 * auVar26._16_4_;
      fVar289 = auVar296._20_4_;
      auVar51._20_4_ = fVar289 * auVar26._20_4_;
      fVar291 = auVar296._24_4_;
      auVar51._24_4_ = fVar291 * auVar26._24_4_;
      auVar51._28_4_ = auVar26._28_4_;
      auVar52._4_4_ = auVar19._4_4_ * fVar326;
      auVar52._0_4_ = auVar19._0_4_ * fVar310;
      auVar52._8_4_ = auVar19._8_4_ * fVar262;
      auVar52._12_4_ = auVar19._12_4_ * fVar224;
      auVar52._16_4_ = auVar19._16_4_ * fVar285;
      auVar52._20_4_ = auVar19._20_4_ * fVar188;
      auVar52._24_4_ = auVar19._24_4_ * fVar153;
      auVar52._28_4_ = 0;
      auVar296 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = auVar28._4_4_ * fVar255;
      auVar53._0_4_ = auVar28._0_4_ * fVar254;
      auVar53._8_4_ = auVar28._8_4_ * fVar282;
      auVar53._12_4_ = auVar28._12_4_ * fVar284;
      auVar53._16_4_ = auVar28._16_4_ * fVar287;
      auVar53._20_4_ = auVar28._20_4_ * fVar289;
      auVar53._24_4_ = auVar28._24_4_ * fVar291;
      auVar53._28_4_ = auVar26._28_4_;
      auVar54._4_4_ = auVar19._4_4_ * fVar226;
      auVar54._0_4_ = auVar19._0_4_ * fVar225;
      auVar54._8_4_ = auVar19._8_4_ * fVar148;
      auVar54._12_4_ = auVar19._12_4_ * fVar150;
      auVar54._16_4_ = auVar19._16_4_ * fVar152;
      auVar54._20_4_ = auVar19._20_4_ * fVar154;
      auVar54._24_4_ = auVar19._24_4_ * fVar155;
      auVar54._28_4_ = auVar19._28_4_;
      auVar19 = vsubps_avx(auVar54,auVar53);
      auVar183._0_4_ = auVar164._0_4_ * 0.0 + auVar19._0_4_ + auVar296._0_4_ * 0.0;
      auVar183._4_4_ = auVar164._4_4_ * 0.0 + auVar19._4_4_ + auVar296._4_4_ * 0.0;
      auVar183._8_4_ = auVar164._8_4_ * 0.0 + auVar19._8_4_ + auVar296._8_4_ * 0.0;
      auVar183._12_4_ = auVar164._12_4_ * 0.0 + auVar19._12_4_ + auVar296._12_4_ * 0.0;
      auVar183._16_4_ = auVar164._16_4_ * 0.0 + auVar19._16_4_ + auVar296._16_4_ * 0.0;
      auVar183._20_4_ = auVar164._20_4_ * 0.0 + auVar19._20_4_ + auVar296._20_4_ * 0.0;
      auVar183._24_4_ = auVar164._24_4_ * 0.0 + auVar19._24_4_ + auVar296._24_4_ * 0.0;
      auVar183._28_4_ = auVar19._28_4_ + auVar19._28_4_ + auVar296._28_4_;
      auVar185 = ZEXT3264(auVar183);
      auVar164 = vmaxps_avx(auVar211,auVar183);
      auVar164 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,2);
      auVar180 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
      auVar339 = vpand_avx(auVar339,auVar180);
      auVar180 = vpmovsxwd_avx(auVar339);
      auVar209 = vpunpckhwd_avx(auVar339,auVar339);
      auVar139._16_16_ = auVar209;
      auVar139._0_16_ = auVar180;
      if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar139 >> 0x7f,0) == '\0') &&
            (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar209 >> 0x3f,0) == '\0') &&
          (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar209[0xf]
         ) {
LAB_00907c41:
        auVar165 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
        auVar146 = ZEXT3264(local_4c0);
        auVar268 = ZEXT3264(local_4e0);
      }
      else {
        auVar55._4_4_ = fVar326 * fVar202;
        auVar55._0_4_ = fVar310 * fVar305;
        auVar55._8_4_ = fVar262 * fVar314;
        auVar55._12_4_ = fVar224 * fVar222;
        auVar55._16_4_ = fVar285 * fVar170;
        auVar55._20_4_ = fVar188 * fVar286;
        auVar55._24_4_ = fVar153 * fVar292;
        auVar55._28_4_ = auVar209._12_4_;
        auVar317._0_4_ = fVar225 * fVar236;
        auVar317._4_4_ = fVar226 * fVar238;
        auVar317._8_4_ = fVar148 * fVar245;
        auVar317._12_4_ = fVar150 * fVar248;
        auVar317._16_4_ = fVar152 * fVar250;
        auVar317._20_4_ = fVar154 * fVar251;
        auVar317._24_4_ = fVar155 * fVar252;
        auVar317._28_4_ = 0;
        auVar19 = vsubps_avx(auVar317,auVar55);
        auVar56._4_4_ = fVar255 * fVar238;
        auVar56._0_4_ = fVar254 * fVar236;
        auVar56._8_4_ = fVar282 * fVar245;
        auVar56._12_4_ = fVar284 * fVar248;
        auVar56._16_4_ = fVar287 * fVar250;
        auVar56._20_4_ = fVar289 * fVar251;
        auVar56._24_4_ = fVar291 * fVar252;
        auVar56._28_4_ = auVar20._28_4_;
        auVar57._4_4_ = fVar326 * fVar313;
        auVar57._0_4_ = fVar310 * fVar201;
        auVar57._8_4_ = fVar262 * fVar253;
        auVar57._12_4_ = fVar224 * fVar273;
        auVar57._16_4_ = fVar285 * fVar283;
        auVar57._20_4_ = fVar188 * fVar171;
        auVar57._24_4_ = fVar153 * fVar151;
        auVar57._28_4_ = auVar31._28_4_;
        auVar28 = vsubps_avx(auVar57,auVar56);
        auVar58._4_4_ = fVar226 * fVar313;
        auVar58._0_4_ = fVar225 * fVar201;
        auVar58._8_4_ = fVar148 * fVar253;
        auVar58._12_4_ = fVar150 * fVar273;
        auVar58._16_4_ = fVar152 * fVar283;
        auVar58._20_4_ = fVar154 * fVar171;
        auVar58._24_4_ = fVar155 * fVar151;
        auVar58._28_4_ = auVar27._28_4_;
        auVar59._4_4_ = fVar255 * fVar202;
        auVar59._0_4_ = fVar254 * fVar305;
        auVar59._8_4_ = fVar282 * fVar314;
        auVar59._12_4_ = fVar284 * fVar222;
        auVar59._16_4_ = fVar287 * fVar170;
        auVar59._20_4_ = fVar289 * fVar286;
        auVar59._24_4_ = fVar291 * fVar292;
        auVar59._28_4_ = auVar34._28_4_;
        auVar26 = vsubps_avx(auVar59,auVar58);
        auVar260._0_4_ = auVar19._0_4_ * 0.0 + auVar26._0_4_ + auVar28._0_4_ * 0.0;
        auVar260._4_4_ = auVar19._4_4_ * 0.0 + auVar26._4_4_ + auVar28._4_4_ * 0.0;
        auVar260._8_4_ = auVar19._8_4_ * 0.0 + auVar26._8_4_ + auVar28._8_4_ * 0.0;
        auVar260._12_4_ = auVar19._12_4_ * 0.0 + auVar26._12_4_ + auVar28._12_4_ * 0.0;
        auVar260._16_4_ = auVar19._16_4_ * 0.0 + auVar26._16_4_ + auVar28._16_4_ * 0.0;
        auVar260._20_4_ = auVar19._20_4_ * 0.0 + auVar26._20_4_ + auVar28._20_4_ * 0.0;
        auVar260._24_4_ = auVar19._24_4_ * 0.0 + auVar26._24_4_ + auVar28._24_4_ * 0.0;
        auVar260._28_4_ = auVar34._28_4_ + auVar26._28_4_ + auVar27._28_4_;
        auVar164 = vrcpps_avx(auVar260);
        fVar201 = auVar164._0_4_;
        fVar310 = auVar164._4_4_;
        auVar60._4_4_ = auVar260._4_4_ * fVar310;
        auVar60._0_4_ = auVar260._0_4_ * fVar201;
        fVar202 = auVar164._8_4_;
        auVar60._8_4_ = auVar260._8_4_ * fVar202;
        fVar313 = auVar164._12_4_;
        auVar60._12_4_ = auVar260._12_4_ * fVar313;
        fVar326 = auVar164._16_4_;
        auVar60._16_4_ = auVar260._16_4_ * fVar326;
        fVar314 = auVar164._20_4_;
        auVar60._20_4_ = auVar260._20_4_ * fVar314;
        fVar253 = auVar164._24_4_;
        auVar60._24_4_ = auVar260._24_4_ * fVar253;
        auVar60._28_4_ = auVar31._28_4_;
        auVar318._8_4_ = 0x3f800000;
        auVar318._0_8_ = 0x3f8000003f800000;
        auVar318._12_4_ = 0x3f800000;
        auVar318._16_4_ = 0x3f800000;
        auVar318._20_4_ = 0x3f800000;
        auVar318._24_4_ = 0x3f800000;
        auVar318._28_4_ = 0x3f800000;
        auVar164 = vsubps_avx(auVar318,auVar60);
        fVar201 = auVar164._0_4_ * fVar201 + fVar201;
        fVar310 = auVar164._4_4_ * fVar310 + fVar310;
        fVar202 = auVar164._8_4_ * fVar202 + fVar202;
        fVar313 = auVar164._12_4_ * fVar313 + fVar313;
        fVar326 = auVar164._16_4_ * fVar326 + fVar326;
        fVar314 = auVar164._20_4_ * fVar314 + fVar314;
        fVar253 = auVar164._24_4_ * fVar253 + fVar253;
        auVar161._0_4_ =
             (auVar19._0_4_ * fVar309 + auVar28._0_4_ * fVar198 + auVar26._0_4_ * fVar156) * fVar201
        ;
        auVar161._4_4_ =
             (auVar19._4_4_ * fVar234 + auVar28._4_4_ * fVar312 + auVar26._4_4_ * fVar227) * fVar310
        ;
        auVar161._8_4_ =
             (auVar19._8_4_ * fVar315 + auVar28._8_4_ * fVar235 + auVar26._8_4_ * fVar205) * fVar202
        ;
        auVar161._12_4_ =
             (auVar19._12_4_ * fVar270 + auVar28._12_4_ * fVar169 + auVar26._12_4_ * fVar217) *
             fVar313;
        auVar161._16_4_ =
             (auVar19._16_4_ * fVar281 + auVar28._16_4_ * fVar275 + auVar26._16_4_ * fVar219) *
             fVar326;
        auVar161._20_4_ =
             (auVar19._20_4_ * fVar290 + auVar28._20_4_ * fVar288 + auVar26._20_4_ * fVar221) *
             fVar314;
        auVar161._24_4_ =
             (auVar19._24_4_ * fVar149 + auVar28._24_4_ * fVar147 + auVar26._24_4_ * fVar223) *
             fVar253;
        auVar161._28_4_ = 0;
        auVar140._16_16_ = auVar16;
        auVar140._0_16_ = auVar16;
        auVar164 = vcmpps_avx(auVar140,auVar161,2);
        fVar305 = ray->tfar;
        auVar212._4_4_ = fVar305;
        auVar212._0_4_ = fVar305;
        auVar212._8_4_ = fVar305;
        auVar212._12_4_ = fVar305;
        auVar212._16_4_ = fVar305;
        auVar212._20_4_ = fVar305;
        auVar212._24_4_ = fVar305;
        auVar212._28_4_ = fVar305;
        auVar19 = vcmpps_avx(auVar161,auVar212,2);
        auVar164 = vandps_avx(auVar19,auVar164);
        auVar180 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
        auVar339 = vpand_avx(auVar339,auVar180);
        auVar180 = vpmovsxwd_avx(auVar339);
        auVar209 = vpshufd_avx(auVar339,0xee);
        auVar209 = vpmovsxwd_avx(auVar209);
        auVar141._16_16_ = auVar209;
        auVar141._0_16_ = auVar180;
        if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar141 >> 0x7f,0) == '\0') &&
              (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar209 >> 0x3f,0) == '\0') &&
            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar209[0xf]) goto LAB_00907c41;
        auVar164 = vcmpps_avx(ZEXT832(0) << 0x20,auVar260,4);
        auVar180 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
        auVar339 = vpand_avx(auVar339,auVar180);
        auVar180 = vpmovsxwd_avx(auVar339);
        auVar339 = vpunpckhwd_avx(auVar339,auVar339);
        auVar232._16_16_ = auVar339;
        auVar232._0_16_ = auVar180;
        auVar165 = ZEXT3264(CONCAT824(uStack_488,
                                      CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
        auVar146 = ZEXT3264(local_4c0);
        auVar268 = ZEXT3264(local_4e0);
        if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar232 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar232 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar232 >> 0x7f,0) != '\0') ||
              (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar339 >> 0x3f,0) != '\0') ||
            (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar339[0xf] < '\0') {
          auVar142._0_4_ = auVar211._0_4_ * fVar201;
          auVar142._4_4_ = auVar211._4_4_ * fVar310;
          auVar142._8_4_ = auVar211._8_4_ * fVar202;
          auVar142._12_4_ = auVar211._12_4_ * fVar313;
          auVar142._16_4_ = auVar211._16_4_ * fVar326;
          auVar142._20_4_ = auVar211._20_4_ * fVar314;
          auVar142._24_4_ = auVar211._24_4_ * fVar253;
          auVar142._28_4_ = 0;
          auVar61._4_4_ = auVar183._4_4_ * fVar310;
          auVar61._0_4_ = auVar183._0_4_ * fVar201;
          auVar61._8_4_ = auVar183._8_4_ * fVar202;
          auVar61._12_4_ = auVar183._12_4_ * fVar313;
          auVar61._16_4_ = auVar183._16_4_ * fVar326;
          auVar61._20_4_ = auVar183._20_4_ * fVar314;
          auVar61._24_4_ = auVar183._24_4_ * fVar253;
          auVar61._28_4_ = auVar183._28_4_;
          auVar185 = ZEXT3264(auVar61);
          auVar241._8_4_ = 0x3f800000;
          auVar241._0_8_ = 0x3f8000003f800000;
          auVar241._12_4_ = 0x3f800000;
          auVar241._16_4_ = 0x3f800000;
          auVar241._20_4_ = 0x3f800000;
          auVar241._24_4_ = 0x3f800000;
          auVar241._28_4_ = 0x3f800000;
          auVar164 = vsubps_avx(auVar241,auVar142);
          auVar164 = vblendvps_avx(auVar164,auVar142,auVar231);
          auVar146 = ZEXT3264(auVar164);
          auVar164 = vsubps_avx(auVar241,auVar61);
          _local_3c0 = vblendvps_avx(auVar164,auVar61,auVar231);
          auVar165 = ZEXT3264(auVar232);
          auVar268 = ZEXT3264(auVar161);
        }
      }
      auVar329 = ZEXT3264(_local_6c0);
      local_4c0 = auVar146._0_32_;
      local_4e0 = auVar268._0_32_;
      auVar164 = auVar165._0_32_;
      if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar164 >> 0x7f,0) == '\0') &&
            (auVar165 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar164 >> 0xbf,0) == '\0') &&
          (auVar165 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar165[0x1f]) {
        bVar128 = 0;
        _local_690 = auVar21;
        _local_5b0 = auVar22;
        _local_5a0 = auVar17;
      }
      else {
        auVar19 = vsubps_avx(local_6e0,_local_7a0);
        fVar198 = (float)local_7a0._0_4_ + auVar19._0_4_ * auVar146._0_4_;
        fVar309 = (float)local_7a0._4_4_ + auVar19._4_4_ * auVar146._4_4_;
        fVar201 = fStack_798 + auVar19._8_4_ * auVar146._8_4_;
        fVar310 = fStack_794 + auVar19._12_4_ * auVar146._12_4_;
        fVar202 = fStack_790 + auVar19._16_4_ * auVar146._16_4_;
        fVar312 = fStack_78c + auVar19._20_4_ * auVar146._20_4_;
        fVar234 = fStack_788 + auVar19._24_4_ * auVar146._24_4_;
        fVar313 = auVar19._28_4_ + 0.0;
        fVar305 = local_718->depth_scale;
        auVar62._4_4_ = (fVar309 + fVar309) * fVar305;
        auVar62._0_4_ = (fVar198 + fVar198) * fVar305;
        auVar62._8_4_ = (fVar201 + fVar201) * fVar305;
        auVar62._12_4_ = (fVar310 + fVar310) * fVar305;
        auVar62._16_4_ = (fVar202 + fVar202) * fVar305;
        auVar62._20_4_ = (fVar312 + fVar312) * fVar305;
        auVar62._24_4_ = (fVar234 + fVar234) * fVar305;
        auVar62._28_4_ = fVar313 + fVar313;
        auVar19 = vcmpps_avx(local_4e0,auVar62,6);
        auVar28 = auVar164 & auVar19;
        if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0x7f,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar28 >> 0xbf,0) == '\0') &&
            (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar28[0x1f]) {
          bVar128 = 0;
          _local_690 = auVar21;
          _local_5b0 = auVar22;
          _local_5a0 = auVar17;
        }
        else {
          local_1e0 = vandps_avx(auVar19,auVar164);
          local_280._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
          local_280._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
          fStack_278 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
          fStack_274 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
          fStack_270 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
          fStack_26c = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
          fStack_268 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
          fStack_264 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
          local_2a0 = local_4c0;
          local_260 = local_4e0;
          local_240 = 0;
          local_23c = uVar122;
          local_230 = local_690;
          uStack_228 = uStack_688;
          local_220 = local_5a0;
          uStack_218 = uStack_598;
          local_210 = local_5b0;
          uStack_208 = uStack_5a8;
          auVar185 = ZEXT1664(_local_590);
          local_200 = _local_590;
          local_3c0._4_4_ = local_280._4_4_;
          local_3c0._0_4_ = local_280._0_4_;
          uStack_3b8._0_4_ = fStack_278;
          uStack_3b8._4_4_ = fStack_274;
          uStack_3b0._0_4_ = fStack_270;
          uStack_3b0._4_4_ = fStack_26c;
          auVar160 = _local_3c0;
          uStack_3a8._0_4_ = fStack_268;
          uStack_3a8._4_4_ = fStack_264;
          auVar164 = _local_3c0;
          auVar19 = local_4e0;
          auVar28 = local_4c0;
          _local_690 = auVar21;
          _local_5b0 = auVar22;
          _local_5a0 = auVar17;
          if ((pGVar12->mask & ray->mask) != 0) {
            if ((local_7d8->args->filter == (RTCFilterFunctionN)0x0) &&
               (bVar128 = 1, pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0))
            goto LAB_00906e7c;
            auVar177._0_4_ = 1.0 / auVar230._0_4_;
            auVar177._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar339 = vshufps_avx(auVar177,auVar177,0);
            auVar185 = ZEXT3264(CONCAT1616(auVar339,auVar339));
            local_1c0[0] = auVar339._0_4_ * (auVar146._0_4_ + 0.0);
            local_1c0[1] = auVar339._4_4_ * (auVar146._4_4_ + 1.0);
            local_1c0[2] = auVar339._8_4_ * (auVar146._8_4_ + 2.0);
            local_1c0[3] = auVar339._12_4_ * (auVar146._12_4_ + 3.0);
            fStack_1b0 = auVar339._0_4_ * (auVar146._16_4_ + 4.0);
            fStack_1ac = auVar339._4_4_ * (auVar146._20_4_ + 5.0);
            fStack_1a8 = auVar339._8_4_ * (auVar146._24_4_ + 6.0);
            fStack_1a4 = auVar146._28_4_ + 7.0;
            uStack_3b0 = auVar160._16_8_;
            uStack_3a8 = auVar164._24_8_;
            local_1a0 = local_3c0;
            uStack_198 = uStack_3b8;
            uStack_190 = uStack_3b0;
            uStack_188 = uStack_3a8;
            local_180 = local_4e0;
            uVar127 = vmovmskps_avx(local_1e0);
            uVar119 = CONCAT44((int)((ulong)local_7d8->args >> 0x20),uVar127);
            uVar121 = 0;
            if (uVar119 != 0) {
              for (; (uVar119 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
              }
            }
            _local_3c0 = auVar164;
            _local_380 = auVar18;
            while( true ) {
              auVar19 = auVar268._0_32_;
              auVar28 = auVar146._0_32_;
              auVar16 = local_620._0_16_;
              if (uVar119 == 0) break;
              local_7a0 = (undefined1  [8])uVar119;
              local_674 = local_1c0[uVar121];
              local_670 = *(undefined4 *)((long)&local_1a0 + uVar121 * 4);
              local_6e0._0_4_ = ray->tfar;
              ray->tfar = *(float *)(local_180 + uVar121 * 4);
              local_710.context = local_7d8->user;
              fVar269 = 1.0 - local_674;
              fVar261 = local_674 * fVar269 + local_674 * fVar269;
              auVar339 = ZEXT416((uint)(local_674 * local_674 * 3.0));
              auVar339 = vshufps_avx(auVar339,auVar339,0);
              auVar180 = ZEXT416((uint)((fVar261 - local_674 * local_674) * 3.0));
              auVar180 = vshufps_avx(auVar180,auVar180,0);
              auVar209 = ZEXT416((uint)((fVar269 * fVar269 - fVar261) * 3.0));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar194 = ZEXT416((uint)(fVar269 * fVar269 * -3.0));
              auVar194 = vshufps_avx(auVar194,auVar194,0);
              auVar178._0_4_ =
                   auVar194._0_4_ * (float)local_690._0_4_ +
                   auVar209._0_4_ * (float)local_5a0._0_4_ +
                   auVar339._0_4_ * (float)local_590._0_4_ + auVar180._0_4_ * (float)local_5b0._0_4_
              ;
              auVar178._4_4_ =
                   auVar194._4_4_ * (float)local_690._4_4_ +
                   auVar209._4_4_ * (float)local_5a0._4_4_ +
                   auVar339._4_4_ * (float)local_590._4_4_ + auVar180._4_4_ * (float)local_5b0._4_4_
              ;
              auVar178._8_4_ =
                   auVar194._8_4_ * (float)uStack_688 +
                   auVar209._8_4_ * (float)uStack_598 +
                   auVar339._8_4_ * fStack_588 + auVar180._8_4_ * (float)uStack_5a8;
              auVar178._12_4_ =
                   auVar194._12_4_ * uStack_688._4_4_ +
                   auVar209._12_4_ * uStack_598._4_4_ +
                   auVar339._12_4_ * fStack_584 + auVar180._12_4_ * uStack_5a8._4_4_;
              auVar185 = ZEXT1664(auVar178);
              local_680 = vmovlps_avx(auVar178);
              local_678 = vextractps_avx(auVar178,2);
              local_66c = (int)local_648;
              local_668 = (int)local_720;
              local_664 = (local_710.context)->instID[0];
              local_660 = (local_710.context)->instPrimID[0];
              local_7dc = -1;
              local_710.valid = &local_7dc;
              local_710.geometryUserPtr = pGVar12->userPtr;
              local_710.ray = (RTCRayN *)ray;
              local_710.hit = (RTCHitN *)&local_680;
              local_710.N = 1;
              if (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00906db4:
                p_Var15 = local_7d8->args->filter;
                if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                   (((local_7d8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  auVar185 = ZEXT1664(auVar185._0_16_);
                  (*p_Var15)(&local_710);
                  if (*local_710.valid == 0) goto LAB_00906df7;
                }
                bVar128 = 1;
                auVar329 = ZEXT3264(_local_6c0);
                fVar261 = (float)local_740._0_4_;
                fVar274 = (float)local_740._4_4_;
                fVar301 = fStack_738;
                fVar215 = fStack_734;
                fVar269 = fStack_730;
                fVar272 = fStack_72c;
                fVar293 = fStack_728;
                fVar300 = fStack_724;
                fVar157 = (float)local_7c0._0_4_;
                fVar166 = (float)local_7c0._4_4_;
                fVar167 = fStack_7b8;
                fVar168 = fStack_7b4;
                fVar303 = fStack_7b0;
                fVar203 = fStack_7ac;
                fVar186 = fStack_7a8;
                fVar204 = (float)local_780._0_4_;
                fVar216 = (float)local_780._4_4_;
                fVar218 = fStack_778;
                fVar220 = fStack_774;
                fVar187 = fStack_770;
                fVar237 = fStack_76c;
                fVar244 = fStack_768;
                fVar189 = (float)local_760._0_4_;
                fVar197 = (float)local_760._4_4_;
                fVar199 = fStack_758;
                fVar200 = fStack_754;
                fVar246 = fStack_750;
                fVar249 = fStack_74c;
                fVar247 = fStack_748;
                auVar16 = local_620._0_16_;
                goto LAB_00906e7c;
              }
              auVar185 = ZEXT1664(auVar178);
              (*pGVar12->occlusionFilterN)(&local_710);
              if (*local_710.valid != 0) goto LAB_00906db4;
LAB_00906df7:
              ray->tfar = (float)local_6e0._0_4_;
              uVar119 = (ulong)local_7a0 ^ 1L << (uVar121 & 0x3f);
              uVar121 = 0;
              if (uVar119 != 0) {
                for (; (uVar119 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                }
              }
              auVar146 = ZEXT3264(local_4c0);
              auVar268 = ZEXT3264(local_4e0);
              auVar329 = ZEXT3264(_local_6c0);
              fVar261 = (float)local_740._0_4_;
              fVar274 = (float)local_740._4_4_;
              fVar301 = fStack_738;
              fVar215 = fStack_734;
              fVar269 = fStack_730;
              fVar272 = fStack_72c;
              fVar293 = fStack_728;
              fVar300 = fStack_724;
              fVar204 = (float)local_780._0_4_;
              fVar216 = (float)local_780._4_4_;
              fVar218 = fStack_778;
              fVar220 = fStack_774;
              fVar187 = fStack_770;
              fVar237 = fStack_76c;
              fVar244 = fStack_768;
              fVar189 = (float)local_760._0_4_;
              fVar197 = (float)local_760._4_4_;
              fVar199 = fStack_758;
              fVar200 = fStack_754;
              fVar246 = fStack_750;
              fVar249 = fStack_74c;
              fVar247 = fStack_748;
            }
          }
          local_620._0_16_ = auVar16;
          local_4c0 = auVar28;
          local_4e0 = auVar19;
          bVar128 = 0;
          fVar157 = (float)local_7c0._0_4_;
          fVar166 = (float)local_7c0._4_4_;
          fVar167 = fStack_7b8;
          fVar168 = fStack_7b4;
          fVar303 = fStack_7b0;
          fVar203 = fStack_7ac;
          fVar186 = fStack_7a8;
          auVar16 = local_620._0_16_;
        }
      }
LAB_00906e7c:
      local_620._0_16_ = auVar16;
      auVar339 = local_640._0_16_;
    }
    auVar165 = ZEXT1664(auVar339);
    if (8 < (int)uVar122) {
      _local_380 = vpshufd_avx(ZEXT416(uVar122),0);
      auVar339 = vshufps_avx(auVar339,auVar339,0);
      local_3a0._16_16_ = auVar339;
      local_3a0._0_16_ = auVar339;
      local_e0 = local_620._0_8_;
      uStack_d8 = local_620._8_8_;
      uStack_d0 = local_620._0_8_;
      uStack_c8 = local_620._8_8_;
      auVar135._0_4_ = 1.0 / local_420;
      auVar135._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar339 = vshufps_avx(auVar135,auVar135,0);
      register0x00001210 = auVar339;
      _local_100 = auVar339;
      auVar146 = ZEXT3264(_local_100);
      for (lVar125 = 8; lVar125 < local_7d0; lVar125 = lVar125 + 8) {
        pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar125 * 4 + lVar126);
        fVar305 = *(float *)*pauVar9;
        fVar198 = *(float *)(*pauVar9 + 4);
        fVar309 = *(float *)(*pauVar9 + 8);
        fVar201 = *(float *)(*pauVar9 + 0xc);
        fVar310 = *(float *)(*pauVar9 + 0x10);
        fVar202 = *(float *)(*pauVar9 + 0x14);
        fVar312 = *(float *)(*pauVar9 + 0x18);
        auVar116 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar126 + 0x21fb768 + lVar125 * 4);
        fVar234 = *(float *)*pauVar9;
        fVar313 = *(float *)(*pauVar9 + 4);
        fVar326 = *(float *)(*pauVar9 + 8);
        fVar314 = *(float *)(*pauVar9 + 0xc);
        fVar235 = *(float *)(*pauVar9 + 0x10);
        fVar315 = *(float *)(*pauVar9 + 0x14);
        fVar253 = *(float *)(*pauVar9 + 0x18);
        auVar115 = *pauVar9;
        pfVar1 = (float *)(lVar126 + 0x21fbbec + lVar125 * 4);
        fVar262 = *pfVar1;
        fVar222 = pfVar1[1];
        fVar169 = pfVar1[2];
        fVar270 = pfVar1[3];
        fVar273 = pfVar1[4];
        fVar224 = pfVar1[5];
        fVar170 = pfVar1[6];
        pauVar9 = (undefined1 (*) [28])(lVar126 + 0x21fc070 + lVar125 * 4);
        fVar275 = *(float *)*pauVar9;
        fVar281 = *(float *)(*pauVar9 + 4);
        fVar283 = *(float *)(*pauVar9 + 8);
        fVar285 = *(float *)(*pauVar9 + 0xc);
        fVar286 = *(float *)(*pauVar9 + 0x10);
        fVar288 = *(float *)(*pauVar9 + 0x14);
        fVar290 = *(float *)(*pauVar9 + 0x18);
        auVar114 = *pauVar9;
        fVar171 = *(float *)pauVar9[1];
        fVar188 = fVar171 + auVar185._28_4_;
        fStack_784 = fVar171 + fVar171 + auVar146._28_4_;
        fVar205 = auVar329._0_4_;
        fVar217 = auVar329._4_4_;
        fVar219 = auVar329._8_4_;
        fVar221 = auVar329._12_4_;
        fVar223 = auVar329._16_4_;
        fVar225 = auVar329._20_4_;
        fVar226 = auVar329._24_4_;
        local_640._0_4_ =
             fVar205 * fVar305 +
             fVar204 * fVar234 + fVar262 * fVar157 + (float)local_400._0_4_ * fVar275;
        local_640._4_4_ =
             fVar217 * fVar198 +
             fVar216 * fVar313 + fVar222 * fVar166 + (float)local_400._4_4_ * fVar281;
        local_640._8_4_ =
             fVar219 * fVar309 + fVar218 * fVar326 + fVar169 * fVar167 + fStack_3f8 * fVar283;
        local_640._12_4_ =
             fVar221 * fVar201 + fVar220 * fVar314 + fVar270 * fVar168 + fStack_3f4 * fVar285;
        local_640._16_4_ =
             fVar223 * fVar310 + fVar187 * fVar235 + fVar273 * fVar303 + fStack_3f0 * fVar286;
        local_640._20_4_ =
             fVar225 * fVar202 + fVar237 * fVar315 + fVar224 * fVar203 + fStack_3ec * fVar288;
        local_640._24_4_ =
             fVar226 * fVar312 + fVar244 * fVar253 + fVar170 * fVar186 + fStack_3e8 * fVar290;
        local_640._28_4_ = fVar188 + fStack_784;
        auVar184._0_4_ =
             fVar234 * (float)local_320._0_4_ + fVar189 * fVar262 + fVar261 * fVar275 +
             (float)local_340._0_4_ * fVar305;
        auVar184._4_4_ =
             fVar313 * (float)local_320._4_4_ + fVar197 * fVar222 + fVar274 * fVar281 +
             (float)local_340._4_4_ * fVar198;
        auVar184._8_4_ =
             fVar326 * fStack_318 + fVar199 * fVar169 + fVar301 * fVar283 + fStack_338 * fVar309;
        auVar184._12_4_ =
             fVar314 * fStack_314 + fVar200 * fVar270 + fVar215 * fVar285 + fStack_334 * fVar201;
        auVar184._16_4_ =
             fVar235 * fStack_310 + fVar246 * fVar273 + fVar269 * fVar286 + fStack_330 * fVar310;
        auVar184._20_4_ =
             fVar315 * fStack_30c + fVar249 * fVar224 + fVar272 * fVar288 + fStack_32c * fVar202;
        auVar184._24_4_ =
             fVar253 * fStack_308 + fVar247 * fVar170 + fVar293 * fVar290 + fStack_328 * fVar312;
        auVar184._28_4_ = fVar171 + fVar171 + auVar165._28_4_ + fStack_784;
        auVar185 = ZEXT3264(auVar184);
        local_7a0._0_4_ =
             (float)local_c0._0_4_ * fVar305 +
             fVar234 * (float)local_120._0_4_ +
             (float)local_80._0_4_ * fVar262 + (float)local_a0._0_4_ * fVar275;
        local_7a0._4_4_ =
             (float)local_c0._4_4_ * fVar198 +
             fVar313 * (float)local_120._4_4_ +
             (float)local_80._4_4_ * fVar222 + (float)local_a0._4_4_ * fVar281;
        fStack_798 = fStack_b8 * fVar309 +
                     fVar326 * fStack_118 + fStack_78 * fVar169 + fStack_98 * fVar283;
        fStack_794 = fStack_b4 * fVar201 +
                     fVar314 * fStack_114 + fStack_74 * fVar270 + fStack_94 * fVar285;
        fStack_790 = fStack_b0 * fVar310 +
                     fVar235 * fStack_110 + fStack_70 * fVar273 + fStack_90 * fVar286;
        fStack_78c = fStack_ac * fVar202 +
                     fVar315 * fStack_10c + fStack_6c * fVar224 + fStack_8c * fVar288;
        fStack_788 = fStack_a8 * fVar312 +
                     fVar253 * fStack_108 + fStack_68 * fVar170 + fStack_88 * fVar290;
        fStack_784 = fStack_784 + fVar171 + fVar188;
        pfVar1 = (float *)(bezier_basis1 + lVar125 * 4 + lVar126);
        fVar234 = *pfVar1;
        fVar313 = pfVar1[1];
        fVar326 = pfVar1[2];
        fVar314 = pfVar1[3];
        fVar235 = pfVar1[4];
        fVar315 = pfVar1[5];
        fVar253 = pfVar1[6];
        pauVar9 = (undefined1 (*) [28])(lVar126 + 0x21fdb88 + lVar125 * 4);
        fVar275 = *(float *)*pauVar9;
        fVar281 = *(float *)(*pauVar9 + 4);
        fVar283 = *(float *)(*pauVar9 + 8);
        fVar285 = *(float *)(*pauVar9 + 0xc);
        fVar286 = *(float *)(*pauVar9 + 0x10);
        fVar288 = *(float *)(*pauVar9 + 0x14);
        fVar290 = *(float *)(*pauVar9 + 0x18);
        auVar117 = *pauVar9;
        auVar164 = *(undefined1 (*) [32])(lVar126 + 0x21fe00c + lVar125 * 4);
        auVar146 = ZEXT3264(auVar164);
        pfVar2 = (float *)(lVar126 + 0x21fe490 + lVar125 * 4);
        fVar171 = *pfVar2;
        fVar188 = pfVar2[1];
        fVar292 = pfVar2[2];
        fVar147 = pfVar2[3];
        fVar149 = pfVar2[4];
        fVar151 = pfVar2[5];
        fVar153 = pfVar2[6];
        fVar156 = pfVar2[7];
        fVar305 = auVar164._0_4_;
        fVar198 = auVar164._4_4_;
        fVar309 = auVar164._8_4_;
        fVar201 = auVar164._12_4_;
        fVar310 = auVar164._16_4_;
        fVar202 = auVar164._20_4_;
        fVar312 = auVar164._24_4_;
        fVar227 = fVar156 + fVar156 + fStack_3e4;
        auVar242._0_4_ =
             fVar205 * fVar234 +
             fVar275 * fVar204 + fVar157 * fVar305 + (float)local_400._0_4_ * fVar171;
        auVar242._4_4_ =
             fVar217 * fVar313 +
             fVar281 * fVar216 + fVar166 * fVar198 + (float)local_400._4_4_ * fVar188;
        auVar242._8_4_ =
             fVar219 * fVar326 + fVar283 * fVar218 + fVar167 * fVar309 + fStack_3f8 * fVar292;
        auVar242._12_4_ =
             fVar221 * fVar314 + fVar285 * fVar220 + fVar168 * fVar201 + fStack_3f4 * fVar147;
        auVar242._16_4_ =
             fVar223 * fVar235 + fVar286 * fVar187 + fVar303 * fVar310 + fStack_3f0 * fVar149;
        auVar242._20_4_ =
             fVar225 * fVar315 + fVar288 * fVar237 + fVar203 * fVar202 + fStack_3ec * fVar151;
        auVar242._24_4_ =
             fVar226 * fVar253 + fVar290 * fVar244 + fVar186 * fVar312 + fStack_3e8 * fVar153;
        auVar242._28_4_ = fStack_84 + fVar156 + fVar227;
        local_500._0_4_ =
             fVar234 * (float)local_340._0_4_ +
             (float)local_320._0_4_ * fVar275 + fVar189 * fVar305 + fVar261 * fVar171;
        local_500._4_4_ =
             fVar313 * (float)local_340._4_4_ +
             (float)local_320._4_4_ * fVar281 + fVar197 * fVar198 + fVar274 * fVar188;
        local_500._8_4_ =
             fVar326 * fStack_338 + fStack_318 * fVar283 + fVar199 * fVar309 + fVar301 * fVar292;
        local_500._12_4_ =
             fVar314 * fStack_334 + fStack_314 * fVar285 + fVar200 * fVar201 + fVar215 * fVar147;
        local_500._16_4_ =
             fVar235 * fStack_330 + fStack_310 * fVar286 + fVar246 * fVar310 + fVar269 * fVar149;
        local_500._20_4_ =
             fVar315 * fStack_32c + fStack_30c * fVar288 + fVar249 * fVar202 + fVar272 * fVar151;
        local_500._24_4_ =
             fVar253 * fStack_328 + fStack_308 * fVar290 + fVar247 * fVar312 + fVar293 * fVar153;
        local_500._28_4_ = fVar227 + fVar156 + fVar156 + fVar300;
        auVar323._0_4_ =
             fVar275 * (float)local_120._0_4_ +
             (float)local_a0._0_4_ * fVar171 + (float)local_80._0_4_ * fVar305 +
             (float)local_c0._0_4_ * fVar234;
        auVar323._4_4_ =
             fVar281 * (float)local_120._4_4_ +
             (float)local_a0._4_4_ * fVar188 + (float)local_80._4_4_ * fVar198 +
             (float)local_c0._4_4_ * fVar313;
        auVar323._8_4_ =
             fVar283 * fStack_118 + fStack_98 * fVar292 + fStack_78 * fVar309 + fStack_b8 * fVar326;
        auVar323._12_4_ =
             fVar285 * fStack_114 + fStack_94 * fVar147 + fStack_74 * fVar201 + fStack_b4 * fVar314;
        auVar323._16_4_ =
             fVar286 * fStack_110 + fStack_90 * fVar149 + fStack_70 * fVar310 + fStack_b0 * fVar235;
        auVar323._20_4_ =
             fVar288 * fStack_10c + fStack_8c * fVar151 + fStack_6c * fVar202 + fStack_ac * fVar315;
        auVar323._24_4_ =
             fVar290 * fStack_108 + fStack_88 * fVar153 + fStack_68 * fVar312 + fStack_a8 * fVar253;
        auVar323._28_4_ = fVar156 + fStack_84 + fVar156 + fVar227;
        auVar28 = vsubps_avx(auVar242,local_640);
        auVar26 = vsubps_avx(local_500,auVar184);
        fVar261 = auVar28._0_4_;
        fVar272 = auVar28._4_4_;
        auVar63._4_4_ = auVar184._4_4_ * fVar272;
        auVar63._0_4_ = auVar184._0_4_ * fVar261;
        fVar293 = auVar28._8_4_;
        auVar63._8_4_ = auVar184._8_4_ * fVar293;
        fVar301 = auVar28._12_4_;
        auVar63._12_4_ = auVar184._12_4_ * fVar301;
        fVar203 = auVar28._16_4_;
        auVar63._16_4_ = auVar184._16_4_ * fVar203;
        fVar186 = auVar28._20_4_;
        auVar63._20_4_ = auVar184._20_4_ * fVar186;
        fVar237 = auVar28._24_4_;
        auVar63._24_4_ = auVar184._24_4_ * fVar237;
        auVar63._28_4_ = fVar227;
        fVar269 = auVar26._0_4_;
        fVar274 = auVar26._4_4_;
        auVar64._4_4_ = local_640._4_4_ * fVar274;
        auVar64._0_4_ = (float)local_640._0_4_ * fVar269;
        fVar300 = auVar26._8_4_;
        auVar64._8_4_ = local_640._8_4_ * fVar300;
        fVar303 = auVar26._12_4_;
        auVar64._12_4_ = local_640._12_4_ * fVar303;
        fVar215 = auVar26._16_4_;
        auVar64._16_4_ = local_640._16_4_ * fVar215;
        fVar187 = auVar26._20_4_;
        auVar64._20_4_ = local_640._20_4_ * fVar187;
        fVar244 = auVar26._24_4_;
        auVar64._24_4_ = local_640._24_4_ * fVar244;
        auVar64._28_4_ = local_500._28_4_;
        auVar27 = vsubps_avx(auVar63,auVar64);
        auVar19 = vmaxps_avx(_local_7a0,auVar323);
        auVar65._4_4_ = auVar19._4_4_ * auVar19._4_4_ * (fVar272 * fVar272 + fVar274 * fVar274);
        auVar65._0_4_ = auVar19._0_4_ * auVar19._0_4_ * (fVar261 * fVar261 + fVar269 * fVar269);
        auVar65._8_4_ = auVar19._8_4_ * auVar19._8_4_ * (fVar293 * fVar293 + fVar300 * fVar300);
        auVar65._12_4_ = auVar19._12_4_ * auVar19._12_4_ * (fVar301 * fVar301 + fVar303 * fVar303);
        auVar65._16_4_ = auVar19._16_4_ * auVar19._16_4_ * (fVar203 * fVar203 + fVar215 * fVar215);
        auVar65._20_4_ = auVar19._20_4_ * auVar19._20_4_ * (fVar186 * fVar186 + fVar187 * fVar187);
        auVar65._24_4_ = auVar19._24_4_ * auVar19._24_4_ * (fVar237 * fVar237 + fVar244 * fVar244);
        auVar65._28_4_ = auVar242._28_4_ + local_500._28_4_;
        auVar66._4_4_ = auVar27._4_4_ * auVar27._4_4_;
        auVar66._0_4_ = auVar27._0_4_ * auVar27._0_4_;
        auVar66._8_4_ = auVar27._8_4_ * auVar27._8_4_;
        auVar66._12_4_ = auVar27._12_4_ * auVar27._12_4_;
        auVar66._16_4_ = auVar27._16_4_ * auVar27._16_4_;
        auVar66._20_4_ = auVar27._20_4_ * auVar27._20_4_;
        auVar66._24_4_ = auVar27._24_4_ * auVar27._24_4_;
        auVar66._28_4_ = auVar27._28_4_;
        local_360 = vcmpps_avx(auVar66,auVar65,2);
        auVar165 = ZEXT3264(local_360);
        local_240 = (uint)lVar125;
        auVar180 = vpshufd_avx(ZEXT416(local_240),0);
        auVar339 = vpor_avx(auVar180,_DAT_01f4ad30);
        auVar180 = vpor_avx(auVar180,_DAT_01f7afa0);
        auVar339 = vpcmpgtd_avx(_local_380,auVar339);
        auVar180 = vpcmpgtd_avx(_local_380,auVar180);
        auVar196._16_16_ = auVar180;
        auVar196._0_16_ = auVar339;
        auVar19 = auVar196 & local_360;
        fVar261 = (float)local_740._0_4_;
        fVar274 = (float)local_740._4_4_;
        fVar301 = fStack_738;
        fVar215 = fStack_734;
        fVar269 = fStack_730;
        fVar272 = fStack_72c;
        fVar293 = fStack_728;
        fVar300 = fStack_724;
        fVar157 = (float)local_7c0._0_4_;
        fVar166 = (float)local_7c0._4_4_;
        fVar167 = fStack_7b8;
        fVar168 = fStack_7b4;
        fVar303 = fStack_7b0;
        fVar203 = fStack_7ac;
        fVar186 = fStack_7a8;
        fVar204 = (float)local_780._0_4_;
        fVar216 = (float)local_780._4_4_;
        fVar218 = fStack_778;
        fVar220 = fStack_774;
        fVar187 = fStack_770;
        fVar237 = fStack_76c;
        fVar244 = fStack_768;
        fVar189 = (float)local_760._0_4_;
        fVar197 = (float)local_760._4_4_;
        fVar199 = fStack_758;
        fVar200 = fStack_754;
        fVar246 = fStack_750;
        fVar249 = fStack_74c;
        fVar247 = fStack_748;
        if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar19 >> 0x7f,0) == '\0') &&
              (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar19 >> 0xbf,0) == '\0') &&
            (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar19[0x1f]) {
          auVar329 = ZEXT3264(auVar329._0_32_);
        }
        else {
          local_540._0_4_ = auVar117._0_4_;
          local_540._4_4_ = auVar117._4_4_;
          fStack_538 = auVar117._8_4_;
          fStack_534 = auVar117._12_4_;
          fStack_530 = auVar117._16_4_;
          fStack_52c = auVar117._20_4_;
          fStack_528 = auVar117._24_4_;
          fVar275 = (float)local_300._0_4_ * (float)local_540._0_4_;
          fVar281 = (float)local_300._4_4_ * (float)local_540._4_4_;
          fVar283 = fStack_2f8 * fStack_538;
          fVar285 = fStack_2f4 * fStack_534;
          fVar286 = fStack_2f0 * fStack_530;
          fVar288 = fStack_2ec * fStack_52c;
          fVar290 = fStack_2e8 * fStack_528;
          _local_540 = auVar196;
          local_560 = fVar234 * (float)local_460._0_4_ +
                      fVar275 + (float)local_2e0._0_4_ * fVar305 + (float)local_580._0_4_ * fVar171;
          fStack_55c = fVar313 * (float)local_460._4_4_ +
                       fVar281 + (float)local_2e0._4_4_ * fVar198 + (float)local_580._4_4_ * fVar188
          ;
          fStack_558 = fVar326 * fStack_458 + fVar283 + fStack_2d8 * fVar309 + fStack_578 * fVar292;
          fStack_554 = fVar314 * fStack_454 + fVar285 + fStack_2d4 * fVar201 + fStack_574 * fVar147;
          fStack_550 = fVar235 * fStack_450 + fVar286 + fStack_2d0 * fVar310 + fStack_570 * fVar149;
          fStack_54c = fVar315 * fStack_44c + fVar288 + fStack_2cc * fVar202 + fStack_56c * fVar151;
          fStack_548 = fVar253 * fStack_448 + fVar290 + fStack_2c8 * fVar312 + fStack_568 * fVar153;
          fStack_544 = pfVar1[7] + auVar164._28_4_ + local_360._28_4_ + 0.0;
          local_480._0_4_ = auVar115._0_4_;
          local_480._4_4_ = auVar115._4_4_;
          fStack_478 = auVar115._8_4_;
          fStack_474 = auVar115._12_4_;
          fStack_470 = auVar115._16_4_;
          fStack_46c = auVar115._20_4_;
          fStack_468 = auVar115._24_4_;
          fVar227 = (float)local_300._0_4_ * (float)local_480._0_4_;
          fVar148 = (float)local_300._4_4_ * (float)local_480._4_4_;
          fVar150 = fStack_2f8 * fStack_478;
          fVar152 = fStack_2f4 * fStack_474;
          fVar154 = fStack_2f0 * fStack_470;
          fVar155 = fStack_2ec * fStack_46c;
          fVar236 = fStack_2e8 * fStack_468;
          local_600._0_4_ = auVar114._0_4_;
          local_600._4_4_ = auVar114._4_4_;
          fStack_5f8 = auVar114._8_4_;
          fStack_5f4 = auVar114._12_4_;
          fStack_5f0 = auVar114._16_4_;
          fStack_5ec = auVar114._20_4_;
          fStack_5e8 = auVar114._24_4_;
          fVar238 = (float)local_580._0_4_ * (float)local_600._0_4_;
          fVar245 = (float)local_580._4_4_ * (float)local_600._4_4_;
          fVar248 = fStack_578 * fStack_5f8;
          fVar250 = fStack_574 * fStack_5f4;
          fVar251 = fStack_570 * fStack_5f0;
          fVar252 = fStack_56c * fStack_5ec;
          fVar254 = fStack_568 * fStack_5e8;
          pfVar1 = (float *)(lVar126 + 0x21fcdfc + lVar125 * 4);
          fVar305 = *pfVar1;
          fVar198 = pfVar1[1];
          fVar309 = pfVar1[2];
          fVar201 = pfVar1[3];
          fVar310 = pfVar1[4];
          fVar202 = pfVar1[5];
          fVar312 = pfVar1[6];
          pfVar2 = (float *)(lVar126 + 0x21fd280 + lVar125 * 4);
          fVar234 = *pfVar2;
          fVar313 = pfVar2[1];
          fVar326 = pfVar2[2];
          fVar314 = pfVar2[3];
          fVar235 = pfVar2[4];
          fVar315 = pfVar2[5];
          fVar253 = pfVar2[6];
          _local_480 = auVar323;
          _local_600 = auVar26;
          fVar255 = *(float *)pauVar9[1] + 0.0;
          pfVar3 = (float *)(lVar126 + 0x21fc978 + lVar125 * 4);
          fVar275 = *pfVar3;
          fVar281 = pfVar3[1];
          fVar283 = pfVar3[2];
          fVar285 = pfVar3[3];
          fVar286 = pfVar3[4];
          fVar288 = pfVar3[5];
          fVar290 = pfVar3[6];
          fVar156 = pfVar1[7] + pfVar2[7];
          fStack_404 = pfVar2[7] + fVar255;
          fVar255 = *(float *)pauVar9[1] + auVar323._28_4_ + fVar255;
          pfVar1 = (float *)(lVar126 + 0x21fc4f4 + lVar125 * 4);
          fVar171 = *pfVar1;
          fVar188 = pfVar1[1];
          fVar292 = pfVar1[2];
          fVar147 = pfVar1[3];
          fVar149 = pfVar1[4];
          fVar151 = pfVar1[5];
          fVar153 = pfVar1[6];
          local_440 = fVar205 * fVar171 +
                      (float)local_780._0_4_ * fVar275 +
                      (float)local_7c0._0_4_ * fVar305 + (float)local_400._0_4_ * fVar234;
          fStack_43c = fVar217 * fVar188 +
                       (float)local_780._4_4_ * fVar281 +
                       (float)local_7c0._4_4_ * fVar198 + (float)local_400._4_4_ * fVar313;
          fStack_438 = fVar219 * fVar292 +
                       fStack_778 * fVar283 + fStack_7b8 * fVar309 + fStack_3f8 * fVar326;
          fStack_434 = fVar221 * fVar147 +
                       fStack_774 * fVar285 + fStack_7b4 * fVar201 + fStack_3f4 * fVar314;
          fStack_430 = fVar223 * fVar149 +
                       fStack_770 * fVar286 + fStack_7b0 * fVar310 + fStack_3f0 * fVar235;
          fStack_42c = fVar225 * fVar151 +
                       fStack_76c * fVar288 + fStack_7ac * fVar202 + fStack_3ec * fVar315;
          fStack_428 = fVar226 * fVar153 +
                       fStack_768 * fVar290 + fStack_7a8 * fVar312 + fStack_3e8 * fVar253;
          fStack_424 = fVar156 + fStack_404;
          local_420 = fVar171 * (float)local_340._0_4_ +
                      (float)local_760._0_4_ * fVar305 + (float)local_740._0_4_ * fVar234 +
                      (float)local_320._0_4_ * fVar275;
          fStack_41c = fVar188 * (float)local_340._4_4_ +
                       (float)local_760._4_4_ * fVar198 + (float)local_740._4_4_ * fVar313 +
                       (float)local_320._4_4_ * fVar281;
          fStack_418 = fVar292 * fStack_338 +
                       fStack_758 * fVar309 + fStack_738 * fVar326 + fStack_318 * fVar283;
          fStack_414 = fVar147 * fStack_334 +
                       fStack_754 * fVar201 + fStack_734 * fVar314 + fStack_314 * fVar285;
          fStack_410 = fVar149 * fStack_330 +
                       fStack_750 * fVar310 + fStack_730 * fVar235 + fStack_310 * fVar286;
          fStack_40c = fVar151 * fStack_32c +
                       fStack_74c * fVar202 + fStack_72c * fVar315 + fStack_30c * fVar288;
          fStack_408 = fVar153 * fStack_328 +
                       fStack_748 * fVar312 + fStack_728 * fVar253 + fStack_308 * fVar290;
          fStack_404 = fStack_404 + fVar255;
          auVar324._0_4_ =
               fVar275 * (float)local_300._0_4_ +
               (float)local_2e0._0_4_ * fVar305 + (float)local_580._0_4_ * fVar234 +
               fVar171 * (float)local_460._0_4_;
          auVar324._4_4_ =
               fVar281 * (float)local_300._4_4_ +
               (float)local_2e0._4_4_ * fVar198 + (float)local_580._4_4_ * fVar313 +
               fVar188 * (float)local_460._4_4_;
          auVar324._8_4_ =
               fVar283 * fStack_2f8 + fStack_2d8 * fVar309 + fStack_578 * fVar326 +
               fVar292 * fStack_458;
          auVar324._12_4_ =
               fVar285 * fStack_2f4 + fStack_2d4 * fVar201 + fStack_574 * fVar314 +
               fVar147 * fStack_454;
          auVar324._16_4_ =
               fVar286 * fStack_2f0 + fStack_2d0 * fVar310 + fStack_570 * fVar235 +
               fVar149 * fStack_450;
          auVar324._20_4_ =
               fVar288 * fStack_2ec + fStack_2cc * fVar202 + fStack_56c * fVar315 +
               fVar151 * fStack_44c;
          auVar324._24_4_ =
               fVar290 * fStack_2e8 + fStack_2c8 * fVar312 + fStack_568 * fVar253 +
               fVar153 * fStack_448;
          auVar324._28_4_ = pfVar3[7] + fVar156 + fVar255;
          pfVar1 = (float *)(lVar126 + 0x21ff21c + lVar125 * 4);
          fVar198 = *pfVar1;
          fVar309 = pfVar1[1];
          fVar201 = pfVar1[2];
          fVar310 = pfVar1[3];
          fVar202 = pfVar1[4];
          fVar312 = pfVar1[5];
          fVar234 = pfVar1[6];
          pfVar2 = (float *)(lVar126 + 0x21ff6a0 + lVar125 * 4);
          fVar313 = *pfVar2;
          fVar326 = pfVar2[1];
          fVar314 = pfVar2[2];
          fVar235 = pfVar2[3];
          fVar315 = pfVar2[4];
          fVar253 = pfVar2[5];
          fVar275 = pfVar2[6];
          fVar305 = auVar329._28_4_;
          pfVar3 = (float *)(lVar126 + 0x21fed98 + lVar125 * 4);
          fVar281 = *pfVar3;
          fVar283 = pfVar3[1];
          fVar285 = pfVar3[2];
          fVar286 = pfVar3[3];
          fVar288 = pfVar3[4];
          fVar290 = pfVar3[5];
          fVar171 = pfVar3[6];
          pfVar4 = (float *)(lVar126 + 0x21fe914 + lVar125 * 4);
          fVar188 = *pfVar4;
          fVar292 = pfVar4[1];
          fVar147 = pfVar4[2];
          fVar149 = pfVar4[3];
          fVar151 = pfVar4[4];
          fVar153 = pfVar4[5];
          fVar156 = pfVar4[6];
          auVar279._0_4_ =
               fVar188 * (float)local_6c0._0_4_ +
               (float)local_780._0_4_ * fVar281 +
               (float)local_7c0._0_4_ * fVar198 + (float)local_400._0_4_ * fVar313;
          auVar279._4_4_ =
               fVar292 * (float)local_6c0._4_4_ +
               (float)local_780._4_4_ * fVar283 +
               (float)local_7c0._4_4_ * fVar309 + (float)local_400._4_4_ * fVar326;
          auVar279._8_4_ =
               fVar147 * fStack_6b8 +
               fStack_778 * fVar285 + fStack_7b8 * fVar201 + fStack_3f8 * fVar314;
          auVar279._12_4_ =
               fVar149 * fStack_6b4 +
               fStack_774 * fVar286 + fStack_7b4 * fVar310 + fStack_3f4 * fVar235;
          auVar279._16_4_ =
               fVar151 * fStack_6b0 +
               fStack_770 * fVar288 + fStack_7b0 * fVar202 + fStack_3f0 * fVar315;
          auVar279._20_4_ =
               fVar153 * fStack_6ac +
               fStack_76c * fVar290 + fStack_7ac * fVar312 + fStack_3ec * fVar253;
          auVar279._24_4_ =
               fVar156 * fStack_6a8 +
               fStack_768 * fVar171 + fStack_7a8 * fVar234 + fStack_3e8 * fVar275;
          auVar279._28_4_ = fVar305 + fVar305 + fStack_3e4 + fVar305;
          auVar319._0_4_ =
               fVar188 * (float)local_340._0_4_ +
               (float)local_320._0_4_ * fVar281 +
               (float)local_760._0_4_ * fVar198 + (float)local_740._0_4_ * fVar313;
          auVar319._4_4_ =
               fVar292 * (float)local_340._4_4_ +
               (float)local_320._4_4_ * fVar283 +
               (float)local_760._4_4_ * fVar309 + (float)local_740._4_4_ * fVar326;
          auVar319._8_4_ =
               fVar147 * fStack_338 +
               fStack_318 * fVar285 + fStack_758 * fVar201 + fStack_738 * fVar314;
          auVar319._12_4_ =
               fVar149 * fStack_334 +
               fStack_314 * fVar286 + fStack_754 * fVar310 + fStack_734 * fVar235;
          auVar319._16_4_ =
               fVar151 * fStack_330 +
               fStack_310 * fVar288 + fStack_750 * fVar202 + fStack_730 * fVar315;
          auVar319._20_4_ =
               fVar153 * fStack_32c +
               fStack_30c * fVar290 + fStack_74c * fVar312 + fStack_72c * fVar253;
          auVar319._24_4_ =
               fVar156 * fStack_328 +
               fStack_308 * fVar171 + fStack_748 * fVar234 + fStack_728 * fVar275;
          auVar319._28_4_ = fVar305 + fVar305 + fStack_724 + fVar305;
          auVar233._8_4_ = 0x7fffffff;
          auVar233._0_8_ = 0x7fffffff7fffffff;
          auVar233._12_4_ = 0x7fffffff;
          auVar233._16_4_ = 0x7fffffff;
          auVar233._20_4_ = 0x7fffffff;
          auVar233._24_4_ = 0x7fffffff;
          auVar233._28_4_ = 0x7fffffff;
          auVar111._4_4_ = fStack_43c;
          auVar111._0_4_ = local_440;
          auVar111._8_4_ = fStack_438;
          auVar111._12_4_ = fStack_434;
          auVar111._16_4_ = fStack_430;
          auVar111._20_4_ = fStack_42c;
          auVar111._24_4_ = fStack_428;
          auVar111._28_4_ = fStack_424;
          auVar164 = vandps_avx(auVar111,auVar233);
          auVar112._4_4_ = fStack_41c;
          auVar112._0_4_ = local_420;
          auVar112._8_4_ = fStack_418;
          auVar112._12_4_ = fStack_414;
          auVar112._16_4_ = fStack_410;
          auVar112._20_4_ = fStack_40c;
          auVar112._24_4_ = fStack_408;
          auVar112._28_4_ = fStack_404;
          auVar19 = vandps_avx(auVar112,auVar233);
          auVar19 = vmaxps_avx(auVar164,auVar19);
          auVar164 = vandps_avx(auVar324,auVar233);
          auVar19 = vmaxps_avx(auVar19,auVar164);
          auVar19 = vcmpps_avx(auVar19,local_3a0,1);
          auVar27 = vblendvps_avx(auVar111,auVar28,auVar19);
          auVar143._0_4_ =
               fVar188 * (float)local_460._0_4_ +
               fVar281 * (float)local_300._0_4_ +
               fVar313 * (float)local_580._0_4_ + (float)local_2e0._0_4_ * fVar198;
          auVar143._4_4_ =
               fVar292 * (float)local_460._4_4_ +
               fVar283 * (float)local_300._4_4_ +
               fVar326 * (float)local_580._4_4_ + (float)local_2e0._4_4_ * fVar309;
          auVar143._8_4_ =
               fVar147 * fStack_458 +
               fVar285 * fStack_2f8 + fVar314 * fStack_578 + fStack_2d8 * fVar201;
          auVar143._12_4_ =
               fVar149 * fStack_454 +
               fVar286 * fStack_2f4 + fVar235 * fStack_574 + fStack_2d4 * fVar310;
          auVar143._16_4_ =
               fVar151 * fStack_450 +
               fVar288 * fStack_2f0 + fVar315 * fStack_570 + fStack_2d0 * fVar202;
          auVar143._20_4_ =
               fVar153 * fStack_44c +
               fVar290 * fStack_2ec + fVar253 * fStack_56c + fStack_2cc * fVar312;
          auVar143._24_4_ =
               fVar156 * fStack_448 +
               fVar171 * fStack_2e8 + fVar275 * fStack_568 + fStack_2c8 * fVar234;
          auVar143._28_4_ = auVar164._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar34 = vblendvps_avx(auVar112,auVar26,auVar19);
          auVar164 = vandps_avx(auVar279,auVar233);
          auVar19 = vandps_avx(auVar319,auVar233);
          auVar20 = vmaxps_avx(auVar164,auVar19);
          auVar164 = vandps_avx(auVar143,auVar233);
          auVar164 = vmaxps_avx(auVar20,auVar164);
          local_520._0_4_ = auVar116._0_4_;
          local_520._4_4_ = auVar116._4_4_;
          fStack_518 = auVar116._8_4_;
          fStack_514 = auVar116._12_4_;
          fStack_510 = auVar116._16_4_;
          fStack_50c = auVar116._20_4_;
          fStack_508 = auVar116._24_4_;
          auVar19 = vcmpps_avx(auVar164,local_3a0,1);
          auVar164 = vblendvps_avx(auVar279,auVar28,auVar19);
          auVar144._0_4_ =
               (float)local_460._0_4_ * (float)local_520._0_4_ +
               fVar227 + (float)local_2e0._0_4_ * fVar262 + fVar238;
          auVar144._4_4_ =
               (float)local_460._4_4_ * (float)local_520._4_4_ +
               fVar148 + (float)local_2e0._4_4_ * fVar222 + fVar245;
          auVar144._8_4_ = fStack_458 * fStack_518 + fVar150 + fStack_2d8 * fVar169 + fVar248;
          auVar144._12_4_ = fStack_454 * fStack_514 + fVar152 + fStack_2d4 * fVar270 + fVar250;
          auVar144._16_4_ = fStack_450 * fStack_510 + fVar154 + fStack_2d0 * fVar273 + fVar251;
          auVar144._20_4_ = fStack_44c * fStack_50c + fVar155 + fStack_2cc * fVar224 + fVar252;
          auVar144._24_4_ = fStack_448 * fStack_508 + fVar236 + fStack_2c8 * fVar170 + fVar254;
          auVar144._28_4_ = auVar20._28_4_ + fStack_544 + local_360._28_4_ + 0.0;
          auVar19 = vblendvps_avx(auVar319,auVar26,auVar19);
          fVar156 = auVar27._0_4_;
          fVar227 = auVar27._4_4_;
          fVar205 = auVar27._8_4_;
          fVar217 = auVar27._12_4_;
          fVar219 = auVar27._16_4_;
          fVar221 = auVar27._20_4_;
          fVar223 = auVar27._24_4_;
          fVar225 = auVar27._28_4_;
          fVar262 = auVar164._0_4_;
          fVar169 = auVar164._4_4_;
          fVar273 = auVar164._8_4_;
          fVar170 = auVar164._12_4_;
          fVar281 = auVar164._16_4_;
          fVar285 = auVar164._20_4_;
          fVar288 = auVar164._24_4_;
          fVar305 = auVar34._0_4_;
          fVar309 = auVar34._4_4_;
          fVar310 = auVar34._8_4_;
          fVar312 = auVar34._12_4_;
          fVar313 = auVar34._16_4_;
          fVar314 = auVar34._20_4_;
          fVar315 = auVar34._24_4_;
          auVar298._0_4_ = fVar305 * fVar305 + fVar156 * fVar156;
          auVar298._4_4_ = fVar309 * fVar309 + fVar227 * fVar227;
          auVar298._8_4_ = fVar310 * fVar310 + fVar205 * fVar205;
          auVar298._12_4_ = fVar312 * fVar312 + fVar217 * fVar217;
          auVar298._16_4_ = fVar313 * fVar313 + fVar219 * fVar219;
          auVar298._20_4_ = fVar314 * fVar314 + fVar221 * fVar221;
          auVar298._24_4_ = fVar315 * fVar315 + fVar223 * fVar223;
          auVar298._28_4_ = fStack_304 + auVar26._28_4_;
          auVar28 = vrsqrtps_avx(auVar298);
          fVar198 = auVar28._0_4_;
          fVar201 = auVar28._4_4_;
          auVar67._4_4_ = fVar201 * 1.5;
          auVar67._0_4_ = fVar198 * 1.5;
          fVar202 = auVar28._8_4_;
          auVar67._8_4_ = fVar202 * 1.5;
          fVar234 = auVar28._12_4_;
          auVar67._12_4_ = fVar234 * 1.5;
          fVar326 = auVar28._16_4_;
          auVar67._16_4_ = fVar326 * 1.5;
          fVar235 = auVar28._20_4_;
          auVar67._20_4_ = fVar235 * 1.5;
          fVar253 = auVar28._24_4_;
          auVar67._24_4_ = fVar253 * 1.5;
          auVar67._28_4_ = auVar319._28_4_;
          auVar68._4_4_ = fVar201 * fVar201 * fVar201 * auVar298._4_4_ * 0.5;
          auVar68._0_4_ = fVar198 * fVar198 * fVar198 * auVar298._0_4_ * 0.5;
          auVar68._8_4_ = fVar202 * fVar202 * fVar202 * auVar298._8_4_ * 0.5;
          auVar68._12_4_ = fVar234 * fVar234 * fVar234 * auVar298._12_4_ * 0.5;
          auVar68._16_4_ = fVar326 * fVar326 * fVar326 * auVar298._16_4_ * 0.5;
          auVar68._20_4_ = fVar235 * fVar235 * fVar235 * auVar298._20_4_ * 0.5;
          auVar68._24_4_ = fVar253 * fVar253 * fVar253 * auVar298._24_4_ * 0.5;
          auVar68._28_4_ = auVar298._28_4_;
          auVar26 = vsubps_avx(auVar67,auVar68);
          fVar171 = auVar26._0_4_;
          fVar188 = auVar26._4_4_;
          fVar292 = auVar26._8_4_;
          fVar147 = auVar26._12_4_;
          fVar149 = auVar26._16_4_;
          fVar151 = auVar26._20_4_;
          fVar153 = auVar26._24_4_;
          fVar198 = auVar19._0_4_;
          fVar201 = auVar19._4_4_;
          fVar202 = auVar19._8_4_;
          fVar234 = auVar19._12_4_;
          fVar326 = auVar19._16_4_;
          fVar235 = auVar19._20_4_;
          fVar253 = auVar19._24_4_;
          auVar267._0_4_ = fVar198 * fVar198 + fVar262 * fVar262;
          auVar267._4_4_ = fVar201 * fVar201 + fVar169 * fVar169;
          auVar267._8_4_ = fVar202 * fVar202 + fVar273 * fVar273;
          auVar267._12_4_ = fVar234 * fVar234 + fVar170 * fVar170;
          auVar267._16_4_ = fVar326 * fVar326 + fVar281 * fVar281;
          auVar267._20_4_ = fVar235 * fVar235 + fVar285 * fVar285;
          auVar267._24_4_ = fVar253 * fVar253 + fVar288 * fVar288;
          auVar267._28_4_ = auVar28._28_4_ + auVar164._28_4_;
          auVar164 = vrsqrtps_avx(auVar267);
          fVar222 = auVar164._0_4_;
          fVar270 = auVar164._4_4_;
          auVar69._4_4_ = fVar270 * 1.5;
          auVar69._0_4_ = fVar222 * 1.5;
          fVar224 = auVar164._8_4_;
          auVar69._8_4_ = fVar224 * 1.5;
          fVar275 = auVar164._12_4_;
          auVar69._12_4_ = fVar275 * 1.5;
          fVar283 = auVar164._16_4_;
          auVar69._16_4_ = fVar283 * 1.5;
          fVar286 = auVar164._20_4_;
          auVar69._20_4_ = fVar286 * 1.5;
          fVar290 = auVar164._24_4_;
          auVar69._24_4_ = fVar290 * 1.5;
          auVar69._28_4_ = auVar319._28_4_;
          auVar70._4_4_ = fVar270 * fVar270 * fVar270 * auVar267._4_4_ * 0.5;
          auVar70._0_4_ = fVar222 * fVar222 * fVar222 * auVar267._0_4_ * 0.5;
          auVar70._8_4_ = fVar224 * fVar224 * fVar224 * auVar267._8_4_ * 0.5;
          auVar70._12_4_ = fVar275 * fVar275 * fVar275 * auVar267._12_4_ * 0.5;
          auVar70._16_4_ = fVar283 * fVar283 * fVar283 * auVar267._16_4_ * 0.5;
          auVar70._20_4_ = fVar286 * fVar286 * fVar286 * auVar267._20_4_ * 0.5;
          auVar70._24_4_ = fVar290 * fVar290 * fVar290 * auVar267._24_4_ * 0.5;
          auVar70._28_4_ = auVar267._28_4_;
          auVar19 = vsubps_avx(auVar69,auVar70);
          fVar222 = auVar19._0_4_;
          fVar270 = auVar19._4_4_;
          fVar224 = auVar19._8_4_;
          fVar275 = auVar19._12_4_;
          fVar283 = auVar19._16_4_;
          fVar286 = auVar19._20_4_;
          fVar290 = auVar19._24_4_;
          fVar305 = (float)local_7a0._0_4_ * fVar171 * fVar305;
          fVar309 = (float)local_7a0._4_4_ * fVar188 * fVar309;
          auVar71._4_4_ = fVar309;
          auVar71._0_4_ = fVar305;
          fVar310 = fStack_798 * fVar292 * fVar310;
          auVar71._8_4_ = fVar310;
          fVar312 = fStack_794 * fVar147 * fVar312;
          auVar71._12_4_ = fVar312;
          fVar313 = fStack_790 * fVar149 * fVar313;
          auVar71._16_4_ = fVar313;
          fVar314 = fStack_78c * fVar151 * fVar314;
          auVar71._20_4_ = fVar314;
          fVar315 = fStack_788 * fVar153 * fVar315;
          auVar71._24_4_ = fVar315;
          auVar71._28_4_ = auVar164._28_4_;
          local_520._4_4_ = fVar309 + local_640._4_4_;
          local_520._0_4_ = fVar305 + (float)local_640._0_4_;
          fStack_518 = fVar310 + local_640._8_4_;
          fStack_514 = fVar312 + local_640._12_4_;
          fStack_510 = fVar313 + local_640._16_4_;
          fStack_50c = fVar314 + local_640._20_4_;
          fStack_508 = fVar315 + local_640._24_4_;
          fStack_504 = auVar164._28_4_ + local_640._28_4_;
          local_5e0 = (float)local_7a0._0_4_ * fVar171 * -fVar156;
          fStack_5dc = (float)local_7a0._4_4_ * fVar188 * -fVar227;
          auVar72._4_4_ = fStack_5dc;
          auVar72._0_4_ = local_5e0;
          fStack_5d8 = fStack_798 * fVar292 * -fVar205;
          auVar72._8_4_ = fStack_5d8;
          fStack_5d4 = fStack_794 * fVar147 * -fVar217;
          auVar72._12_4_ = fStack_5d4;
          fStack_5d0 = fStack_790 * fVar149 * -fVar219;
          auVar72._16_4_ = fStack_5d0;
          fStack_5cc = fStack_78c * fVar151 * -fVar221;
          auVar72._20_4_ = fStack_5cc;
          fStack_5c8 = fStack_788 * fVar153 * -fVar223;
          auVar72._24_4_ = fStack_5c8;
          auVar72._28_4_ = -fVar225;
          local_5e0 = auVar184._0_4_ + local_5e0;
          fStack_5dc = auVar184._4_4_ + fStack_5dc;
          fStack_5d8 = auVar184._8_4_ + fStack_5d8;
          fStack_5d4 = auVar184._12_4_ + fStack_5d4;
          fStack_5d0 = auVar184._16_4_ + fStack_5d0;
          fStack_5cc = auVar184._20_4_ + fStack_5cc;
          fStack_5c8 = auVar184._24_4_ + fStack_5c8;
          fStack_5c4 = auVar184._28_4_ + -fVar225;
          fVar305 = fVar171 * 0.0 * (float)local_7a0._0_4_;
          fVar309 = fVar188 * 0.0 * (float)local_7a0._4_4_;
          auVar73._4_4_ = fVar309;
          auVar73._0_4_ = fVar305;
          fVar310 = fVar292 * 0.0 * fStack_798;
          auVar73._8_4_ = fVar310;
          fVar312 = fVar147 * 0.0 * fStack_794;
          auVar73._12_4_ = fVar312;
          fVar313 = fVar149 * 0.0 * fStack_790;
          auVar73._16_4_ = fVar313;
          fVar314 = fVar151 * 0.0 * fStack_78c;
          auVar73._20_4_ = fVar314;
          fVar315 = fVar153 * 0.0 * fStack_788;
          auVar73._24_4_ = fVar315;
          auVar73._28_4_ = fVar225;
          auVar20 = vsubps_avx(local_640,auVar71);
          auVar335._0_4_ = fVar305 + auVar144._0_4_;
          auVar335._4_4_ = fVar309 + auVar144._4_4_;
          auVar335._8_4_ = fVar310 + auVar144._8_4_;
          auVar335._12_4_ = fVar312 + auVar144._12_4_;
          auVar335._16_4_ = fVar313 + auVar144._16_4_;
          auVar335._20_4_ = fVar314 + auVar144._20_4_;
          auVar335._24_4_ = fVar315 + auVar144._24_4_;
          auVar335._28_4_ = fVar225 + auVar144._28_4_;
          fVar305 = auVar323._0_4_ * fVar222 * fVar198;
          fVar198 = auVar323._4_4_ * fVar270 * fVar201;
          auVar74._4_4_ = fVar198;
          auVar74._0_4_ = fVar305;
          fVar309 = auVar323._8_4_ * fVar224 * fVar202;
          auVar74._8_4_ = fVar309;
          fVar201 = auVar323._12_4_ * fVar275 * fVar234;
          auVar74._12_4_ = fVar201;
          fVar310 = auVar323._16_4_ * fVar283 * fVar326;
          auVar74._16_4_ = fVar310;
          fVar202 = auVar323._20_4_ * fVar286 * fVar235;
          auVar74._20_4_ = fVar202;
          fVar312 = auVar323._24_4_ * fVar290 * fVar253;
          auVar74._24_4_ = fVar312;
          auVar74._28_4_ = fStack_784;
          auVar29 = vsubps_avx(auVar184,auVar72);
          auVar325._0_4_ = auVar242._0_4_ + fVar305;
          auVar325._4_4_ = auVar242._4_4_ + fVar198;
          auVar325._8_4_ = auVar242._8_4_ + fVar309;
          auVar325._12_4_ = auVar242._12_4_ + fVar201;
          auVar325._16_4_ = auVar242._16_4_ + fVar310;
          auVar325._20_4_ = auVar242._20_4_ + fVar202;
          auVar325._24_4_ = auVar242._24_4_ + fVar312;
          auVar325._28_4_ = auVar242._28_4_ + fStack_784;
          fVar305 = fVar222 * -fVar262 * auVar323._0_4_;
          fVar198 = fVar270 * -fVar169 * auVar323._4_4_;
          auVar75._4_4_ = fVar198;
          auVar75._0_4_ = fVar305;
          fVar309 = fVar224 * -fVar273 * auVar323._8_4_;
          auVar75._8_4_ = fVar309;
          fVar201 = fVar275 * -fVar170 * auVar323._12_4_;
          auVar75._12_4_ = fVar201;
          fVar310 = fVar283 * -fVar281 * auVar323._16_4_;
          auVar75._16_4_ = fVar310;
          fVar202 = fVar286 * -fVar285 * auVar323._20_4_;
          auVar75._20_4_ = fVar202;
          fVar312 = fVar290 * -fVar288 * auVar323._24_4_;
          auVar75._24_4_ = fVar312;
          auVar75._28_4_ = local_640._28_4_;
          auVar30 = vsubps_avx(auVar144,auVar73);
          auVar213._0_4_ = local_500._0_4_ + fVar305;
          auVar213._4_4_ = local_500._4_4_ + fVar198;
          auVar213._8_4_ = local_500._8_4_ + fVar309;
          auVar213._12_4_ = local_500._12_4_ + fVar201;
          auVar213._16_4_ = local_500._16_4_ + fVar310;
          auVar213._20_4_ = local_500._20_4_ + fVar202;
          auVar213._24_4_ = local_500._24_4_ + fVar312;
          auVar213._28_4_ = local_500._28_4_ + local_640._28_4_;
          fVar305 = fVar222 * 0.0 * auVar323._0_4_;
          fVar198 = fVar270 * 0.0 * auVar323._4_4_;
          auVar76._4_4_ = fVar198;
          auVar76._0_4_ = fVar305;
          fVar309 = fVar224 * 0.0 * auVar323._8_4_;
          auVar76._8_4_ = fVar309;
          fVar201 = fVar275 * 0.0 * auVar323._12_4_;
          auVar76._12_4_ = fVar201;
          fVar310 = fVar283 * 0.0 * auVar323._16_4_;
          auVar76._16_4_ = fVar310;
          fVar202 = fVar286 * 0.0 * auVar323._20_4_;
          auVar76._20_4_ = fVar202;
          fVar312 = fVar290 * 0.0 * auVar323._24_4_;
          auVar76._24_4_ = fVar312;
          auVar76._28_4_ = auVar144._28_4_;
          auVar164 = vsubps_avx(auVar242,auVar74);
          auVar109._4_4_ = fStack_55c;
          auVar109._0_4_ = local_560;
          auVar109._8_4_ = fStack_558;
          auVar109._12_4_ = fStack_554;
          auVar109._16_4_ = fStack_550;
          auVar109._20_4_ = fStack_54c;
          auVar109._24_4_ = fStack_548;
          auVar109._28_4_ = fStack_544;
          auVar280._0_4_ = local_560 + fVar305;
          auVar280._4_4_ = fStack_55c + fVar198;
          auVar280._8_4_ = fStack_558 + fVar309;
          auVar280._12_4_ = fStack_554 + fVar201;
          auVar280._16_4_ = fStack_550 + fVar310;
          auVar280._20_4_ = fStack_54c + fVar202;
          auVar280._24_4_ = fStack_548 + fVar312;
          auVar280._28_4_ = fStack_544 + auVar144._28_4_;
          auVar28 = vsubps_avx(local_500,auVar75);
          auVar26 = vsubps_avx(auVar109,auVar76);
          auVar27 = vsubps_avx(auVar213,auVar29);
          auVar34 = vsubps_avx(auVar280,auVar30);
          auVar77._4_4_ = auVar30._4_4_ * auVar27._4_4_;
          auVar77._0_4_ = auVar30._0_4_ * auVar27._0_4_;
          auVar77._8_4_ = auVar30._8_4_ * auVar27._8_4_;
          auVar77._12_4_ = auVar30._12_4_ * auVar27._12_4_;
          auVar77._16_4_ = auVar30._16_4_ * auVar27._16_4_;
          auVar77._20_4_ = auVar30._20_4_ * auVar27._20_4_;
          auVar77._24_4_ = auVar30._24_4_ * auVar27._24_4_;
          auVar77._28_4_ = auVar319._28_4_;
          auVar78._4_4_ = auVar29._4_4_ * auVar34._4_4_;
          auVar78._0_4_ = auVar29._0_4_ * auVar34._0_4_;
          auVar78._8_4_ = auVar29._8_4_ * auVar34._8_4_;
          auVar78._12_4_ = auVar29._12_4_ * auVar34._12_4_;
          auVar78._16_4_ = auVar29._16_4_ * auVar34._16_4_;
          auVar78._20_4_ = auVar29._20_4_ * auVar34._20_4_;
          auVar78._24_4_ = auVar29._24_4_ * auVar34._24_4_;
          auVar78._28_4_ = fStack_544;
          auVar231 = vsubps_avx(auVar78,auVar77);
          auVar79._4_4_ = auVar20._4_4_ * auVar34._4_4_;
          auVar79._0_4_ = auVar20._0_4_ * auVar34._0_4_;
          auVar79._8_4_ = auVar20._8_4_ * auVar34._8_4_;
          auVar79._12_4_ = auVar20._12_4_ * auVar34._12_4_;
          auVar79._16_4_ = auVar20._16_4_ * auVar34._16_4_;
          auVar79._20_4_ = auVar20._20_4_ * auVar34._20_4_;
          auVar79._24_4_ = auVar20._24_4_ * auVar34._24_4_;
          auVar79._28_4_ = auVar34._28_4_;
          auVar34 = vsubps_avx(auVar325,auVar20);
          auVar80._4_4_ = auVar30._4_4_ * auVar34._4_4_;
          auVar80._0_4_ = auVar30._0_4_ * auVar34._0_4_;
          auVar80._8_4_ = auVar30._8_4_ * auVar34._8_4_;
          auVar80._12_4_ = auVar30._12_4_ * auVar34._12_4_;
          auVar80._16_4_ = auVar30._16_4_ * auVar34._16_4_;
          auVar80._20_4_ = auVar30._20_4_ * auVar34._20_4_;
          auVar80._24_4_ = auVar30._24_4_ * auVar34._24_4_;
          auVar80._28_4_ = auVar19._28_4_;
          auVar296 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = auVar29._4_4_ * auVar34._4_4_;
          auVar81._0_4_ = auVar29._0_4_ * auVar34._0_4_;
          auVar81._8_4_ = auVar29._8_4_ * auVar34._8_4_;
          auVar81._12_4_ = auVar29._12_4_ * auVar34._12_4_;
          auVar81._16_4_ = auVar29._16_4_ * auVar34._16_4_;
          auVar81._20_4_ = auVar29._20_4_ * auVar34._20_4_;
          auVar81._24_4_ = auVar29._24_4_ * auVar34._24_4_;
          auVar81._28_4_ = auVar19._28_4_;
          auVar82._4_4_ = auVar20._4_4_ * auVar27._4_4_;
          auVar82._0_4_ = auVar20._0_4_ * auVar27._0_4_;
          auVar82._8_4_ = auVar20._8_4_ * auVar27._8_4_;
          auVar82._12_4_ = auVar20._12_4_ * auVar27._12_4_;
          auVar82._16_4_ = auVar20._16_4_ * auVar27._16_4_;
          auVar82._20_4_ = auVar20._20_4_ * auVar27._20_4_;
          auVar82._24_4_ = auVar20._24_4_ * auVar27._24_4_;
          auVar82._28_4_ = auVar27._28_4_;
          auVar19 = vsubps_avx(auVar82,auVar81);
          auVar162._0_4_ = auVar231._0_4_ * 0.0 + auVar19._0_4_ + auVar296._0_4_ * 0.0;
          auVar162._4_4_ = auVar231._4_4_ * 0.0 + auVar19._4_4_ + auVar296._4_4_ * 0.0;
          auVar162._8_4_ = auVar231._8_4_ * 0.0 + auVar19._8_4_ + auVar296._8_4_ * 0.0;
          auVar162._12_4_ = auVar231._12_4_ * 0.0 + auVar19._12_4_ + auVar296._12_4_ * 0.0;
          auVar162._16_4_ = auVar231._16_4_ * 0.0 + auVar19._16_4_ + auVar296._16_4_ * 0.0;
          auVar162._20_4_ = auVar231._20_4_ * 0.0 + auVar19._20_4_ + auVar296._20_4_ * 0.0;
          auVar162._24_4_ = auVar231._24_4_ * 0.0 + auVar19._24_4_ + auVar296._24_4_ * 0.0;
          auVar162._28_4_ = auVar231._28_4_ + auVar19._28_4_ + auVar296._28_4_;
          auVar321 = vcmpps_avx(auVar162,ZEXT832(0) << 0x20,2);
          auVar185 = ZEXT3264(auVar321);
          auVar164 = vblendvps_avx(auVar164,_local_520,auVar321);
          auVar107._4_4_ = fStack_5dc;
          auVar107._0_4_ = local_5e0;
          auVar107._8_4_ = fStack_5d8;
          auVar107._12_4_ = fStack_5d4;
          auVar107._16_4_ = fStack_5d0;
          auVar107._20_4_ = fStack_5cc;
          auVar107._24_4_ = fStack_5c8;
          auVar107._28_4_ = fStack_5c4;
          auVar19 = vblendvps_avx(auVar28,auVar107,auVar321);
          auVar28 = vblendvps_avx(auVar26,auVar335,auVar321);
          auVar26 = vblendvps_avx(auVar20,auVar325,auVar321);
          auVar27 = vblendvps_avx(auVar29,auVar213,auVar321);
          auVar34 = vblendvps_avx(auVar30,auVar280,auVar321);
          auVar20 = vblendvps_avx(auVar325,auVar20,auVar321);
          auVar231 = vblendvps_avx(auVar213,auVar29,auVar321);
          auVar296 = vblendvps_avx(auVar280,auVar30,auVar321);
          local_620 = vandps_avx(local_360,auVar196);
          auVar20 = vsubps_avx(auVar20,auVar164);
          auVar31 = vsubps_avx(auVar231,auVar19);
          auVar296 = vsubps_avx(auVar296,auVar28);
          auVar32 = vsubps_avx(auVar19,auVar27);
          fVar305 = auVar31._0_4_;
          fVar236 = auVar28._0_4_;
          fVar234 = auVar31._4_4_;
          fVar238 = auVar28._4_4_;
          auVar83._4_4_ = fVar238 * fVar234;
          auVar83._0_4_ = fVar236 * fVar305;
          fVar262 = auVar31._8_4_;
          fVar245 = auVar28._8_4_;
          auVar83._8_4_ = fVar245 * fVar262;
          fVar275 = auVar31._12_4_;
          fVar248 = auVar28._12_4_;
          auVar83._12_4_ = fVar248 * fVar275;
          fVar171 = auVar31._16_4_;
          fVar250 = auVar28._16_4_;
          auVar83._16_4_ = fVar250 * fVar171;
          fVar156 = auVar31._20_4_;
          fVar251 = auVar28._20_4_;
          auVar83._20_4_ = fVar251 * fVar156;
          fVar225 = auVar31._24_4_;
          fVar252 = auVar28._24_4_;
          auVar83._24_4_ = fVar252 * fVar225;
          auVar83._28_4_ = auVar231._28_4_;
          fVar198 = auVar19._0_4_;
          fVar254 = auVar296._0_4_;
          fVar313 = auVar19._4_4_;
          fVar255 = auVar296._4_4_;
          auVar84._4_4_ = fVar255 * fVar313;
          auVar84._0_4_ = fVar254 * fVar198;
          fVar222 = auVar19._8_4_;
          fVar282 = auVar296._8_4_;
          auVar84._8_4_ = fVar282 * fVar222;
          fVar281 = auVar19._12_4_;
          fVar284 = auVar296._12_4_;
          auVar84._12_4_ = fVar284 * fVar281;
          fVar188 = auVar19._16_4_;
          fVar287 = auVar296._16_4_;
          auVar84._16_4_ = fVar287 * fVar188;
          fVar227 = auVar19._20_4_;
          fVar289 = auVar296._20_4_;
          auVar84._20_4_ = fVar289 * fVar227;
          fVar226 = auVar19._24_4_;
          fVar291 = auVar296._24_4_;
          uVar127 = auVar29._28_4_;
          auVar84._24_4_ = fVar291 * fVar226;
          auVar84._28_4_ = uVar127;
          auVar231 = vsubps_avx(auVar84,auVar83);
          fVar309 = auVar164._0_4_;
          fVar326 = auVar164._4_4_;
          auVar85._4_4_ = fVar255 * fVar326;
          auVar85._0_4_ = fVar254 * fVar309;
          fVar169 = auVar164._8_4_;
          auVar85._8_4_ = fVar282 * fVar169;
          fVar283 = auVar164._12_4_;
          auVar85._12_4_ = fVar284 * fVar283;
          fVar292 = auVar164._16_4_;
          auVar85._16_4_ = fVar287 * fVar292;
          fVar205 = auVar164._20_4_;
          auVar85._20_4_ = fVar289 * fVar205;
          fVar148 = auVar164._24_4_;
          auVar85._24_4_ = fVar291 * fVar148;
          auVar85._28_4_ = uVar127;
          fVar201 = auVar20._0_4_;
          fVar314 = auVar20._4_4_;
          auVar86._4_4_ = fVar238 * fVar314;
          auVar86._0_4_ = fVar236 * fVar201;
          fVar270 = auVar20._8_4_;
          auVar86._8_4_ = fVar245 * fVar270;
          fVar285 = auVar20._12_4_;
          auVar86._12_4_ = fVar248 * fVar285;
          fVar147 = auVar20._16_4_;
          auVar86._16_4_ = fVar250 * fVar147;
          fVar217 = auVar20._20_4_;
          auVar86._20_4_ = fVar251 * fVar217;
          fVar150 = auVar20._24_4_;
          auVar86._24_4_ = fVar252 * fVar150;
          auVar86._28_4_ = auVar325._28_4_;
          auVar29 = vsubps_avx(auVar86,auVar85);
          auVar87._4_4_ = fVar313 * fVar314;
          auVar87._0_4_ = fVar198 * fVar201;
          auVar87._8_4_ = fVar222 * fVar270;
          auVar87._12_4_ = fVar281 * fVar285;
          auVar87._16_4_ = fVar188 * fVar147;
          auVar87._20_4_ = fVar227 * fVar217;
          auVar87._24_4_ = fVar226 * fVar150;
          auVar87._28_4_ = uVar127;
          auVar88._4_4_ = fVar326 * fVar234;
          auVar88._0_4_ = fVar309 * fVar305;
          auVar88._8_4_ = fVar169 * fVar262;
          auVar88._12_4_ = fVar283 * fVar275;
          auVar88._16_4_ = fVar292 * fVar171;
          auVar88._20_4_ = fVar205 * fVar156;
          auVar88._24_4_ = fVar148 * fVar225;
          auVar88._28_4_ = auVar30._28_4_;
          auVar30 = vsubps_avx(auVar88,auVar87);
          auVar33 = vsubps_avx(auVar28,auVar34);
          fVar202 = auVar30._28_4_ + auVar29._28_4_;
          auVar299._0_4_ = auVar30._0_4_ + auVar29._0_4_ * 0.0 + auVar231._0_4_ * 0.0;
          auVar299._4_4_ = auVar30._4_4_ + auVar29._4_4_ * 0.0 + auVar231._4_4_ * 0.0;
          auVar299._8_4_ = auVar30._8_4_ + auVar29._8_4_ * 0.0 + auVar231._8_4_ * 0.0;
          auVar299._12_4_ = auVar30._12_4_ + auVar29._12_4_ * 0.0 + auVar231._12_4_ * 0.0;
          auVar299._16_4_ = auVar30._16_4_ + auVar29._16_4_ * 0.0 + auVar231._16_4_ * 0.0;
          auVar299._20_4_ = auVar30._20_4_ + auVar29._20_4_ * 0.0 + auVar231._20_4_ * 0.0;
          auVar299._24_4_ = auVar30._24_4_ + auVar29._24_4_ * 0.0 + auVar231._24_4_ * 0.0;
          auVar299._28_4_ = fVar202 + auVar231._28_4_;
          fVar310 = auVar32._0_4_;
          fVar235 = auVar32._4_4_;
          auVar89._4_4_ = auVar34._4_4_ * fVar235;
          auVar89._0_4_ = auVar34._0_4_ * fVar310;
          fVar273 = auVar32._8_4_;
          auVar89._8_4_ = auVar34._8_4_ * fVar273;
          fVar286 = auVar32._12_4_;
          auVar89._12_4_ = auVar34._12_4_ * fVar286;
          fVar149 = auVar32._16_4_;
          auVar89._16_4_ = auVar34._16_4_ * fVar149;
          fVar219 = auVar32._20_4_;
          auVar89._20_4_ = auVar34._20_4_ * fVar219;
          fVar152 = auVar32._24_4_;
          auVar89._24_4_ = auVar34._24_4_ * fVar152;
          auVar89._28_4_ = fVar202;
          fVar202 = auVar33._0_4_;
          fVar315 = auVar33._4_4_;
          auVar90._4_4_ = auVar27._4_4_ * fVar315;
          auVar90._0_4_ = auVar27._0_4_ * fVar202;
          fVar224 = auVar33._8_4_;
          auVar90._8_4_ = auVar27._8_4_ * fVar224;
          fVar288 = auVar33._12_4_;
          auVar90._12_4_ = auVar27._12_4_ * fVar288;
          fVar151 = auVar33._16_4_;
          auVar90._16_4_ = auVar27._16_4_ * fVar151;
          fVar221 = auVar33._20_4_;
          auVar90._20_4_ = auVar27._20_4_ * fVar221;
          fVar154 = auVar33._24_4_;
          auVar90._24_4_ = auVar27._24_4_ * fVar154;
          auVar90._28_4_ = auVar30._28_4_;
          auVar29 = vsubps_avx(auVar90,auVar89);
          auVar30 = vsubps_avx(auVar164,auVar26);
          fVar312 = auVar30._0_4_;
          fVar253 = auVar30._4_4_;
          auVar91._4_4_ = auVar34._4_4_ * fVar253;
          auVar91._0_4_ = auVar34._0_4_ * fVar312;
          fVar170 = auVar30._8_4_;
          auVar91._8_4_ = auVar34._8_4_ * fVar170;
          fVar290 = auVar30._12_4_;
          auVar91._12_4_ = auVar34._12_4_ * fVar290;
          fVar153 = auVar30._16_4_;
          auVar91._16_4_ = auVar34._16_4_ * fVar153;
          fVar223 = auVar30._20_4_;
          auVar91._20_4_ = auVar34._20_4_ * fVar223;
          fVar155 = auVar30._24_4_;
          auVar91._24_4_ = auVar34._24_4_ * fVar155;
          auVar91._28_4_ = auVar34._28_4_;
          auVar92._4_4_ = fVar315 * auVar26._4_4_;
          auVar92._0_4_ = fVar202 * auVar26._0_4_;
          auVar92._8_4_ = fVar224 * auVar26._8_4_;
          auVar92._12_4_ = fVar288 * auVar26._12_4_;
          auVar92._16_4_ = fVar151 * auVar26._16_4_;
          auVar92._20_4_ = fVar221 * auVar26._20_4_;
          auVar92._24_4_ = fVar154 * auVar26._24_4_;
          auVar92._28_4_ = auVar231._28_4_;
          auVar34 = vsubps_avx(auVar91,auVar92);
          auVar93._4_4_ = auVar27._4_4_ * fVar253;
          auVar93._0_4_ = auVar27._0_4_ * fVar312;
          auVar93._8_4_ = auVar27._8_4_ * fVar170;
          auVar93._12_4_ = auVar27._12_4_ * fVar290;
          auVar93._16_4_ = auVar27._16_4_ * fVar153;
          auVar93._20_4_ = auVar27._20_4_ * fVar223;
          auVar93._24_4_ = auVar27._24_4_ * fVar155;
          auVar93._28_4_ = auVar27._28_4_;
          auVar94._4_4_ = fVar235 * auVar26._4_4_;
          auVar94._0_4_ = fVar310 * auVar26._0_4_;
          auVar94._8_4_ = fVar273 * auVar26._8_4_;
          auVar94._12_4_ = fVar286 * auVar26._12_4_;
          auVar94._16_4_ = fVar149 * auVar26._16_4_;
          auVar94._20_4_ = fVar219 * auVar26._20_4_;
          auVar94._24_4_ = fVar152 * auVar26._24_4_;
          auVar94._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar94,auVar93);
          auVar145._0_4_ = auVar29._0_4_ * 0.0 + auVar26._0_4_ + auVar34._0_4_ * 0.0;
          auVar145._4_4_ = auVar29._4_4_ * 0.0 + auVar26._4_4_ + auVar34._4_4_ * 0.0;
          auVar145._8_4_ = auVar29._8_4_ * 0.0 + auVar26._8_4_ + auVar34._8_4_ * 0.0;
          auVar145._12_4_ = auVar29._12_4_ * 0.0 + auVar26._12_4_ + auVar34._12_4_ * 0.0;
          auVar145._16_4_ = auVar29._16_4_ * 0.0 + auVar26._16_4_ + auVar34._16_4_ * 0.0;
          auVar145._20_4_ = auVar29._20_4_ * 0.0 + auVar26._20_4_ + auVar34._20_4_ * 0.0;
          auVar145._24_4_ = auVar29._24_4_ * 0.0 + auVar26._24_4_ + auVar34._24_4_ * 0.0;
          auVar145._28_4_ = auVar34._28_4_ + auVar26._28_4_ + auVar34._28_4_;
          auVar146 = ZEXT3264(auVar145);
          auVar26 = vmaxps_avx(auVar299,auVar145);
          auVar26 = vcmpps_avx(auVar26,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar27 = local_620 & auVar26;
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0x7f,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar27 >> 0xbf,0) == '\0') &&
              (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar27[0x1f]) {
LAB_00907bd2:
            auVar271 = auVar32._4_12_;
            auVar165 = ZEXT3264(CONCAT824(uStack_488,
                                          CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
          }
          else {
            auVar27 = vandps_avx(auVar26,local_620);
            auVar95._4_4_ = fVar315 * fVar234;
            auVar95._0_4_ = fVar202 * fVar305;
            auVar95._8_4_ = fVar224 * fVar262;
            auVar95._12_4_ = fVar288 * fVar275;
            auVar95._16_4_ = fVar151 * fVar171;
            auVar95._20_4_ = fVar221 * fVar156;
            auVar95._24_4_ = fVar154 * fVar225;
            auVar95._28_4_ = local_620._28_4_;
            auVar96._4_4_ = fVar235 * fVar255;
            auVar96._0_4_ = fVar310 * fVar254;
            auVar96._8_4_ = fVar273 * fVar282;
            auVar96._12_4_ = fVar286 * fVar284;
            auVar96._16_4_ = fVar149 * fVar287;
            auVar96._20_4_ = fVar219 * fVar289;
            auVar96._24_4_ = fVar152 * fVar291;
            auVar96._28_4_ = auVar26._28_4_;
            auVar34 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar253 * fVar255;
            auVar97._0_4_ = fVar312 * fVar254;
            auVar97._8_4_ = fVar170 * fVar282;
            auVar97._12_4_ = fVar290 * fVar284;
            auVar97._16_4_ = fVar153 * fVar287;
            auVar97._20_4_ = fVar223 * fVar289;
            auVar97._24_4_ = fVar155 * fVar291;
            auVar97._28_4_ = auVar296._28_4_;
            auVar98._4_4_ = fVar315 * fVar314;
            auVar98._0_4_ = fVar202 * fVar201;
            auVar98._8_4_ = fVar224 * fVar270;
            auVar98._12_4_ = fVar288 * fVar285;
            auVar98._16_4_ = fVar151 * fVar147;
            auVar98._20_4_ = fVar221 * fVar217;
            auVar98._24_4_ = fVar154 * fVar150;
            auVar98._28_4_ = auVar33._28_4_;
            auVar231 = vsubps_avx(auVar98,auVar97);
            auVar99._4_4_ = fVar235 * fVar314;
            auVar99._0_4_ = fVar310 * fVar201;
            auVar99._8_4_ = fVar273 * fVar270;
            auVar99._12_4_ = fVar286 * fVar285;
            auVar99._16_4_ = fVar149 * fVar147;
            auVar99._20_4_ = fVar219 * fVar217;
            auVar99._24_4_ = fVar152 * fVar150;
            auVar99._28_4_ = auVar20._28_4_;
            auVar100._4_4_ = fVar253 * fVar234;
            auVar100._0_4_ = fVar312 * fVar305;
            auVar100._8_4_ = fVar170 * fVar262;
            auVar100._12_4_ = fVar290 * fVar275;
            auVar100._16_4_ = fVar153 * fVar171;
            auVar100._20_4_ = fVar223 * fVar156;
            auVar100._24_4_ = fVar155 * fVar225;
            auVar100._28_4_ = auVar31._28_4_;
            auVar32 = vsubps_avx(auVar100,auVar99);
            auVar271 = auVar32._4_12_;
            auVar163._0_4_ = auVar34._0_4_ * 0.0 + auVar32._0_4_ + auVar231._0_4_ * 0.0;
            auVar163._4_4_ = auVar34._4_4_ * 0.0 + auVar32._4_4_ + auVar231._4_4_ * 0.0;
            auVar163._8_4_ = auVar34._8_4_ * 0.0 + auVar32._8_4_ + auVar231._8_4_ * 0.0;
            auVar163._12_4_ = auVar34._12_4_ * 0.0 + auVar32._12_4_ + auVar231._12_4_ * 0.0;
            auVar163._16_4_ = auVar34._16_4_ * 0.0 + auVar32._16_4_ + auVar231._16_4_ * 0.0;
            auVar163._20_4_ = auVar34._20_4_ * 0.0 + auVar32._20_4_ + auVar231._20_4_ * 0.0;
            auVar163._24_4_ = auVar34._24_4_ * 0.0 + auVar32._24_4_ + auVar231._24_4_ * 0.0;
            auVar163._28_4_ = auVar31._28_4_ + auVar32._28_4_ + auVar20._28_4_;
            auVar26 = vrcpps_avx(auVar163);
            fVar201 = auVar26._0_4_;
            fVar310 = auVar26._4_4_;
            auVar101._4_4_ = auVar163._4_4_ * fVar310;
            auVar101._0_4_ = auVar163._0_4_ * fVar201;
            fVar202 = auVar26._8_4_;
            auVar101._8_4_ = auVar163._8_4_ * fVar202;
            fVar312 = auVar26._12_4_;
            auVar101._12_4_ = auVar163._12_4_ * fVar312;
            fVar234 = auVar26._16_4_;
            auVar101._16_4_ = auVar163._16_4_ * fVar234;
            fVar314 = auVar26._20_4_;
            auVar101._20_4_ = auVar163._20_4_ * fVar314;
            fVar235 = auVar26._24_4_;
            auVar101._24_4_ = auVar163._24_4_ * fVar235;
            auVar101._28_4_ = auVar33._28_4_;
            auVar320._8_4_ = 0x3f800000;
            auVar320._0_8_ = 0x3f8000003f800000;
            auVar320._12_4_ = 0x3f800000;
            auVar320._16_4_ = 0x3f800000;
            auVar320._20_4_ = 0x3f800000;
            auVar320._24_4_ = 0x3f800000;
            auVar320._28_4_ = 0x3f800000;
            auVar26 = vsubps_avx(auVar320,auVar101);
            fVar201 = auVar26._0_4_ * fVar201 + fVar201;
            fVar310 = auVar26._4_4_ * fVar310 + fVar310;
            fVar202 = auVar26._8_4_ * fVar202 + fVar202;
            fVar312 = auVar26._12_4_ * fVar312 + fVar312;
            fVar234 = auVar26._16_4_ * fVar234 + fVar234;
            fVar314 = auVar26._20_4_ * fVar314 + fVar314;
            fVar235 = auVar26._24_4_ * fVar235 + fVar235;
            auVar102._4_4_ =
                 (fVar326 * auVar34._4_4_ + auVar231._4_4_ * fVar313 + auVar32._4_4_ * fVar238) *
                 fVar310;
            auVar102._0_4_ =
                 (fVar309 * auVar34._0_4_ + auVar231._0_4_ * fVar198 + auVar32._0_4_ * fVar236) *
                 fVar201;
            auVar102._8_4_ =
                 (fVar169 * auVar34._8_4_ + auVar231._8_4_ * fVar222 + auVar32._8_4_ * fVar245) *
                 fVar202;
            auVar102._12_4_ =
                 (fVar283 * auVar34._12_4_ + auVar231._12_4_ * fVar281 + auVar32._12_4_ * fVar248) *
                 fVar312;
            auVar102._16_4_ =
                 (fVar292 * auVar34._16_4_ + auVar231._16_4_ * fVar188 + auVar32._16_4_ * fVar250) *
                 fVar234;
            auVar102._20_4_ =
                 (fVar205 * auVar34._20_4_ + auVar231._20_4_ * fVar227 + auVar32._20_4_ * fVar251) *
                 fVar314;
            auVar102._24_4_ =
                 (fVar148 * auVar34._24_4_ + auVar231._24_4_ * fVar226 + auVar32._24_4_ * fVar252) *
                 fVar235;
            auVar102._28_4_ = auVar164._28_4_ + auVar19._28_4_ + auVar28._28_4_;
            fVar305 = ray->tfar;
            auVar214._4_4_ = fVar305;
            auVar214._0_4_ = fVar305;
            auVar214._8_4_ = fVar305;
            auVar214._12_4_ = fVar305;
            auVar214._16_4_ = fVar305;
            auVar214._20_4_ = fVar305;
            auVar214._24_4_ = fVar305;
            auVar214._28_4_ = fVar305;
            auVar113._8_8_ = uStack_d8;
            auVar113._0_8_ = local_e0;
            auVar113._16_8_ = uStack_d0;
            auVar113._24_8_ = uStack_c8;
            auVar164 = vcmpps_avx(auVar113,auVar102,2);
            auVar19 = vcmpps_avx(auVar102,auVar214,2);
            auVar164 = vandps_avx(auVar164,auVar19);
            auVar28 = auVar27 & auVar164;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) goto LAB_00907bd2;
            auVar164 = vandps_avx(auVar27,auVar164);
            auVar28 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar163,4);
            auVar26 = auVar164 & auVar28;
            auVar165 = ZEXT3264(CONCAT824(uStack_488,
                                          CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))));
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar164 = vandps_avx(auVar28,auVar164);
              auVar165 = ZEXT3264(auVar164);
              auVar103._4_4_ = auVar299._4_4_ * fVar310;
              auVar103._0_4_ = auVar299._0_4_ * fVar201;
              auVar103._8_4_ = auVar299._8_4_ * fVar202;
              auVar103._12_4_ = auVar299._12_4_ * fVar312;
              auVar103._16_4_ = auVar299._16_4_ * fVar234;
              auVar103._20_4_ = auVar299._20_4_ * fVar314;
              auVar103._24_4_ = auVar299._24_4_ * fVar235;
              auVar103._28_4_ = auVar19._28_4_;
              auVar104._4_4_ = auVar145._4_4_ * fVar310;
              auVar104._0_4_ = auVar145._0_4_ * fVar201;
              auVar104._8_4_ = auVar145._8_4_ * fVar202;
              auVar104._12_4_ = auVar145._12_4_ * fVar312;
              auVar104._16_4_ = auVar145._16_4_ * fVar234;
              auVar104._20_4_ = auVar145._20_4_ * fVar314;
              auVar104._24_4_ = auVar145._24_4_ * fVar235;
              auVar104._28_4_ = auVar145._28_4_;
              auVar243._8_4_ = 0x3f800000;
              auVar243._0_8_ = 0x3f8000003f800000;
              auVar243._12_4_ = 0x3f800000;
              auVar243._16_4_ = 0x3f800000;
              auVar243._20_4_ = 0x3f800000;
              auVar243._24_4_ = 0x3f800000;
              auVar243._28_4_ = 0x3f800000;
              auVar164 = vsubps_avx(auVar243,auVar103);
              _local_140 = vblendvps_avx(auVar164,auVar103,auVar321);
              auVar164 = vsubps_avx(auVar243,auVar104);
              _local_3e0 = vblendvps_avx(auVar164,auVar104,auVar321);
              auVar146 = ZEXT3264(_local_3e0);
              local_160 = auVar102;
            }
          }
          auVar164 = auVar165._0_32_;
          auVar329 = ZEXT3264(_local_6c0);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar165 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar165 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar165[0x1f] < '\0') {
            auVar19 = vsubps_avx(auVar323,_local_7a0);
            fVar198 = (float)local_7a0._0_4_ + auVar19._0_4_ * (float)local_140._0_4_;
            fVar309 = (float)local_7a0._4_4_ + auVar19._4_4_ * (float)local_140._4_4_;
            fVar201 = fStack_798 + auVar19._8_4_ * fStack_138;
            fVar310 = fStack_794 + auVar19._12_4_ * fStack_134;
            fVar202 = fStack_790 + auVar19._16_4_ * fStack_130;
            fVar312 = fStack_78c + auVar19._20_4_ * fStack_12c;
            fVar234 = fStack_788 + auVar19._24_4_ * fStack_128;
            fVar313 = fStack_784 + auVar19._28_4_;
            fVar305 = local_718->depth_scale;
            auVar185 = ZEXT3264(CONCAT428(fVar305,CONCAT424(fVar305,CONCAT420(fVar305,CONCAT416(
                                                  fVar305,CONCAT412(fVar305,CONCAT48(fVar305,
                                                  CONCAT44(fVar305,fVar305))))))));
            auVar105._4_4_ = (fVar309 + fVar309) * fVar305;
            auVar105._0_4_ = (fVar198 + fVar198) * fVar305;
            auVar105._8_4_ = (fVar201 + fVar201) * fVar305;
            auVar105._12_4_ = (fVar310 + fVar310) * fVar305;
            auVar105._16_4_ = (fVar202 + fVar202) * fVar305;
            auVar105._20_4_ = (fVar312 + fVar312) * fVar305;
            auVar105._24_4_ = (fVar234 + fVar234) * fVar305;
            auVar105._28_4_ = fVar313 + fVar313;
            auVar19 = vcmpps_avx(local_160,auVar105,6);
            auVar146 = ZEXT3264(auVar19);
            auVar28 = auVar164 & auVar19;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              local_1e0 = vandps_avx(auVar19,auVar164);
              auVar146 = ZEXT3264(local_1e0);
              auVar159._0_8_ =
                   CONCAT44((float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0,
                            (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0);
              auVar159._8_4_ = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
              auVar159._12_4_ = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
              auVar160._16_4_ = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
              auVar160._0_16_ = auVar159;
              auVar160._20_4_ = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
              fStack_268 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
              _local_280 = auVar160;
              fStack_264 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
              auVar165 = ZEXT3264(_local_280);
              local_2a0 = _local_140;
              local_260 = local_160;
              local_23c = uVar122;
              local_230 = local_690;
              uStack_228 = uStack_688;
              local_220 = local_5a0;
              uStack_218 = uStack_598;
              local_210 = local_5b0;
              uStack_208 = uStack_5a8;
              auVar185 = ZEXT1664(_local_590);
              local_200 = _local_590;
              local_6e0._0_8_ = (local_7d8->scene->geometries).items[local_720].ptr;
              _local_3e0 = _local_280;
              auVar164 = _local_3e0;
              if ((((Geometry *)local_6e0._0_8_)->mask & ray->mask) == 0) {
                pRVar120 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar120 = local_7d8->args;
                if ((pRVar120->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar120 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar120 >> 8),1),
                   ((Geometry *)local_6e0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_6e0._8_24_ = auVar242._8_24_;
                  auVar179._0_4_ = (float)(int)local_240;
                  auVar179._4_12_ = auVar271;
                  auVar339 = vshufps_avx(auVar179,auVar179,0);
                  auVar185 = ZEXT3264(CONCAT1616(auVar339,auVar339));
                  local_1c0[0] = (auVar339._0_4_ + (float)local_140._0_4_ + 0.0) *
                                 (float)local_100._0_4_;
                  local_1c0[1] = (auVar339._4_4_ + (float)local_140._4_4_ + 1.0) *
                                 (float)local_100._4_4_;
                  local_1c0[2] = (auVar339._8_4_ + fStack_138 + 2.0) * fStack_f8;
                  local_1c0[3] = (auVar339._12_4_ + fStack_134 + 3.0) * fStack_f4;
                  fStack_1b0 = (auVar339._0_4_ + fStack_130 + 4.0) * fStack_f0;
                  fStack_1ac = (auVar339._4_4_ + fStack_12c + 5.0) * fStack_ec;
                  fStack_1a8 = (auVar339._8_4_ + fStack_128 + 6.0) * fStack_e8;
                  fStack_1a4 = auVar339._12_4_ + fStack_124 + 7.0;
                  uStack_3d8 = auVar159._8_8_;
                  uStack_3d0 = auVar160._16_8_;
                  uStack_3c8 = local_280._24_8_;
                  local_1a0 = auVar159._0_8_;
                  uStack_198 = uStack_3d8;
                  uStack_190 = uStack_3d0;
                  uStack_188 = uStack_3c8;
                  auVar165 = ZEXT3264(local_160);
                  local_180 = local_160;
                  uVar127 = vmovmskps_avx(local_1e0);
                  uVar121 = CONCAT44((int)((ulong)pRVar120 >> 0x20),uVar127);
                  lVar124 = 0;
                  _local_3e0 = auVar164;
                  if (uVar121 != 0) {
                    for (; (uVar121 >> lVar124 & 1) == 0; lVar124 = lVar124 + 1) {
                    }
                  }
                  while( true ) {
                    local_7a0 = (undefined1  [8])lVar124;
                    local_620._0_8_ = uVar121;
                    if (uVar121 == 0) break;
                    local_674 = local_1c0[lVar124];
                    auVar146 = ZEXT464((uint)local_674);
                    local_670 = *(uint *)((long)&local_1a0 + lVar124 * 4);
                    auVar165 = ZEXT464(local_670);
                    local_640._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_180 + lVar124 * 4);
                    local_710.context = local_7d8->user;
                    fVar269 = 1.0 - local_674;
                    fVar261 = local_674 * fVar269 + local_674 * fVar269;
                    auVar339 = ZEXT416((uint)(local_674 * local_674 * 3.0));
                    auVar339 = vshufps_avx(auVar339,auVar339,0);
                    auVar180 = ZEXT416((uint)((fVar261 - local_674 * local_674) * 3.0));
                    auVar180 = vshufps_avx(auVar180,auVar180,0);
                    auVar209 = ZEXT416((uint)((fVar269 * fVar269 - fVar261) * 3.0));
                    auVar209 = vshufps_avx(auVar209,auVar209,0);
                    auVar194 = ZEXT416((uint)(fVar269 * fVar269 * -3.0));
                    auVar194 = vshufps_avx(auVar194,auVar194,0);
                    auVar181._0_4_ =
                         auVar194._0_4_ * (float)local_690._0_4_ +
                         auVar209._0_4_ * (float)local_5a0._0_4_ +
                         auVar339._0_4_ * (float)local_590._0_4_ +
                         auVar180._0_4_ * (float)local_5b0._0_4_;
                    auVar181._4_4_ =
                         auVar194._4_4_ * (float)local_690._4_4_ +
                         auVar209._4_4_ * (float)local_5a0._4_4_ +
                         auVar339._4_4_ * (float)local_590._4_4_ +
                         auVar180._4_4_ * (float)local_5b0._4_4_;
                    auVar181._8_4_ =
                         auVar194._8_4_ * (float)uStack_688 +
                         auVar209._8_4_ * (float)uStack_598 +
                         auVar339._8_4_ * fStack_588 + auVar180._8_4_ * (float)uStack_5a8;
                    auVar181._12_4_ =
                         auVar194._12_4_ * uStack_688._4_4_ +
                         auVar209._12_4_ * uStack_598._4_4_ +
                         auVar339._12_4_ * fStack_584 + auVar180._12_4_ * uStack_5a8._4_4_;
                    auVar185 = ZEXT1664(auVar181);
                    local_680 = vmovlps_avx(auVar181);
                    local_678 = vextractps_avx(auVar181,2);
                    local_66c = (int)local_648;
                    local_668 = (int)local_720;
                    local_664 = (local_710.context)->instID[0];
                    local_660 = (local_710.context)->instPrimID[0];
                    local_7dc = -1;
                    local_710.valid = &local_7dc;
                    local_710.geometryUserPtr = *(void **)(local_6e0._0_8_ + 0x18);
                    local_710.ray = (RTCRayN *)ray;
                    local_710.hit = (RTCHitN *)&local_680;
                    local_710.N = 1;
                    if (*(code **)(local_6e0._0_8_ + 0x48) == (code *)0x0) {
LAB_00907b41:
                      p_Var15 = local_7d8->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((local_7d8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_6e0._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar185 = ZEXT1664(auVar185._0_16_);
                        auVar339 = (*p_Var15)(&local_710);
                        auVar165._0_8_ = auVar339._8_8_;
                        auVar146._0_8_ = auVar339._0_8_;
                        auVar165._8_56_ = extraout_var_02;
                        auVar146._8_56_ = extraout_var_00;
                        if (*local_710.valid == 0) goto LAB_00907b88;
                      }
                      pRVar120 = (RTCIntersectArguments *)0x1;
                      goto LAB_00907bf5;
                    }
                    auVar185 = ZEXT1664(auVar181);
                    auVar339 = (**(code **)(local_6e0._0_8_ + 0x48))(&local_710);
                    auVar165._0_8_ = auVar339._8_8_;
                    auVar146._0_8_ = auVar339._0_8_;
                    auVar165._8_56_ = extraout_var_01;
                    auVar146._8_56_ = extraout_var;
                    if (*local_710.valid != 0) goto LAB_00907b41;
LAB_00907b88:
                    auVar146 = ZEXT464((uint)local_640._0_4_);
                    ray->tfar = (float)local_640._0_4_;
                    uVar121 = local_620._0_8_ ^ 1L << ((ulong)local_7a0 & 0x3f);
                    lVar124 = 0;
                    if (uVar121 != 0) {
                      for (; (uVar121 >> lVar124 & 1) == 0; lVar124 = lVar124 + 1) {
                      }
                    }
                  }
                  pRVar120 = (RTCIntersectArguments *)0x0;
LAB_00907bf5:
                  auVar329 = ZEXT3264(_local_6c0);
                }
              }
              bVar128 = bVar128 | (byte)pRVar120;
              fVar261 = (float)local_740._0_4_;
              fVar274 = (float)local_740._4_4_;
              fVar301 = fStack_738;
              fVar215 = fStack_734;
              fVar269 = fStack_730;
              fVar272 = fStack_72c;
              fVar293 = fStack_728;
              fVar300 = fStack_724;
              fVar157 = (float)local_7c0._0_4_;
              fVar166 = (float)local_7c0._4_4_;
              fVar167 = fStack_7b8;
              fVar168 = fStack_7b4;
              fVar303 = fStack_7b0;
              fVar203 = fStack_7ac;
              fVar186 = fStack_7a8;
              fVar204 = (float)local_780._0_4_;
              fVar216 = (float)local_780._4_4_;
              fVar218 = fStack_778;
              fVar220 = fStack_774;
              fVar187 = fStack_770;
              fVar237 = fStack_76c;
              fVar244 = fStack_768;
              fVar189 = (float)local_760._0_4_;
              fVar197 = (float)local_760._4_4_;
              fVar199 = fStack_758;
              fVar200 = fStack_754;
              fVar246 = fStack_750;
              fVar249 = fStack_74c;
              fVar247 = fStack_748;
            }
          }
        }
      }
    }
    if (bVar128 != 0) break;
    fVar261 = ray->tfar;
    auVar134._4_4_ = fVar261;
    auVar134._0_4_ = fVar261;
    auVar134._8_4_ = fVar261;
    auVar134._12_4_ = fVar261;
    auVar339 = vcmpps_avx(local_2b0,auVar134,2);
    uVar122 = vmovmskps_avx(auVar339);
  }
  return uVar118 != 0;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }